

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined8 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  uint uVar85;
  ulong uVar86;
  byte bVar87;
  long lVar88;
  long lVar89;
  uint uVar90;
  ulong uVar91;
  ulong uVar92;
  byte unaff_R14B;
  vint4 bi_2;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar124;
  float fVar153;
  float fVar155;
  vint4 bi_1;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar157;
  undefined1 auVar127 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar158;
  undefined1 auVar137 [32];
  float fVar154;
  float fVar156;
  float fVar159;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar160;
  float fVar182;
  float fVar184;
  vint4 bi;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar161;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar183;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar191;
  float fVar204;
  float fVar205;
  vint4 ai_1;
  undefined1 auVar192 [16];
  float fVar206;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar199 [28];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar207;
  float fVar208;
  float fVar225;
  float fVar227;
  vint4 ai_2;
  undefined1 auVar209 [16];
  float fVar229;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar220 [32];
  float fVar226;
  float fVar228;
  float fVar230;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar224 [32];
  float fVar234;
  float fVar249;
  float fVar250;
  undefined1 auVar235 [16];
  float fVar251;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar248 [64];
  float fVar267;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar268;
  float fVar270;
  float fVar271;
  float fVar274;
  float fVar277;
  float fVar280;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar269;
  float fVar272;
  float fVar275;
  float fVar278;
  float fVar281;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar273;
  float fVar276;
  float fVar279;
  undefined1 auVar266 [64];
  float fVar282;
  float fVar291;
  float fVar292;
  vint4 ai;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar293;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined4 uVar313;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar290 [64];
  float fVar297;
  float fVar309;
  float fVar314;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar342 [16];
  float fVar339;
  float fVar340;
  undefined1 auVar334 [32];
  float fVar336;
  float fVar337;
  float fVar338;
  undefined1 auVar335 [64];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [64];
  undefined1 auVar347 [16];
  undefined1 auVar349 [28];
  float fVar353;
  undefined1 auVar350 [32];
  undefined1 auVar348 [16];
  undefined1 auVar352 [64];
  float fVar354;
  float fVar360;
  float fVar361;
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  float fVar362;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar363;
  float fVar364;
  float fVar365;
  undefined1 auVar359 [64];
  float fVar366;
  float fVar373;
  float fVar375;
  undefined1 auVar368 [16];
  float fVar367;
  undefined1 auVar369 [16];
  float fVar374;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  float fVar385;
  undefined1 auVar372 [64];
  float fVar386;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  float fVar397;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  undefined1 auVar398 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_ad1;
  int local_ac4;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  undefined4 uStack_a9c;
  undefined4 uStack_a98;
  undefined4 uStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  ulong local_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  RTCFilterFunctionNArguments local_970;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined8 local_8c0;
  undefined4 local_8b8;
  float local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  uint local_8a4;
  uint local_8a0;
  ulong local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  Primitive *local_770;
  ulong local_768;
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  ulong local_5e0;
  undefined1 auStack_5d8 [24];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar341 [16];
  undefined1 auVar346 [16];
  undefined1 auVar351 [32];
  
  PVar11 = prim[1];
  uVar86 = (ulong)(byte)PVar11;
  lVar89 = uVar86 * 0x25;
  fVar124 = *(float *)(prim + lVar89 + 0x12);
  auVar103 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar89 + 6));
  auVar283._0_4_ = fVar124 * (ray->dir).field_0.m128[0];
  auVar283._4_4_ = fVar124 * (ray->dir).field_0.m128[1];
  auVar283._8_4_ = fVar124 * (ray->dir).field_0.m128[2];
  auVar283._12_4_ = fVar124 * (ray->dir).field_0.m128[3];
  auVar162._0_4_ = fVar124 * auVar103._0_4_;
  auVar162._4_4_ = fVar124 * auVar103._4_4_;
  auVar162._8_4_ = fVar124 * auVar103._8_4_;
  auVar162._12_4_ = fVar124 * auVar103._12_4_;
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar171 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 5 + 6)));
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xf + 6)));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar86 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1a + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar356 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1b + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1c + 6)));
  auVar356 = vcvtdq2ps_avx(auVar356);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vshufps_avx(auVar283,auVar283,0);
  auVar20 = vshufps_avx(auVar283,auVar283,0x55);
  auVar21 = vshufps_avx(auVar283,auVar283,0xaa);
  fVar124 = auVar21._0_4_;
  fVar154 = auVar21._4_4_;
  fVar156 = auVar21._8_4_;
  fVar159 = auVar21._12_4_;
  fVar207 = auVar20._0_4_;
  fVar225 = auVar20._4_4_;
  fVar227 = auVar20._8_4_;
  fVar229 = auVar20._12_4_;
  fVar191 = auVar19._0_4_;
  fVar204 = auVar19._4_4_;
  fVar205 = auVar19._8_4_;
  fVar206 = auVar19._12_4_;
  auVar355._0_4_ = fVar191 * auVar103._0_4_ + fVar207 * auVar171._0_4_ + fVar124 * auVar105._0_4_;
  auVar355._4_4_ = fVar204 * auVar103._4_4_ + fVar225 * auVar171._4_4_ + fVar154 * auVar105._4_4_;
  auVar355._8_4_ = fVar205 * auVar103._8_4_ + fVar227 * auVar171._8_4_ + fVar156 * auVar105._8_4_;
  auVar355._12_4_ =
       fVar206 * auVar103._12_4_ + fVar229 * auVar171._12_4_ + fVar159 * auVar105._12_4_;
  auVar368._0_4_ = fVar191 * auVar132._0_4_ + fVar207 * auVar98._0_4_ + auVar104._0_4_ * fVar124;
  auVar368._4_4_ = fVar204 * auVar132._4_4_ + fVar225 * auVar98._4_4_ + auVar104._4_4_ * fVar154;
  auVar368._8_4_ = fVar205 * auVar132._8_4_ + fVar227 * auVar98._8_4_ + auVar104._8_4_ * fVar156;
  auVar368._12_4_ = fVar206 * auVar132._12_4_ + fVar229 * auVar98._12_4_ + auVar104._12_4_ * fVar159
  ;
  auVar284._0_4_ = fVar191 * auVar17._0_4_ + fVar207 * auVar356._0_4_ + auVar18._0_4_ * fVar124;
  auVar284._4_4_ = fVar204 * auVar17._4_4_ + fVar225 * auVar356._4_4_ + auVar18._4_4_ * fVar154;
  auVar284._8_4_ = fVar205 * auVar17._8_4_ + fVar227 * auVar356._8_4_ + auVar18._8_4_ * fVar156;
  auVar284._12_4_ = fVar206 * auVar17._12_4_ + fVar229 * auVar356._12_4_ + auVar18._12_4_ * fVar159;
  auVar19 = vshufps_avx(auVar162,auVar162,0);
  auVar20 = vshufps_avx(auVar162,auVar162,0x55);
  auVar21 = vshufps_avx(auVar162,auVar162,0xaa);
  fVar124 = auVar21._0_4_;
  fVar154 = auVar21._4_4_;
  fVar156 = auVar21._8_4_;
  fVar159 = auVar21._12_4_;
  fVar207 = auVar20._0_4_;
  fVar225 = auVar20._4_4_;
  fVar227 = auVar20._8_4_;
  fVar229 = auVar20._12_4_;
  fVar191 = auVar19._0_4_;
  fVar204 = auVar19._4_4_;
  fVar205 = auVar19._8_4_;
  fVar206 = auVar19._12_4_;
  auVar163._0_4_ = fVar191 * auVar103._0_4_ + fVar207 * auVar171._0_4_ + fVar124 * auVar105._0_4_;
  auVar163._4_4_ = fVar204 * auVar103._4_4_ + fVar225 * auVar171._4_4_ + fVar154 * auVar105._4_4_;
  auVar163._8_4_ = fVar205 * auVar103._8_4_ + fVar227 * auVar171._8_4_ + fVar156 * auVar105._8_4_;
  auVar163._12_4_ =
       fVar206 * auVar103._12_4_ + fVar229 * auVar171._12_4_ + fVar159 * auVar105._12_4_;
  auVar125._0_4_ = fVar191 * auVar132._0_4_ + auVar104._0_4_ * fVar124 + fVar207 * auVar98._0_4_;
  auVar125._4_4_ = fVar204 * auVar132._4_4_ + auVar104._4_4_ * fVar154 + fVar225 * auVar98._4_4_;
  auVar125._8_4_ = fVar205 * auVar132._8_4_ + auVar104._8_4_ * fVar156 + fVar227 * auVar98._8_4_;
  auVar125._12_4_ = fVar206 * auVar132._12_4_ + auVar104._12_4_ * fVar159 + fVar229 * auVar98._12_4_
  ;
  auVar93._0_4_ = fVar191 * auVar17._0_4_ + fVar207 * auVar356._0_4_ + auVar18._0_4_ * fVar124;
  auVar93._4_4_ = fVar204 * auVar17._4_4_ + fVar225 * auVar356._4_4_ + auVar18._4_4_ * fVar154;
  auVar93._8_4_ = fVar205 * auVar17._8_4_ + fVar227 * auVar356._8_4_ + auVar18._8_4_ * fVar156;
  auVar93._12_4_ = fVar206 * auVar17._12_4_ + fVar229 * auVar356._12_4_ + auVar18._12_4_ * fVar159;
  auVar255._8_4_ = 0x7fffffff;
  auVar255._0_8_ = 0x7fffffff7fffffff;
  auVar255._12_4_ = 0x7fffffff;
  auVar103 = vandps_avx(auVar355,auVar255);
  auVar209._8_4_ = 0x219392ef;
  auVar209._0_8_ = 0x219392ef219392ef;
  auVar209._12_4_ = 0x219392ef;
  auVar103 = vcmpps_avx(auVar103,auVar209,1);
  auVar171 = vblendvps_avx(auVar355,auVar209,auVar103);
  auVar103 = vandps_avx(auVar368,auVar255);
  auVar103 = vcmpps_avx(auVar103,auVar209,1);
  auVar105 = vblendvps_avx(auVar368,auVar209,auVar103);
  auVar103 = vandps_avx(auVar284,auVar255);
  auVar103 = vcmpps_avx(auVar103,auVar209,1);
  auVar103 = vblendvps_avx(auVar284,auVar209,auVar103);
  auVar132 = vrcpps_avx(auVar171);
  fVar191 = auVar132._0_4_;
  auVar192._0_4_ = fVar191 * auVar171._0_4_;
  fVar204 = auVar132._4_4_;
  auVar192._4_4_ = fVar204 * auVar171._4_4_;
  fVar205 = auVar132._8_4_;
  auVar192._8_4_ = fVar205 * auVar171._8_4_;
  fVar206 = auVar132._12_4_;
  auVar192._12_4_ = fVar206 * auVar171._12_4_;
  auVar285._8_4_ = 0x3f800000;
  auVar285._0_8_ = &DAT_3f8000003f800000;
  auVar285._12_4_ = 0x3f800000;
  auVar171 = vsubps_avx(auVar285,auVar192);
  fVar191 = fVar191 + fVar191 * auVar171._0_4_;
  fVar204 = fVar204 + fVar204 * auVar171._4_4_;
  fVar205 = fVar205 + fVar205 * auVar171._8_4_;
  fVar206 = fVar206 + fVar206 * auVar171._12_4_;
  auVar171 = vrcpps_avx(auVar105);
  fVar207 = auVar171._0_4_;
  auVar235._0_4_ = fVar207 * auVar105._0_4_;
  fVar225 = auVar171._4_4_;
  auVar235._4_4_ = fVar225 * auVar105._4_4_;
  fVar227 = auVar171._8_4_;
  auVar235._8_4_ = fVar227 * auVar105._8_4_;
  fVar229 = auVar171._12_4_;
  auVar235._12_4_ = fVar229 * auVar105._12_4_;
  auVar171 = vsubps_avx(auVar285,auVar235);
  fVar207 = fVar207 + fVar207 * auVar171._0_4_;
  fVar225 = fVar225 + fVar225 * auVar171._4_4_;
  fVar227 = fVar227 + fVar227 * auVar171._8_4_;
  fVar229 = fVar229 + fVar229 * auVar171._12_4_;
  auVar171 = vrcpps_avx(auVar103);
  fVar234 = auVar171._0_4_;
  auVar256._0_4_ = fVar234 * auVar103._0_4_;
  fVar249 = auVar171._4_4_;
  auVar256._4_4_ = fVar249 * auVar103._4_4_;
  fVar250 = auVar171._8_4_;
  auVar256._8_4_ = fVar250 * auVar103._8_4_;
  fVar251 = auVar171._12_4_;
  auVar256._12_4_ = fVar251 * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar285,auVar256);
  fVar234 = fVar234 + fVar234 * auVar103._0_4_;
  fVar249 = fVar249 + fVar249 * auVar103._4_4_;
  fVar250 = fVar250 + fVar250 * auVar103._8_4_;
  fVar251 = fVar251 + fVar251 * auVar103._12_4_;
  auVar103 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar89 + 0x16)) *
                           *(float *)(prim + lVar89 + 0x1a)));
  auVar105 = vshufps_avx(auVar103,auVar103,0);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar86 * 7 + 6);
  auVar103 = vpmovsxwd_avx(auVar103);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 6);
  auVar171 = vpmovsxwd_avx(auVar171);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar171 = vsubps_avx(auVar171,auVar103);
  fVar124 = auVar105._0_4_;
  fVar154 = auVar105._4_4_;
  fVar156 = auVar105._8_4_;
  fVar159 = auVar105._12_4_;
  auVar286._0_4_ = auVar171._0_4_ * fVar124 + auVar103._0_4_;
  auVar286._4_4_ = auVar171._4_4_ * fVar154 + auVar103._4_4_;
  auVar286._8_4_ = auVar171._8_4_ * fVar156 + auVar103._8_4_;
  auVar286._12_4_ = auVar171._12_4_ * fVar159 + auVar103._12_4_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar86 * 9 + 6);
  auVar103 = vpmovsxwd_avx(auVar105);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar86 * 0xd + 6);
  auVar171 = vpmovsxwd_avx(auVar132);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar171 = vsubps_avx(auVar171,auVar103);
  auVar301._0_4_ = auVar171._0_4_ * fVar124 + auVar103._0_4_;
  auVar301._4_4_ = auVar171._4_4_ * fVar154 + auVar103._4_4_;
  auVar301._8_4_ = auVar171._8_4_ * fVar156 + auVar103._8_4_;
  auVar301._12_4_ = auVar171._12_4_ * fVar159 + auVar103._12_4_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar86 * 0x12 + 6);
  auVar103 = vpmovsxwd_avx(auVar98);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar91 = (ulong)(uint)((int)(uVar86 * 5) << 2);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar86 * 2 + uVar91 + 6);
  auVar171 = vpmovsxwd_avx(auVar104);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar171 = vsubps_avx(auVar171,auVar103);
  auVar332._0_4_ = auVar171._0_4_ * fVar124 + auVar103._0_4_;
  auVar332._4_4_ = auVar171._4_4_ * fVar154 + auVar103._4_4_;
  auVar332._8_4_ = auVar171._8_4_ * fVar156 + auVar103._8_4_;
  auVar332._12_4_ = auVar171._12_4_ * fVar159 + auVar103._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar91 + 6);
  auVar103 = vpmovsxwd_avx(auVar17);
  auVar356._8_8_ = 0;
  auVar356._0_8_ = *(ulong *)(prim + uVar86 * 0x18 + 6);
  auVar171 = vpmovsxwd_avx(auVar356);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar171 = vsubps_avx(auVar171,auVar103);
  auVar341._0_4_ = auVar171._0_4_ * fVar124 + auVar103._0_4_;
  auVar341._4_4_ = auVar171._4_4_ * fVar154 + auVar103._4_4_;
  auVar341._8_4_ = auVar171._8_4_ * fVar156 + auVar103._8_4_;
  auVar341._12_4_ = auVar171._12_4_ * fVar159 + auVar103._12_4_;
  auVar345 = ZEXT1664(auVar341);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar86 * 0x1d + 6);
  auVar103 = vpmovsxwd_avx(auVar18);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar86 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar171 = vpmovsxwd_avx(auVar19);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar105 = vsubps_avx(auVar171,auVar103);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar86) + 6);
  auVar171 = vpmovsxwd_avx(auVar20);
  auVar346._0_4_ = auVar105._0_4_ * fVar124 + auVar103._0_4_;
  auVar346._4_4_ = auVar105._4_4_ * fVar154 + auVar103._4_4_;
  auVar346._8_4_ = auVar105._8_4_ * fVar156 + auVar103._8_4_;
  auVar346._12_4_ = auVar105._12_4_ * fVar159 + auVar103._12_4_;
  auVar352 = ZEXT1664(auVar346);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar86 * 0x23 + 6);
  auVar105 = vpmovsxwd_avx(auVar21);
  auVar103 = vcvtdq2ps_avx(auVar171);
  auVar171 = vcvtdq2ps_avx(auVar105);
  auVar171 = vsubps_avx(auVar171,auVar103);
  auVar359 = ZEXT1664(auVar171);
  auVar257._0_4_ = auVar103._0_4_ + auVar171._0_4_ * fVar124;
  auVar257._4_4_ = auVar103._4_4_ + auVar171._4_4_ * fVar154;
  auVar257._8_4_ = auVar103._8_4_ + auVar171._8_4_ * fVar156;
  auVar257._12_4_ = auVar103._12_4_ + auVar171._12_4_ * fVar159;
  auVar103 = vsubps_avx(auVar286,auVar163);
  auVar287._0_4_ = fVar191 * auVar103._0_4_;
  auVar287._4_4_ = fVar204 * auVar103._4_4_;
  auVar287._8_4_ = fVar205 * auVar103._8_4_;
  auVar287._12_4_ = fVar206 * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar301,auVar163);
  auVar164._0_4_ = fVar191 * auVar103._0_4_;
  auVar164._4_4_ = fVar204 * auVar103._4_4_;
  auVar164._8_4_ = fVar205 * auVar103._8_4_;
  auVar164._12_4_ = fVar206 * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar332,auVar125);
  auVar193._0_4_ = fVar207 * auVar103._0_4_;
  auVar193._4_4_ = fVar225 * auVar103._4_4_;
  auVar193._8_4_ = fVar227 * auVar103._8_4_;
  auVar193._12_4_ = fVar229 * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar341,auVar125);
  auVar126._0_4_ = fVar207 * auVar103._0_4_;
  auVar126._4_4_ = fVar225 * auVar103._4_4_;
  auVar126._8_4_ = fVar227 * auVar103._8_4_;
  auVar126._12_4_ = fVar229 * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar346,auVar93);
  auVar210._0_4_ = fVar234 * auVar103._0_4_;
  auVar210._4_4_ = fVar249 * auVar103._4_4_;
  auVar210._8_4_ = fVar250 * auVar103._8_4_;
  auVar210._12_4_ = fVar251 * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar257,auVar93);
  auVar94._0_4_ = fVar234 * auVar103._0_4_;
  auVar94._4_4_ = fVar249 * auVar103._4_4_;
  auVar94._8_4_ = fVar250 * auVar103._8_4_;
  auVar94._12_4_ = fVar251 * auVar103._12_4_;
  auVar103 = vpminsd_avx(auVar287,auVar164);
  auVar171 = vpminsd_avx(auVar193,auVar126);
  auVar103 = vmaxps_avx(auVar103,auVar171);
  auVar171 = vpminsd_avx(auVar210,auVar94);
  uVar313 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar302._4_4_ = uVar313;
  auVar302._0_4_ = uVar313;
  auVar302._8_4_ = uVar313;
  auVar302._12_4_ = uVar313;
  auVar171 = vmaxps_avx(auVar171,auVar302);
  auVar103 = vmaxps_avx(auVar103,auVar171);
  local_4d0._0_4_ = auVar103._0_4_ * 0.99999964;
  local_4d0._4_4_ = auVar103._4_4_ * 0.99999964;
  local_4d0._8_4_ = auVar103._8_4_ * 0.99999964;
  local_4d0._12_4_ = auVar103._12_4_ * 0.99999964;
  auVar103 = vpmaxsd_avx(auVar287,auVar164);
  auVar171 = vpmaxsd_avx(auVar193,auVar126);
  auVar103 = vminps_avx(auVar103,auVar171);
  auVar171 = vpmaxsd_avx(auVar210,auVar94);
  fVar124 = ray->tfar;
  auVar165._4_4_ = fVar124;
  auVar165._0_4_ = fVar124;
  auVar165._8_4_ = fVar124;
  auVar165._12_4_ = fVar124;
  auVar171 = vminps_avx(auVar171,auVar165);
  auVar103 = vminps_avx(auVar103,auVar171);
  auVar95._0_4_ = auVar103._0_4_ * 1.0000004;
  auVar95._4_4_ = auVar103._4_4_ * 1.0000004;
  auVar95._8_4_ = auVar103._8_4_ * 1.0000004;
  auVar95._12_4_ = auVar103._12_4_ * 1.0000004;
  auVar103 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar171 = vpcmpgtd_avx(auVar103,_DAT_01ff0cf0);
  auVar103 = vcmpps_avx(local_4d0,auVar95,2);
  auVar103 = vandps_avx(auVar103,auVar171);
  uVar85 = vmovmskps_avx(auVar103);
  local_ad1 = uVar85 != 0;
  if (uVar85 == 0) {
    return local_ad1;
  }
  uVar85 = uVar85 & 0xff;
  auVar110._16_16_ = mm_lookupmask_ps._240_16_;
  auVar110._0_16_ = mm_lookupmask_ps._240_16_;
  local_420 = vblendps_avx(auVar110,ZEXT832(0) << 0x20,0x80);
  auVar290 = ZEXT464(0) << 0x20;
  local_770 = prim;
LAB_01008f9e:
  local_768 = (ulong)uVar85;
  lVar89 = 0;
  if (local_768 != 0) {
    for (; (uVar85 >> lVar89 & 1) == 0; lVar89 = lVar89 + 1) {
    }
  }
  local_a68 = (ulong)*(uint *)(local_770 + 2);
  local_888 = (ulong)*(uint *)(local_770 + lVar89 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[local_a68].ptr;
  uVar86 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           local_888 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar124 = (pGVar12->time_range).lower;
  fVar124 = pGVar12->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar124) / ((pGVar12->time_range).upper - fVar124));
  auVar103 = vroundss_avx(ZEXT416((uint)fVar124),ZEXT416((uint)fVar124),9);
  auVar103 = vminss_avx(auVar103,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar103 = vmaxss_avx(auVar290._0_16_,auVar103);
  fVar124 = fVar124 - auVar103._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar88 = (long)(int)auVar103._0_4_ * 0x38;
  lVar89 = *(long *)(_Var13 + 0x10 + lVar88);
  lVar14 = *(long *)(_Var13 + 0x38 + lVar88);
  lVar15 = *(long *)(_Var13 + 0x48 + lVar88);
  auVar103 = vshufps_avx(ZEXT416((uint)fVar124),ZEXT416((uint)fVar124),0);
  pfVar1 = (float *)(lVar14 + uVar86 * lVar15);
  fVar191 = auVar103._0_4_;
  fVar204 = auVar103._4_4_;
  fVar205 = auVar103._8_4_;
  fVar206 = auVar103._12_4_;
  pfVar2 = (float *)(lVar14 + (uVar86 + 1) * lVar15);
  pfVar3 = (float *)(lVar14 + (uVar86 + 2) * lVar15);
  pfVar4 = (float *)(lVar14 + lVar15 * (uVar86 + 3));
  lVar14 = *(long *)(_Var13 + lVar88);
  auVar103 = vshufps_avx(ZEXT416((uint)(1.0 - fVar124)),ZEXT416((uint)(1.0 - fVar124)),0);
  pfVar5 = (float *)(lVar14 + lVar89 * uVar86);
  fVar124 = auVar103._0_4_;
  fVar154 = auVar103._4_4_;
  fVar156 = auVar103._8_4_;
  fVar159 = auVar103._12_4_;
  pfVar6 = (float *)(lVar14 + lVar89 * (uVar86 + 1));
  auVar166._0_4_ = fVar191 * *pfVar1 + fVar124 * *pfVar5;
  auVar166._4_4_ = fVar204 * pfVar1[1] + fVar154 * pfVar5[1];
  auVar166._8_4_ = fVar205 * pfVar1[2] + fVar156 * pfVar5[2];
  auVar166._12_4_ = fVar206 * pfVar1[3] + fVar159 * pfVar5[3];
  pfVar1 = (float *)(lVar14 + lVar89 * (uVar86 + 2));
  auVar194._0_4_ = fVar124 * *pfVar6 + fVar191 * *pfVar2;
  auVar194._4_4_ = fVar154 * pfVar6[1] + fVar204 * pfVar2[1];
  auVar194._8_4_ = fVar156 * pfVar6[2] + fVar205 * pfVar2[2];
  auVar194._12_4_ = fVar159 * pfVar6[3] + fVar206 * pfVar2[3];
  auVar211._0_4_ = fVar124 * *pfVar1 + fVar191 * *pfVar3;
  auVar211._4_4_ = fVar154 * pfVar1[1] + fVar204 * pfVar3[1];
  auVar211._8_4_ = fVar156 * pfVar1[2] + fVar205 * pfVar3[2];
  auVar211._12_4_ = fVar159 * pfVar1[3] + fVar206 * pfVar3[3];
  pfVar1 = (float *)(lVar14 + lVar89 * (uVar86 + 3));
  auVar236._0_4_ = fVar124 * *pfVar1 + fVar191 * *pfVar4;
  auVar236._4_4_ = fVar154 * pfVar1[1] + fVar204 * pfVar4[1];
  auVar236._8_4_ = fVar156 * pfVar1[2] + fVar205 * pfVar4[2];
  auVar236._12_4_ = fVar159 * pfVar1[3] + fVar206 * pfVar4[3];
  auVar96._0_4_ = (auVar166._0_4_ + auVar194._0_4_ + auVar211._0_4_ + auVar236._0_4_) * 0.25;
  auVar96._4_4_ = (auVar166._4_4_ + auVar194._4_4_ + auVar211._4_4_ + auVar236._4_4_) * 0.25;
  auVar96._8_4_ = (auVar166._8_4_ + auVar194._8_4_ + auVar211._8_4_ + auVar236._8_4_) * 0.25;
  auVar96._12_4_ = (auVar166._12_4_ + auVar194._12_4_ + auVar211._12_4_ + auVar236._12_4_) * 0.25;
  aVar8 = (ray->org).field_0.field_1;
  aVar9 = (ray->dir).field_0.field_1;
  auVar103 = vsubps_avx(auVar96,(undefined1  [16])aVar8);
  auVar103 = vdpps_avx(auVar103,(undefined1  [16])aVar9,0x7f);
  auVar171 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
  auVar105 = vrcpss_avx(auVar171,auVar171);
  auVar335 = ZEXT464(0x40000000);
  fVar124 = auVar103._0_4_ * auVar105._0_4_ * (2.0 - auVar105._0_4_ * auVar171._0_4_);
  local_790 = ZEXT416((uint)fVar124);
  auVar171 = vshufps_avx(local_790,ZEXT416((uint)fVar124),0);
  fVar124 = aVar9.x;
  fVar154 = aVar9.y;
  fVar156 = aVar9.z;
  aVar157 = aVar9.field_3;
  auVar258._0_4_ = aVar8.x + fVar124 * auVar171._0_4_;
  auVar258._4_4_ = aVar8.y + fVar154 * auVar171._4_4_;
  auVar258._8_4_ = aVar8.z + fVar156 * auVar171._8_4_;
  auVar258._12_4_ = aVar8.field_3.w + aVar157.w * auVar171._12_4_;
  auVar103 = vblendps_avx(auVar258,_DAT_01feba10,8);
  auVar266 = ZEXT1664(auVar103);
  _local_980 = vsubps_avx(auVar166,auVar103);
  auVar290 = ZEXT1664(_local_980);
  _local_990 = vsubps_avx(auVar211,auVar103);
  _local_9a0 = vsubps_avx(auVar194,auVar103);
  _local_9b0 = vsubps_avx(auVar236,auVar103);
  auVar248 = ZEXT1664(_local_9b0);
  auVar103 = vshufps_avx(_local_980,_local_980,0);
  register0x00001290 = auVar103;
  _local_1a0 = auVar103;
  auVar103 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001290 = auVar103;
  _local_1c0 = auVar103;
  auVar103 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001290 = auVar103;
  _local_1e0 = auVar103;
  auVar103 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001290 = auVar103;
  _local_200 = auVar103;
  auVar103 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001290 = auVar103;
  _local_220 = auVar103;
  auVar103 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001290 = auVar103;
  _local_2e0 = auVar103;
  auVar103 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001290 = auVar103;
  _local_240 = auVar103;
  auVar127._0_4_ = fVar124 * fVar124;
  auVar127._4_4_ = fVar154 * fVar154;
  auVar127._8_4_ = fVar156 * fVar156;
  auVar127._12_4_ = aVar157.w * aVar157.w;
  auVar103 = vshufps_avx(auVar127,auVar127,0xaa);
  auVar105 = vshufps_avx(auVar127,auVar127,0x55);
  auVar132 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x000012d0 = auVar132;
  _local_260 = auVar132;
  auVar132 = vshufps_avx(auVar127,auVar127,0);
  local_280._0_4_ = auVar132._0_4_ + auVar105._0_4_ + auVar103._0_4_;
  local_280._4_4_ = auVar132._4_4_ + auVar105._4_4_ + auVar103._4_4_;
  local_280._8_4_ = auVar132._8_4_ + auVar105._8_4_ + auVar103._8_4_;
  local_280._12_4_ = auVar132._12_4_ + auVar105._12_4_ + auVar103._12_4_;
  local_280._16_4_ = auVar132._0_4_ + auVar105._0_4_ + auVar103._0_4_;
  local_280._20_4_ = auVar132._4_4_ + auVar105._4_4_ + auVar103._4_4_;
  local_280._24_4_ = auVar132._8_4_ + auVar105._8_4_ + auVar103._8_4_;
  local_280._28_4_ = auVar132._12_4_ + auVar105._12_4_ + auVar103._12_4_;
  auVar103 = vshufps_avx(_local_990,_local_990,0);
  register0x00001250 = auVar103;
  _local_300 = auVar103;
  auVar103 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001250 = auVar103;
  _local_320 = auVar103;
  auVar103 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001250 = auVar103;
  _local_340 = auVar103;
  auVar103 = vshufps_avx(_local_990,_local_990,0xff);
  register0x00001250 = auVar103;
  _local_360 = auVar103;
  auVar103 = vshufps_avx(_local_9b0,_local_9b0,0);
  register0x00001250 = auVar103;
  _local_380 = auVar103;
  auVar103 = vshufps_avx(_local_9b0,_local_9b0,0x55);
  register0x00001250 = auVar103;
  _local_3a0 = auVar103;
  auVar103 = vshufps_avx(_local_9b0,_local_9b0,0xaa);
  register0x00001250 = auVar103;
  _local_3c0 = auVar103;
  auVar103 = vshufps_avx(_local_9b0,_local_9b0,0xff);
  local_3e0._16_16_ = auVar103;
  local_3e0._0_16_ = auVar103;
  register0x00001210 = auVar171;
  _local_7e0 = auVar171;
  uVar91 = 1;
  uVar86 = 0;
  bVar87 = 0;
  local_400 = (ray->dir).field_0.m128[0];
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_720 = (ray->dir).field_0.m128[1];
  local_740 = (ray->dir).field_0.m128[2];
  auVar111._8_4_ = 0x7fffffff;
  auVar111._0_8_ = 0x7fffffff7fffffff;
  auVar111._12_4_ = 0x7fffffff;
  auVar111._16_4_ = 0x7fffffff;
  auVar111._20_4_ = 0x7fffffff;
  auVar111._24_4_ = 0x7fffffff;
  auVar111._28_4_ = 0x7fffffff;
  local_440 = vandps_avx(local_280,auVar111);
  local_780 = ZEXT816(0x3f80000000000000);
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  fStack_71c = local_720;
  fStack_718 = local_720;
  fStack_714 = local_720;
  fStack_710 = local_720;
  fStack_70c = local_720;
  fStack_708 = local_720;
  fStack_704 = local_720;
  do {
    auVar103 = vmovshdup_avx(local_780);
    fVar206 = auVar103._0_4_ - local_780._0_4_;
    auVar103 = vshufps_avx(local_780,local_780,0);
    local_820._16_16_ = auVar103;
    local_820._0_16_ = auVar103;
    auVar171 = vshufps_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),0);
    local_800._16_16_ = auVar171;
    local_800._0_16_ = auVar171;
    fVar385 = auVar171._0_4_;
    fVar153 = auVar171._4_4_;
    fVar155 = auVar171._8_4_;
    fVar158 = auVar171._12_4_;
    fVar160 = auVar103._0_4_;
    auVar200._0_4_ = fVar160 + fVar385 * 0.0;
    fVar182 = auVar103._4_4_;
    auVar200._4_4_ = fVar182 + fVar153 * 0.14285715;
    fVar184 = auVar103._8_4_;
    auVar200._8_4_ = fVar184 + fVar155 * 0.2857143;
    fVar186 = auVar103._12_4_;
    auVar200._12_4_ = fVar186 + fVar158 * 0.42857146;
    auVar200._16_4_ = fVar160 + fVar385 * 0.5714286;
    auVar200._20_4_ = fVar182 + fVar153 * 0.71428573;
    auVar200._24_4_ = fVar184 + fVar155 * 0.8571429;
    auVar200._28_4_ = fVar186 + fVar158;
    auVar137._8_4_ = 0x3f800000;
    auVar137._0_8_ = &DAT_3f8000003f800000;
    auVar137._12_4_ = 0x3f800000;
    auVar137._16_4_ = 0x3f800000;
    auVar137._20_4_ = 0x3f800000;
    auVar137._24_4_ = 0x3f800000;
    auVar137._28_4_ = 0x3f800000;
    auVar110 = vsubps_avx(auVar137,auVar200);
    fVar124 = auVar110._0_4_;
    fVar154 = auVar110._4_4_;
    fVar156 = auVar110._8_4_;
    fVar159 = auVar110._12_4_;
    fVar191 = auVar110._16_4_;
    fVar204 = auVar110._20_4_;
    fVar205 = auVar110._24_4_;
    fVar229 = fVar124 * fVar124 * fVar124;
    fVar250 = fVar154 * fVar154 * fVar154;
    fVar267 = fVar156 * fVar156 * fVar156;
    fVar270 = fVar159 * fVar159 * fVar159;
    fVar273 = fVar191 * fVar191 * fVar191;
    fVar276 = fVar204 * fVar204 * fVar204;
    fVar279 = fVar205 * fVar205 * fVar205;
    fVar282 = auVar200._0_4_ * auVar200._0_4_ * auVar200._0_4_;
    fVar291 = auVar200._4_4_ * auVar200._4_4_ * auVar200._4_4_;
    fVar292 = auVar200._8_4_ * auVar200._8_4_ * auVar200._8_4_;
    fVar293 = auVar200._12_4_ * auVar200._12_4_ * auVar200._12_4_;
    fVar294 = auVar200._16_4_ * auVar200._16_4_ * auVar200._16_4_;
    fVar295 = auVar200._20_4_ * auVar200._20_4_ * auVar200._20_4_;
    fVar296 = auVar200._24_4_ * auVar200._24_4_ * auVar200._24_4_;
    fVar207 = auVar200._0_4_ * fVar124;
    fVar225 = auVar200._4_4_ * fVar154;
    fVar227 = auVar200._8_4_ * fVar156;
    fVar234 = auVar200._12_4_ * fVar159;
    fVar252 = auVar200._16_4_ * fVar191;
    fVar253 = auVar200._20_4_ * fVar204;
    fVar254 = auVar200._24_4_ * fVar205;
    fVar249 = auVar345._28_4_ + auVar359._28_4_;
    fVar331 = auVar290._28_4_ + auVar248._28_4_ + fVar249;
    fVar339 = fVar249 + auVar266._28_4_ + auVar352._28_4_ + auVar335._28_4_;
    fVar249 = fVar229 * 0.16666667;
    fVar251 = fVar250 * 0.16666667;
    fVar268 = fVar267 * 0.16666667;
    fVar271 = fVar270 * 0.16666667;
    fVar274 = fVar273 * 0.16666667;
    fVar277 = fVar276 * 0.16666667;
    fVar280 = fVar279 * 0.16666667;
    fVar297 = (fVar282 + fVar229 * 4.0 + fVar124 * fVar207 * 12.0 + auVar200._0_4_ * fVar207 * 6.0)
              * 0.16666667;
    fVar309 = (fVar291 + fVar250 * 4.0 + fVar154 * fVar225 * 12.0 + auVar200._4_4_ * fVar225 * 6.0)
              * 0.16666667;
    fVar314 = (fVar292 + fVar267 * 4.0 + fVar156 * fVar227 * 12.0 + auVar200._8_4_ * fVar227 * 6.0)
              * 0.16666667;
    fVar318 = (fVar293 + fVar270 * 4.0 + fVar159 * fVar234 * 12.0 + auVar200._12_4_ * fVar234 * 6.0)
              * 0.16666667;
    fVar322 = (fVar294 + fVar273 * 4.0 + fVar191 * fVar252 * 12.0 + auVar200._16_4_ * fVar252 * 6.0)
              * 0.16666667;
    fVar325 = (fVar295 + fVar276 * 4.0 + fVar204 * fVar253 * 12.0 + auVar200._20_4_ * fVar253 * 6.0)
              * 0.16666667;
    fVar328 = (fVar296 + fVar279 * 4.0 + fVar205 * fVar254 * 12.0 + auVar200._24_4_ * fVar254 * 6.0)
              * 0.16666667;
    fVar229 = (fVar282 * 4.0 + fVar229 + auVar200._0_4_ * fVar207 * 12.0 + fVar124 * fVar207 * 6.0)
              * 0.16666667;
    fVar250 = (fVar291 * 4.0 + fVar250 + auVar200._4_4_ * fVar225 * 12.0 + fVar154 * fVar225 * 6.0)
              * 0.16666667;
    fVar267 = (fVar292 * 4.0 + fVar267 + auVar200._8_4_ * fVar227 * 12.0 + fVar156 * fVar227 * 6.0)
              * 0.16666667;
    fVar270 = (fVar293 * 4.0 + fVar270 + auVar200._12_4_ * fVar234 * 12.0 + fVar159 * fVar234 * 6.0)
              * 0.16666667;
    fVar273 = (fVar294 * 4.0 + fVar273 + auVar200._16_4_ * fVar252 * 12.0 + fVar191 * fVar252 * 6.0)
              * 0.16666667;
    fVar276 = (fVar295 * 4.0 + fVar276 + auVar200._20_4_ * fVar253 * 12.0 + fVar204 * fVar253 * 6.0)
              * 0.16666667;
    fVar279 = (fVar296 * 4.0 + fVar279 + auVar200._24_4_ * fVar254 * 12.0 + fVar205 * fVar254 * 6.0)
              * 0.16666667;
    fVar282 = fVar282 * 0.16666667;
    fVar291 = fVar291 * 0.16666667;
    fVar292 = fVar292 * 0.16666667;
    fVar293 = fVar293 * 0.16666667;
    fVar294 = fVar294 * 0.16666667;
    fVar295 = fVar295 * 0.16666667;
    fVar296 = fVar296 * 0.16666667;
    fVar353 = auVar352._28_4_ + 12.0;
    fVar340 = fVar339 + 12.166667;
    local_900 = (float)local_1a0._0_4_ * fVar249 +
                fVar297 * (float)local_220._0_4_ +
                fVar282 * (float)local_380._0_4_ + fVar229 * (float)local_300._0_4_;
    fStack_8fc = (float)local_1a0._4_4_ * fVar251 +
                 fVar309 * (float)local_220._4_4_ +
                 fVar291 * (float)local_380._4_4_ + fVar250 * (float)local_300._4_4_;
    fStack_8f8 = fStack_198 * fVar268 +
                 fVar314 * fStack_218 + fVar292 * fStack_378 + fVar267 * fStack_2f8;
    fStack_8f4 = fStack_194 * fVar271 +
                 fVar318 * fStack_214 + fVar293 * fStack_374 + fVar270 * fStack_2f4;
    fStack_8f0 = fStack_190 * fVar274 +
                 fVar322 * fStack_210 + fVar294 * fStack_370 + fVar273 * fStack_2f0;
    fStack_8ec = fStack_18c * fVar277 +
                 fVar325 * fStack_20c + fVar295 * fStack_36c + fVar276 * fStack_2ec;
    fStack_8e8 = fStack_188 * fVar280 +
                 fVar328 * fStack_208 + fVar296 * fStack_368 + fVar279 * fStack_2e8;
    fStack_8e4 = fVar331 + fVar340;
    fVar298 = (float)local_1c0._0_4_ * fVar249 +
              fVar297 * (float)local_2e0._0_4_ +
              fVar282 * (float)local_3a0._0_4_ + fVar229 * (float)local_320._0_4_;
    fVar310 = (float)local_1c0._4_4_ * fVar251 +
              fVar309 * (float)local_2e0._4_4_ +
              fVar291 * (float)local_3a0._4_4_ + fVar250 * (float)local_320._4_4_;
    fVar315 = fStack_1b8 * fVar268 +
              fVar314 * fStack_2d8 + fVar292 * fStack_398 + fVar267 * fStack_318;
    fVar319 = fStack_1b4 * fVar271 +
              fVar318 * fStack_2d4 + fVar293 * fStack_394 + fVar270 * fStack_314;
    fStack_a90 = fStack_1b0 * fVar274 +
                 fVar322 * fStack_2d0 + fVar294 * fStack_390 + fVar273 * fStack_310;
    fStack_a8c = fStack_1ac * fVar277 +
                 fVar325 * fStack_2cc + fVar295 * fStack_38c + fVar276 * fStack_30c;
    fStack_a88 = fStack_1a8 * fVar280 +
                 fVar328 * fStack_2c8 + fVar296 * fStack_388 + fVar279 * fStack_308;
    fStack_a84 = fStack_8e4 + fVar353 + 12.166667;
    local_a60 = (float)local_1e0._0_4_ * fVar249 +
                (float)local_240._0_4_ * fVar297 +
                fVar282 * (float)local_3c0._0_4_ + fVar229 * (float)local_340._0_4_;
    fStack_a5c = (float)local_1e0._4_4_ * fVar251 +
                 (float)local_240._4_4_ * fVar309 +
                 fVar291 * (float)local_3c0._4_4_ + fVar250 * (float)local_340._4_4_;
    fStack_a58 = fStack_1d8 * fVar268 +
                 fStack_238 * fVar314 + fVar292 * fStack_3b8 + fVar267 * fStack_338;
    fStack_a54 = fStack_1d4 * fVar271 +
                 fStack_234 * fVar318 + fVar293 * fStack_3b4 + fVar270 * fStack_334;
    fStack_a50 = fStack_1d0 * fVar274 +
                 fStack_230 * fVar322 + fVar294 * fStack_3b0 + fVar273 * fStack_330;
    fStack_a4c = fStack_1cc * fVar277 +
                 fStack_22c * fVar325 + fVar295 * fStack_3ac + fVar276 * fStack_32c;
    fStack_a48 = fStack_1c8 * fVar280 +
                 fStack_228 * fVar328 + fVar296 * fStack_3a8 + fVar279 * fStack_328;
    fStack_a44 = fStack_a84 + fVar353 + auVar359._28_4_ + 12.0;
    local_ac0._0_4_ =
         (float)local_200._0_4_ * fVar249 +
         (float)local_260._0_4_ * fVar297 +
         fVar229 * (float)local_360._0_4_ + local_3e0._0_4_ * fVar282;
    local_ac0._4_4_ =
         (float)local_200._4_4_ * fVar251 +
         (float)local_260._4_4_ * fVar309 +
         fVar250 * (float)local_360._4_4_ + local_3e0._4_4_ * fVar291;
    fStack_ab8 = fStack_1f8 * fVar268 +
                 fStack_258 * fVar314 + fVar267 * fStack_358 + local_3e0._8_4_ * fVar292;
    fStack_ab4 = fStack_1f4 * fVar271 +
                 fStack_254 * fVar318 + fVar270 * fStack_354 + local_3e0._12_4_ * fVar293;
    fStack_ab0 = fStack_1f0 * fVar274 +
                 fStack_250 * fVar322 + fVar273 * fStack_350 + local_3e0._16_4_ * fVar294;
    fStack_aac = fStack_1ec * fVar277 +
                 fStack_24c * fVar325 + fVar276 * fStack_34c + local_3e0._20_4_ * fVar295;
    fStack_aa8 = fStack_1e8 * fVar280 +
                 fStack_248 * fVar328 + fVar279 * fStack_348 + local_3e0._24_4_ * fVar296;
    fStack_aa4 = auVar266._28_4_ + fVar331 + fVar339 + auVar290._28_4_;
    auVar22._4_4_ = auVar200._4_4_ * -auVar200._4_4_;
    auVar22._0_4_ = auVar200._0_4_ * -auVar200._0_4_;
    auVar22._8_4_ = auVar200._8_4_ * -auVar200._8_4_;
    auVar22._12_4_ = auVar200._12_4_ * -auVar200._12_4_;
    auVar22._16_4_ = auVar200._16_4_ * -auVar200._16_4_;
    auVar22._20_4_ = auVar200._20_4_ * -auVar200._20_4_;
    auVar22._24_4_ = auVar200._24_4_ * -auVar200._24_4_;
    auVar22._28_4_ = auVar200._28_4_;
    auVar371._4_4_ = fVar225 * 4.0;
    auVar371._0_4_ = fVar207 * 4.0;
    auVar371._8_4_ = fVar227 * 4.0;
    auVar371._12_4_ = fVar234 * 4.0;
    auVar371._16_4_ = fVar252 * 4.0;
    auVar371._20_4_ = fVar253 * 4.0;
    auVar371._24_4_ = fVar254 * 4.0;
    auVar371._28_4_ = auVar248._28_4_;
    auVar110 = vsubps_avx(auVar22,auVar371);
    fVar279 = fVar124 * -fVar124 * 0.5;
    fVar280 = fVar154 * -fVar154 * 0.5;
    fVar282 = fVar156 * -fVar156 * 0.5;
    fVar291 = fVar159 * -fVar159 * 0.5;
    fVar292 = fVar191 * -fVar191 * 0.5;
    fVar293 = fVar204 * -fVar204 * 0.5;
    fVar294 = fVar205 * -fVar205 * 0.5;
    fVar267 = auVar110._0_4_ * 0.5;
    fVar268 = auVar110._4_4_ * 0.5;
    fVar271 = auVar110._8_4_ * 0.5;
    fVar273 = auVar110._12_4_ * 0.5;
    fVar274 = auVar110._16_4_ * 0.5;
    fVar276 = auVar110._20_4_ * 0.5;
    fVar277 = auVar110._24_4_ * 0.5;
    fVar229 = (fVar124 * fVar124 + fVar207 * 4.0) * 0.5;
    fVar249 = (fVar154 * fVar154 + fVar225 * 4.0) * 0.5;
    fVar250 = (fVar156 * fVar156 + fVar227 * 4.0) * 0.5;
    fVar251 = (fVar159 * fVar159 + fVar234 * 4.0) * 0.5;
    fVar270 = (fVar191 * fVar191 + fVar252 * 4.0) * 0.5;
    fVar253 = (fVar204 * fVar204 + fVar253 * 4.0) * 0.5;
    fVar254 = (fVar205 * fVar205 + fVar254 * 4.0) * 0.5;
    fVar124 = auVar200._0_4_ * auVar200._0_4_ * 0.5;
    fVar154 = auVar200._4_4_ * auVar200._4_4_ * 0.5;
    fVar156 = auVar200._8_4_ * auVar200._8_4_ * 0.5;
    fVar159 = auVar200._12_4_ * auVar200._12_4_ * 0.5;
    fVar205 = auVar200._16_4_ * auVar200._16_4_ * 0.5;
    fVar207 = auVar200._20_4_ * auVar200._20_4_ * 0.5;
    fVar225 = auVar200._24_4_ * auVar200._24_4_ * 0.5;
    fVar340 = fStack_a84 + fVar340;
    auVar103 = vpermilps_avx(ZEXT416((uint)(fVar206 * 0.04761905)),0);
    fVar191 = auVar103._0_4_;
    fVar299 = fVar191 * ((float)local_1a0._0_4_ * fVar279 +
                        (float)local_220._0_4_ * fVar267 +
                        fVar229 * (float)local_300._0_4_ + fVar124 * (float)local_380._0_4_);
    fVar227 = auVar103._4_4_;
    fVar311 = fVar227 * ((float)local_1a0._4_4_ * fVar280 +
                        (float)local_220._4_4_ * fVar268 +
                        fVar249 * (float)local_300._4_4_ + fVar154 * (float)local_380._4_4_);
    local_a00._4_4_ = fVar311;
    local_a00._0_4_ = fVar299;
    fVar234 = auVar103._8_4_;
    fVar316 = fVar234 * (fStack_198 * fVar282 +
                        fStack_218 * fVar271 + fVar250 * fStack_2f8 + fVar156 * fStack_378);
    local_a00._8_4_ = fVar316;
    fVar252 = auVar103._12_4_;
    fVar320 = fVar252 * (fStack_194 * fVar291 +
                        fStack_214 * fVar273 + fVar251 * fStack_2f4 + fVar159 * fStack_374);
    local_a00._12_4_ = fVar320;
    fVar323 = fVar191 * (fStack_190 * fVar292 +
                        fStack_210 * fVar274 + fVar270 * fStack_2f0 + fVar205 * fStack_370);
    local_a00._16_4_ = fVar323;
    fVar326 = fVar227 * (fStack_18c * fVar293 +
                        fStack_20c * fVar276 + fVar253 * fStack_2ec + fVar207 * fStack_36c);
    local_a00._20_4_ = fVar326;
    fVar329 = fVar234 * (fStack_188 * fVar294 +
                        fStack_208 * fVar277 + fVar254 * fStack_2e8 + fVar225 * fStack_368);
    local_a00._24_4_ = fVar329;
    local_a00._28_4_ = fVar340;
    fVar354 = fVar191 * ((float)local_1c0._0_4_ * fVar279 +
                        fVar267 * (float)local_2e0._0_4_ +
                        fVar229 * (float)local_320._0_4_ + fVar124 * (float)local_3a0._0_4_);
    fVar360 = fVar227 * ((float)local_1c0._4_4_ * fVar280 +
                        fVar268 * (float)local_2e0._4_4_ +
                        fVar249 * (float)local_320._4_4_ + fVar154 * (float)local_3a0._4_4_);
    auVar27._4_4_ = fVar360;
    auVar27._0_4_ = fVar354;
    fVar361 = fVar234 * (fStack_1b8 * fVar282 +
                        fVar271 * fStack_2d8 + fVar250 * fStack_318 + fVar156 * fStack_398);
    auVar27._8_4_ = fVar361;
    fVar362 = fVar252 * (fStack_1b4 * fVar291 +
                        fVar273 * fStack_2d4 + fVar251 * fStack_314 + fVar159 * fStack_394);
    auVar27._12_4_ = fVar362;
    fVar363 = fVar191 * (fStack_1b0 * fVar292 +
                        fVar274 * fStack_2d0 + fVar270 * fStack_310 + fVar205 * fStack_390);
    auVar27._16_4_ = fVar363;
    fVar364 = fVar227 * (fStack_1ac * fVar293 +
                        fVar276 * fStack_2cc + fVar253 * fStack_30c + fVar207 * fStack_38c);
    auVar27._20_4_ = fVar364;
    fVar365 = fVar234 * (fStack_1a8 * fVar294 +
                        fVar277 * fStack_2c8 + fVar254 * fStack_308 + fVar225 * fStack_388);
    auVar27._24_4_ = fVar365;
    auVar27._28_4_ = fStack_1a4;
    fVar366 = fVar191 * ((float)local_1e0._0_4_ * fVar279 +
                        fVar124 * (float)local_3c0._0_4_ + fVar229 * (float)local_340._0_4_ +
                        (float)local_240._0_4_ * fVar267);
    fVar373 = fVar227 * ((float)local_1e0._4_4_ * fVar280 +
                        fVar154 * (float)local_3c0._4_4_ + fVar249 * (float)local_340._4_4_ +
                        (float)local_240._4_4_ * fVar268);
    local_9e0._4_4_ = fVar373;
    local_9e0._0_4_ = fVar366;
    fVar375 = fVar234 * (fStack_1d8 * fVar282 +
                        fVar156 * fStack_3b8 + fVar250 * fStack_338 + fStack_238 * fVar271);
    local_9e0._8_4_ = fVar375;
    fVar377 = fVar252 * (fStack_1d4 * fVar291 +
                        fVar159 * fStack_3b4 + fVar251 * fStack_334 + fStack_234 * fVar273);
    local_9e0._12_4_ = fVar377;
    fVar379 = fVar191 * (fStack_1d0 * fVar292 +
                        fVar205 * fStack_3b0 + fVar270 * fStack_330 + fStack_230 * fVar274);
    local_9e0._16_4_ = fVar379;
    fVar381 = fVar227 * (fStack_1cc * fVar293 +
                        fVar207 * fStack_3ac + fVar253 * fStack_32c + fStack_22c * fVar276);
    local_9e0._20_4_ = fVar381;
    fVar383 = fVar234 * (fStack_1c8 * fVar294 +
                        fVar225 * fStack_3a8 + fVar254 * fStack_328 + fStack_228 * fVar277);
    local_9e0._24_4_ = fVar383;
    local_9e0._28_4_ = uStack_1e4;
    fVar204 = fVar191 * ((float)local_200._0_4_ * fVar279 +
                        (float)local_260._0_4_ * fVar267 +
                        fVar124 * local_3e0._0_4_ + fVar229 * (float)local_360._0_4_);
    fVar229 = fVar227 * ((float)local_200._4_4_ * fVar280 +
                        (float)local_260._4_4_ * fVar268 +
                        fVar154 * local_3e0._4_4_ + fVar249 * (float)local_360._4_4_);
    auVar23._4_4_ = fVar229;
    auVar23._0_4_ = fVar204;
    fVar267 = fVar234 * (fStack_1f8 * fVar282 +
                        fStack_258 * fVar271 + fVar156 * local_3e0._8_4_ + fVar250 * fStack_358);
    auVar23._8_4_ = fVar267;
    fVar268 = fVar252 * (fStack_1f4 * fVar291 +
                        fStack_254 * fVar273 + fVar159 * local_3e0._12_4_ + fVar251 * fStack_354);
    auVar23._12_4_ = fVar268;
    fVar191 = fVar191 * (fStack_1f0 * fVar292 +
                        fStack_250 * fVar274 + fVar205 * local_3e0._16_4_ + fVar270 * fStack_350);
    auVar23._16_4_ = fVar191;
    fVar227 = fVar227 * (fStack_1ec * fVar293 +
                        fStack_24c * fVar276 + fVar207 * local_3e0._20_4_ + fVar253 * fStack_34c);
    auVar23._20_4_ = fVar227;
    fVar234 = fVar234 * (fStack_1e8 * fVar294 +
                        fStack_248 * fVar277 + fVar225 * local_3e0._24_4_ + fVar254 * fStack_348);
    auVar23._24_4_ = fVar234;
    auVar23._28_4_ = fVar252;
    auVar79._4_4_ = fVar310;
    auVar79._0_4_ = fVar298;
    auVar79._8_4_ = fVar315;
    auVar79._12_4_ = fVar319;
    auVar79._16_4_ = fStack_a90;
    auVar79._20_4_ = fStack_a8c;
    auVar79._24_4_ = fStack_a88;
    auVar79._28_4_ = fStack_a84;
    auVar110 = vperm2f128_avx(auVar79,auVar79,1);
    auVar110 = vshufps_avx(auVar110,auVar79,0x30);
    local_920 = vshufps_avx(auVar79,auVar110,0x29);
    auVar81._4_4_ = fStack_a5c;
    auVar81._0_4_ = local_a60;
    auVar81._8_4_ = fStack_a58;
    auVar81._12_4_ = fStack_a54;
    auVar81._16_4_ = fStack_a50;
    auVar81._20_4_ = fStack_a4c;
    auVar81._24_4_ = fStack_a48;
    auVar81._28_4_ = fStack_a44;
    auVar110 = vperm2f128_avx(auVar81,auVar81,1);
    auVar110 = vshufps_avx(auVar110,auVar81,0x30);
    _local_880 = vshufps_avx(auVar81,auVar110,0x29);
    auVar111 = vsubps_avx(_local_ac0,auVar23);
    auVar110 = vperm2f128_avx(auVar111,auVar111,1);
    auVar110 = vshufps_avx(auVar110,auVar111,0x30);
    local_6a0 = vshufps_avx(auVar111,auVar110,0x29);
    auVar22 = vsubps_avx(local_920,auVar79);
    auVar23 = vsubps_avx(_local_880,auVar81);
    fVar154 = auVar22._0_4_;
    fVar206 = auVar22._4_4_;
    auVar139._4_4_ = fVar373 * fVar206;
    auVar139._0_4_ = fVar366 * fVar154;
    fVar249 = auVar22._8_4_;
    auVar139._8_4_ = fVar375 * fVar249;
    fVar270 = auVar22._12_4_;
    auVar139._12_4_ = fVar377 * fVar270;
    fVar276 = auVar22._16_4_;
    auVar139._16_4_ = fVar379 * fVar276;
    fVar292 = auVar22._20_4_;
    auVar139._20_4_ = fVar381 * fVar292;
    fVar309 = auVar22._24_4_;
    auVar139._24_4_ = fVar383 * fVar309;
    auVar139._28_4_ = auVar111._28_4_;
    fVar156 = auVar23._0_4_;
    fVar207 = auVar23._4_4_;
    auVar24._4_4_ = fVar360 * fVar207;
    auVar24._0_4_ = fVar354 * fVar156;
    fVar250 = auVar23._8_4_;
    auVar24._8_4_ = fVar361 * fVar250;
    fVar253 = auVar23._12_4_;
    auVar24._12_4_ = fVar362 * fVar253;
    fVar277 = auVar23._16_4_;
    auVar24._16_4_ = fVar363 * fVar277;
    fVar293 = auVar23._20_4_;
    auVar24._20_4_ = fVar364 * fVar293;
    fVar314 = auVar23._24_4_;
    auVar24._24_4_ = fVar365 * fVar314;
    auVar24._28_4_ = auVar110._28_4_;
    auVar22 = vsubps_avx(auVar24,auVar139);
    auVar82._4_4_ = fStack_8fc;
    auVar82._0_4_ = local_900;
    auVar82._8_4_ = fStack_8f8;
    auVar82._12_4_ = fStack_8f4;
    auVar82._16_4_ = fStack_8f0;
    auVar82._20_4_ = fStack_8ec;
    auVar82._24_4_ = fStack_8e8;
    auVar82._28_4_ = fStack_8e4;
    auVar110 = vperm2f128_avx(auVar82,auVar82,1);
    auVar110 = vshufps_avx(auVar110,auVar82,0x30);
    auVar371 = vshufps_avx(auVar82,auVar110,0x29);
    auVar111 = vsubps_avx(auVar371,auVar82);
    auVar25._4_4_ = fVar311 * fVar207;
    auVar25._0_4_ = fVar299 * fVar156;
    auVar25._8_4_ = fVar316 * fVar250;
    auVar25._12_4_ = fVar320 * fVar253;
    auVar25._16_4_ = fVar323 * fVar277;
    auVar25._20_4_ = fVar326 * fVar293;
    auVar25._24_4_ = fVar329 * fVar314;
    auVar25._28_4_ = auVar110._28_4_;
    fVar159 = auVar111._0_4_;
    fVar225 = auVar111._4_4_;
    auVar26._4_4_ = fVar373 * fVar225;
    auVar26._0_4_ = fVar366 * fVar159;
    fVar251 = auVar111._8_4_;
    auVar26._8_4_ = fVar375 * fVar251;
    fVar254 = auVar111._12_4_;
    auVar26._12_4_ = fVar377 * fVar254;
    fVar279 = auVar111._16_4_;
    auVar26._16_4_ = fVar379 * fVar279;
    fVar294 = auVar111._20_4_;
    auVar26._20_4_ = fVar381 * fVar294;
    fVar318 = auVar111._24_4_;
    auVar26._24_4_ = fVar383 * fVar318;
    auVar26._28_4_ = local_880._28_4_;
    auVar139 = vsubps_avx(auVar26,auVar25);
    auVar305._4_4_ = fVar360 * fVar225;
    auVar305._0_4_ = fVar354 * fVar159;
    auVar305._8_4_ = fVar361 * fVar251;
    auVar305._12_4_ = fVar362 * fVar254;
    auVar305._16_4_ = fVar363 * fVar279;
    auVar305._20_4_ = fVar364 * fVar294;
    auVar305._24_4_ = fVar365 * fVar318;
    auVar305._28_4_ = local_880._28_4_;
    auVar289._4_4_ = fVar311 * fVar206;
    auVar289._0_4_ = fVar299 * fVar154;
    auVar289._8_4_ = fVar316 * fVar249;
    auVar289._12_4_ = fVar320 * fVar270;
    auVar289._16_4_ = fVar323 * fVar276;
    auVar289._20_4_ = fVar326 * fVar292;
    auVar289._24_4_ = fVar329 * fVar309;
    auVar289._28_4_ = uStack_1c4;
    auVar24 = vsubps_avx(auVar289,auVar305);
    fVar124 = auVar24._28_4_;
    auVar138._0_4_ = fVar159 * fVar159 + fVar154 * fVar154 + fVar156 * fVar156;
    auVar138._4_4_ = fVar225 * fVar225 + fVar206 * fVar206 + fVar207 * fVar207;
    auVar138._8_4_ = fVar251 * fVar251 + fVar249 * fVar249 + fVar250 * fVar250;
    auVar138._12_4_ = fVar254 * fVar254 + fVar270 * fVar270 + fVar253 * fVar253;
    auVar138._16_4_ = fVar279 * fVar279 + fVar276 * fVar276 + fVar277 * fVar277;
    auVar138._20_4_ = fVar294 * fVar294 + fVar292 * fVar292 + fVar293 * fVar293;
    auVar138._24_4_ = fVar318 * fVar318 + fVar309 * fVar309 + fVar314 * fVar314;
    auVar138._28_4_ = fVar124 + fVar124 + auVar22._28_4_;
    auVar110 = vrcpps_avx(auVar138);
    fVar271 = auVar110._0_4_;
    fVar273 = auVar110._4_4_;
    auVar28._4_4_ = fVar273 * auVar138._4_4_;
    auVar28._0_4_ = fVar271 * auVar138._0_4_;
    fVar274 = auVar110._8_4_;
    auVar28._8_4_ = fVar274 * auVar138._8_4_;
    fVar280 = auVar110._12_4_;
    auVar28._12_4_ = fVar280 * auVar138._12_4_;
    fVar282 = auVar110._16_4_;
    auVar28._16_4_ = fVar282 * auVar138._16_4_;
    fVar291 = auVar110._20_4_;
    auVar28._20_4_ = fVar291 * auVar138._20_4_;
    fVar295 = auVar110._24_4_;
    auVar28._24_4_ = fVar295 * auVar138._24_4_;
    auVar28._28_4_ = uStack_1c4;
    auVar387._8_4_ = 0x3f800000;
    auVar387._0_8_ = &DAT_3f8000003f800000;
    auVar387._12_4_ = 0x3f800000;
    auVar387._16_4_ = 0x3f800000;
    auVar387._20_4_ = 0x3f800000;
    auVar387._24_4_ = 0x3f800000;
    auVar387._28_4_ = 0x3f800000;
    auVar25 = vsubps_avx(auVar387,auVar28);
    fVar271 = auVar25._0_4_ * fVar271 + fVar271;
    fVar273 = auVar25._4_4_ * fVar273 + fVar273;
    fVar274 = auVar25._8_4_ * fVar274 + fVar274;
    fVar280 = auVar25._12_4_ * fVar280 + fVar280;
    fVar282 = auVar25._16_4_ * fVar282 + fVar282;
    fVar291 = auVar25._20_4_ * fVar291 + fVar291;
    fVar295 = auVar25._24_4_ * fVar295 + fVar295;
    auVar111 = vperm2f128_avx(auVar27,auVar27,1);
    auVar111 = vshufps_avx(auVar111,auVar27,0x30);
    local_860 = vshufps_avx(auVar27,auVar111,0x29);
    auVar111 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar111 = vshufps_avx(auVar111,local_9e0,0x30);
    local_8e0 = vshufps_avx(local_9e0,auVar111,0x29);
    fVar367 = local_8e0._0_4_;
    fVar374 = local_8e0._4_4_;
    auVar29._4_4_ = fVar374 * fVar206;
    auVar29._0_4_ = fVar367 * fVar154;
    fVar376 = local_8e0._8_4_;
    auVar29._8_4_ = fVar376 * fVar249;
    fVar378 = local_8e0._12_4_;
    auVar29._12_4_ = fVar378 * fVar270;
    fVar380 = local_8e0._16_4_;
    auVar29._16_4_ = fVar380 * fVar276;
    fVar382 = local_8e0._20_4_;
    auVar29._20_4_ = fVar382 * fVar292;
    fVar384 = local_8e0._24_4_;
    auVar29._24_4_ = fVar384 * fVar309;
    auVar29._28_4_ = auVar111._28_4_;
    fVar386 = local_860._0_4_;
    fVar391 = local_860._4_4_;
    auVar30._4_4_ = fVar391 * fVar207;
    auVar30._0_4_ = fVar386 * fVar156;
    fVar392 = local_860._8_4_;
    auVar30._8_4_ = fVar392 * fVar250;
    fVar393 = local_860._12_4_;
    auVar30._12_4_ = fVar393 * fVar253;
    fVar394 = local_860._16_4_;
    auVar30._16_4_ = fVar394 * fVar277;
    fVar395 = local_860._20_4_;
    auVar30._20_4_ = fVar395 * fVar293;
    fVar396 = local_860._24_4_;
    auVar30._24_4_ = fVar396 * fVar314;
    auVar30._28_4_ = fStack_1a4;
    auVar26 = vsubps_avx(auVar30,auVar29);
    auVar111 = vperm2f128_avx(local_a00,local_a00,1);
    auVar111 = vshufps_avx(auVar111,local_a00,0x30);
    local_680 = vshufps_avx(local_a00,auVar111,0x29);
    fVar300 = local_680._0_4_;
    fVar312 = local_680._4_4_;
    auVar31._4_4_ = fVar312 * fVar207;
    auVar31._0_4_ = fVar300 * fVar156;
    fVar317 = local_680._8_4_;
    auVar31._8_4_ = fVar317 * fVar250;
    fVar321 = local_680._12_4_;
    auVar31._12_4_ = fVar321 * fVar253;
    fVar324 = local_680._16_4_;
    auVar31._16_4_ = fVar324 * fVar277;
    fVar327 = local_680._20_4_;
    auVar31._20_4_ = fVar327 * fVar293;
    fVar330 = local_680._24_4_;
    auVar31._24_4_ = fVar330 * fVar314;
    auVar31._28_4_ = auVar111._28_4_;
    auVar32._4_4_ = fVar374 * fVar225;
    auVar32._0_4_ = fVar367 * fVar159;
    auVar32._8_4_ = fVar376 * fVar251;
    auVar32._12_4_ = fVar378 * fVar254;
    auVar32._16_4_ = fVar380 * fVar279;
    auVar32._20_4_ = fVar382 * fVar294;
    uVar85 = local_8e0._28_4_;
    auVar32._24_4_ = fVar384 * fVar318;
    auVar32._28_4_ = uVar85;
    auVar111 = vsubps_avx(auVar32,auVar31);
    auVar33._4_4_ = fVar391 * fVar225;
    auVar33._0_4_ = fVar386 * fVar159;
    auVar33._8_4_ = fVar392 * fVar251;
    auVar33._12_4_ = fVar393 * fVar254;
    auVar33._16_4_ = fVar394 * fVar279;
    auVar33._20_4_ = fVar395 * fVar294;
    auVar33._24_4_ = fVar396 * fVar318;
    auVar33._28_4_ = uVar85;
    auVar34._4_4_ = fVar312 * fVar206;
    auVar34._0_4_ = fVar300 * fVar154;
    auVar34._8_4_ = fVar317 * fVar249;
    auVar34._12_4_ = fVar321 * fVar270;
    auVar34._16_4_ = fVar324 * fVar276;
    auVar34._20_4_ = fVar327 * fVar292;
    auVar34._24_4_ = fVar330 * fVar309;
    auVar34._28_4_ = local_860._28_4_;
    auVar305 = vsubps_avx(auVar34,auVar33);
    fVar205 = auVar305._28_4_;
    fVar297 = auVar111._28_4_ + fVar205;
    auVar35._4_4_ =
         (auVar22._4_4_ * auVar22._4_4_ +
         auVar139._4_4_ * auVar139._4_4_ + auVar24._4_4_ * auVar24._4_4_) * fVar273;
    auVar35._0_4_ =
         (auVar22._0_4_ * auVar22._0_4_ +
         auVar139._0_4_ * auVar139._0_4_ + auVar24._0_4_ * auVar24._0_4_) * fVar271;
    auVar35._8_4_ =
         (auVar22._8_4_ * auVar22._8_4_ +
         auVar139._8_4_ * auVar139._8_4_ + auVar24._8_4_ * auVar24._8_4_) * fVar274;
    auVar35._12_4_ =
         (auVar22._12_4_ * auVar22._12_4_ +
         auVar139._12_4_ * auVar139._12_4_ + auVar24._12_4_ * auVar24._12_4_) * fVar280;
    auVar35._16_4_ =
         (auVar22._16_4_ * auVar22._16_4_ +
         auVar139._16_4_ * auVar139._16_4_ + auVar24._16_4_ * auVar24._16_4_) * fVar282;
    auVar35._20_4_ =
         (auVar22._20_4_ * auVar22._20_4_ +
         auVar139._20_4_ * auVar139._20_4_ + auVar24._20_4_ * auVar24._20_4_) * fVar291;
    auVar35._24_4_ =
         (auVar22._24_4_ * auVar22._24_4_ +
         auVar139._24_4_ * auVar139._24_4_ + auVar24._24_4_ * auVar24._24_4_) * fVar295;
    auVar35._28_4_ = auVar22._28_4_ + auVar139._28_4_ + fVar124;
    auVar36._4_4_ =
         (auVar26._4_4_ * auVar26._4_4_ +
         auVar111._4_4_ * auVar111._4_4_ + auVar305._4_4_ * auVar305._4_4_) * fVar273;
    auVar36._0_4_ =
         (auVar26._0_4_ * auVar26._0_4_ +
         auVar111._0_4_ * auVar111._0_4_ + auVar305._0_4_ * auVar305._0_4_) * fVar271;
    auVar36._8_4_ =
         (auVar26._8_4_ * auVar26._8_4_ +
         auVar111._8_4_ * auVar111._8_4_ + auVar305._8_4_ * auVar305._8_4_) * fVar274;
    auVar36._12_4_ =
         (auVar26._12_4_ * auVar26._12_4_ +
         auVar111._12_4_ * auVar111._12_4_ + auVar305._12_4_ * auVar305._12_4_) * fVar280;
    auVar36._16_4_ =
         (auVar26._16_4_ * auVar26._16_4_ +
         auVar111._16_4_ * auVar111._16_4_ + auVar305._16_4_ * auVar305._16_4_) * fVar282;
    auVar36._20_4_ =
         (auVar26._20_4_ * auVar26._20_4_ +
         auVar111._20_4_ * auVar111._20_4_ + auVar305._20_4_ * auVar305._20_4_) * fVar291;
    auVar36._24_4_ =
         (auVar26._24_4_ * auVar26._24_4_ +
         auVar111._24_4_ * auVar111._24_4_ + auVar305._24_4_ * auVar305._24_4_) * fVar295;
    auVar36._28_4_ = auVar25._28_4_ + auVar110._28_4_;
    auVar110 = vmaxps_avx(auVar35,auVar36);
    auVar111 = vperm2f128_avx(_local_ac0,_local_ac0,1);
    auVar111 = vshufps_avx(auVar111,_local_ac0,0x30);
    local_6c0 = vshufps_avx(_local_ac0,auVar111,0x29);
    local_6e0._0_4_ = (float)local_ac0._0_4_ + fVar204;
    local_6e0._4_4_ = (float)local_ac0._4_4_ + fVar229;
    fStack_6d8 = fStack_ab8 + fVar267;
    fStack_6d4 = fStack_ab4 + fVar268;
    fStack_6d0 = fStack_ab0 + fVar191;
    fStack_6cc = fStack_aac + fVar227;
    fStack_6c8 = fStack_aa8 + fVar234;
    fStack_6c4 = fStack_aa4 + fVar252;
    auVar111 = vmaxps_avx(_local_ac0,_local_6e0);
    auVar22 = vmaxps_avx(local_6a0,local_6c0);
    auVar111 = vmaxps_avx(auVar111,auVar22);
    auVar22 = vrsqrtps_avx(auVar138);
    fVar124 = auVar22._0_4_;
    fVar191 = auVar22._4_4_;
    fVar204 = auVar22._8_4_;
    fVar227 = auVar22._12_4_;
    fVar229 = auVar22._16_4_;
    fVar234 = auVar22._20_4_;
    fVar267 = auVar22._24_4_;
    auVar37._4_4_ = fVar191 * fVar191 * fVar191 * auVar138._4_4_ * 0.5;
    auVar37._0_4_ = fVar124 * fVar124 * fVar124 * auVar138._0_4_ * 0.5;
    auVar37._8_4_ = fVar204 * fVar204 * fVar204 * auVar138._8_4_ * 0.5;
    auVar37._12_4_ = fVar227 * fVar227 * fVar227 * auVar138._12_4_ * 0.5;
    auVar37._16_4_ = fVar229 * fVar229 * fVar229 * auVar138._16_4_ * 0.5;
    auVar37._20_4_ = fVar234 * fVar234 * fVar234 * auVar138._20_4_ * 0.5;
    auVar37._24_4_ = fVar267 * fVar267 * fVar267 * auVar138._24_4_ * 0.5;
    auVar37._28_4_ = auVar138._28_4_;
    auVar38._4_4_ = fVar191 * 1.5;
    auVar38._0_4_ = fVar124 * 1.5;
    auVar38._8_4_ = fVar204 * 1.5;
    auVar38._12_4_ = fVar227 * 1.5;
    auVar38._16_4_ = fVar229 * 1.5;
    auVar38._20_4_ = fVar234 * 1.5;
    auVar38._24_4_ = fVar267 * 1.5;
    auVar38._28_4_ = auVar22._28_4_;
    auVar22 = vsubps_avx(auVar38,auVar37);
    auVar352 = ZEXT3264(auVar22);
    auVar80._4_4_ = fVar310;
    auVar80._0_4_ = fVar298;
    auVar80._8_4_ = fVar315;
    auVar80._12_4_ = fVar319;
    auVar80._16_4_ = fStack_a90;
    auVar80._20_4_ = fStack_a8c;
    auVar80._24_4_ = fStack_a88;
    auVar80._28_4_ = fStack_a84;
    auVar139 = vsubps_avx(ZEXT832(0) << 0x20,auVar80);
    auVar24 = vsubps_avx(ZEXT832(0) << 0x20,auVar81);
    fVar191 = auVar24._0_4_;
    fVar227 = auVar24._4_4_;
    fVar267 = auVar24._8_4_;
    fVar271 = auVar24._12_4_;
    fVar280 = auVar24._16_4_;
    fVar295 = auVar24._20_4_;
    fVar322 = auVar24._24_4_;
    fVar204 = auVar139._0_4_;
    fVar229 = auVar139._4_4_;
    fVar252 = auVar139._8_4_;
    fVar273 = auVar139._12_4_;
    fVar282 = auVar139._16_4_;
    fVar296 = auVar139._20_4_;
    fVar325 = auVar139._24_4_;
    auVar305 = ZEXT832(0) << 0x20;
    auVar25 = vsubps_avx(auVar305,auVar82);
    fVar397 = auVar25._0_4_;
    fVar399 = auVar25._4_4_;
    fVar400 = auVar25._8_4_;
    fVar401 = auVar25._12_4_;
    fVar402 = auVar25._16_4_;
    fVar403 = auVar25._20_4_;
    fVar404 = auVar25._24_4_;
    auVar343._0_4_ = fVar397 * local_400 + local_720 * fVar204 + local_740 * fVar191;
    auVar343._4_4_ = fVar399 * fStack_3fc + fStack_71c * fVar229 + fStack_73c * fVar227;
    auVar343._8_4_ = fVar400 * fStack_3f8 + fStack_718 * fVar252 + fStack_738 * fVar267;
    auVar343._12_4_ = fVar401 * fStack_3f4 + fStack_714 * fVar273 + fStack_734 * fVar271;
    auVar343._16_4_ = fVar402 * fStack_3f0 + fStack_710 * fVar282 + fStack_730 * fVar280;
    auVar343._20_4_ = fVar403 * fStack_3ec + fStack_70c * fVar296 + fStack_72c * fVar295;
    auVar343._24_4_ = fVar404 * fStack_3e8 + fStack_708 * fVar325 + fStack_728 * fVar322;
    auVar343._28_4_ = fVar297 + fVar297 + auVar26._28_4_ + fVar297;
    auVar357._0_4_ = fVar397 * fVar397 + fVar204 * fVar204 + fVar191 * fVar191;
    auVar357._4_4_ = fVar399 * fVar399 + fVar229 * fVar229 + fVar227 * fVar227;
    auVar357._8_4_ = fVar400 * fVar400 + fVar252 * fVar252 + fVar267 * fVar267;
    auVar357._12_4_ = fVar401 * fVar401 + fVar273 * fVar273 + fVar271 * fVar271;
    auVar357._16_4_ = fVar402 * fVar402 + fVar282 * fVar282 + fVar280 * fVar280;
    auVar357._20_4_ = fVar403 * fVar403 + fVar296 * fVar296 + fVar295 * fVar295;
    auVar357._24_4_ = fVar404 * fVar404 + fVar325 * fVar325 + fVar322 * fVar322;
    auVar357._28_4_ = fVar205 + fVar205 + fVar297;
    fVar205 = auVar22._0_4_;
    fVar234 = auVar22._4_4_;
    fVar268 = auVar22._8_4_;
    fVar274 = auVar22._12_4_;
    fVar291 = auVar22._16_4_;
    fVar297 = auVar22._20_4_;
    fVar328 = auVar22._24_4_;
    fVar124 = auVar23._28_4_;
    fVar161 = local_400 * fVar205 * fVar159 +
              fVar154 * fVar205 * local_720 + fVar205 * fVar156 * local_740;
    fVar183 = fStack_3fc * fVar234 * fVar225 +
              fVar206 * fVar234 * fStack_71c + fVar234 * fVar207 * fStack_73c;
    fVar185 = fStack_3f8 * fVar268 * fVar251 +
              fVar249 * fVar268 * fStack_718 + fVar268 * fVar250 * fStack_738;
    fVar187 = fStack_3f4 * fVar274 * fVar254 +
              fVar270 * fVar274 * fStack_714 + fVar274 * fVar253 * fStack_734;
    fVar188 = fStack_3f0 * fVar291 * fVar279 +
              fVar276 * fVar291 * fStack_710 + fVar291 * fVar277 * fStack_730;
    fVar189 = fStack_3ec * fVar297 * fVar294 +
              fVar292 * fVar297 * fStack_70c + fVar297 * fVar293 * fStack_72c;
    fVar190 = fStack_3e8 * fVar328 * fVar318 +
              fVar309 * fVar328 * fStack_708 + fVar328 * fVar314 * fStack_728;
    fVar331 = fStack_3e4 + fVar124 + fStack_724;
    local_a20._0_4_ =
         fVar397 * fVar205 * fVar159 + fVar154 * fVar205 * fVar204 + fVar205 * fVar156 * fVar191;
    local_a20._4_4_ =
         fVar399 * fVar234 * fVar225 + fVar206 * fVar234 * fVar229 + fVar234 * fVar207 * fVar227;
    fStack_a18 = fVar400 * fVar268 * fVar251 +
                 fVar249 * fVar268 * fVar252 + fVar268 * fVar250 * fVar267;
    fStack_a14 = fVar401 * fVar274 * fVar254 +
                 fVar270 * fVar274 * fVar273 + fVar274 * fVar253 * fVar271;
    fStack_a10 = fVar402 * fVar291 * fVar279 +
                 fVar276 * fVar291 * fVar282 + fVar291 * fVar277 * fVar280;
    fStack_a0c = fVar403 * fVar297 * fVar294 +
                 fVar292 * fVar297 * fVar296 + fVar297 * fVar293 * fVar295;
    fStack_a08 = fVar404 * fVar328 * fVar318 +
                 fVar309 * fVar328 * fVar325 + fVar328 * fVar314 * fVar322;
    fStack_a04 = fVar124 + fVar331;
    auVar39._4_4_ = (float)local_a20._4_4_ * fVar183;
    auVar39._0_4_ = (float)local_a20._0_4_ * fVar161;
    auVar39._8_4_ = fStack_a18 * fVar185;
    auVar39._12_4_ = fStack_a14 * fVar187;
    auVar39._16_4_ = fStack_a10 * fVar188;
    auVar39._20_4_ = fStack_a0c * fVar189;
    auVar39._24_4_ = fStack_a08 * fVar190;
    auVar39._28_4_ = fVar331;
    auVar22 = vsubps_avx(auVar343,auVar39);
    auVar40._4_4_ = (float)local_a20._4_4_ * (float)local_a20._4_4_;
    auVar40._0_4_ = (float)local_a20._0_4_ * (float)local_a20._0_4_;
    auVar40._8_4_ = fStack_a18 * fStack_a18;
    auVar40._12_4_ = fStack_a14 * fStack_a14;
    auVar40._16_4_ = fStack_a10 * fStack_a10;
    auVar40._20_4_ = fStack_a0c * fStack_a0c;
    auVar40._24_4_ = fStack_a08 * fStack_a08;
    auVar40._28_4_ = fVar124;
    local_700 = vsubps_avx(auVar357,auVar40);
    _local_540 = vsqrtps_avx(auVar110);
    fVar124 = (local_540._0_4_ + auVar111._0_4_) * 1.0000002;
    fVar331 = (local_540._4_4_ + auVar111._4_4_) * 1.0000002;
    fVar339 = (local_540._8_4_ + auVar111._8_4_) * 1.0000002;
    fVar353 = (local_540._12_4_ + auVar111._12_4_) * 1.0000002;
    fVar121 = (local_540._16_4_ + auVar111._16_4_) * 1.0000002;
    fVar122 = (local_540._20_4_ + auVar111._20_4_) * 1.0000002;
    fVar123 = (local_540._24_4_ + auVar111._24_4_) * 1.0000002;
    auVar41._4_4_ = fVar331 * fVar331;
    auVar41._0_4_ = fVar124 * fVar124;
    auVar41._8_4_ = fVar339 * fVar339;
    auVar41._12_4_ = fVar353 * fVar353;
    auVar41._16_4_ = fVar121 * fVar121;
    auVar41._20_4_ = fVar122 * fVar122;
    auVar41._24_4_ = fVar123 * fVar123;
    auVar41._28_4_ = local_540._28_4_ + auVar111._28_4_;
    fVar331 = auVar22._0_4_ + auVar22._0_4_;
    fVar339 = auVar22._4_4_ + auVar22._4_4_;
    local_940._0_8_ = CONCAT44(fVar339,fVar331);
    local_940._8_4_ = auVar22._8_4_ + auVar22._8_4_;
    local_940._12_4_ = auVar22._12_4_ + auVar22._12_4_;
    local_940._16_4_ = auVar22._16_4_ + auVar22._16_4_;
    local_940._20_4_ = auVar22._20_4_ + auVar22._20_4_;
    local_940._24_4_ = auVar22._24_4_ + auVar22._24_4_;
    local_940._28_4_ = auVar22._28_4_ + auVar22._28_4_;
    auVar111 = vsubps_avx(local_700,auVar41);
    auVar42._4_4_ = fVar183 * fVar183;
    auVar42._0_4_ = fVar161 * fVar161;
    auVar42._8_4_ = fVar185 * fVar185;
    auVar42._12_4_ = fVar187 * fVar187;
    auVar42._16_4_ = fVar188 * fVar188;
    auVar42._20_4_ = fVar189 * fVar189;
    auVar42._24_4_ = fVar190 * fVar190;
    auVar42._28_4_ = auVar343._28_4_;
    auVar22 = vsubps_avx(local_280,auVar42);
    auVar335 = ZEXT3264(auVar22);
    auVar43._4_4_ = fVar339 * fVar339;
    auVar43._0_4_ = fVar331 * fVar331;
    auVar43._8_4_ = local_940._8_4_ * local_940._8_4_;
    auVar43._12_4_ = local_940._12_4_ * local_940._12_4_;
    auVar43._16_4_ = local_940._16_4_ * local_940._16_4_;
    auVar43._20_4_ = local_940._20_4_ * local_940._20_4_;
    auVar43._24_4_ = local_940._24_4_ * local_940._24_4_;
    auVar43._28_4_ = 0x3f800002;
    fVar353 = auVar22._0_4_;
    fVar121 = auVar22._4_4_;
    fVar122 = auVar22._8_4_;
    fVar123 = auVar22._12_4_;
    fVar336 = auVar22._16_4_;
    fVar337 = auVar22._20_4_;
    fVar338 = auVar22._24_4_;
    auVar44._4_4_ = auVar111._4_4_ * fVar121 * 4.0;
    auVar44._0_4_ = auVar111._0_4_ * fVar353 * 4.0;
    auVar44._8_4_ = auVar111._8_4_ * fVar122 * 4.0;
    auVar44._12_4_ = auVar111._12_4_ * fVar123 * 4.0;
    auVar44._16_4_ = auVar111._16_4_ * fVar336 * 4.0;
    auVar44._20_4_ = auVar111._20_4_ * fVar337 * 4.0;
    auVar44._24_4_ = auVar111._24_4_ * fVar338 * 4.0;
    auVar44._28_4_ = 0x40800000;
    auVar23 = vsubps_avx(auVar43,auVar44);
    auVar110 = vcmpps_avx(auVar23,auVar305,5);
    fVar124 = auVar22._28_4_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    {
      auVar220._8_4_ = 0x7f800000;
      auVar220._0_8_ = 0x7f8000007f800000;
      auVar220._12_4_ = 0x7f800000;
      auVar220._16_4_ = 0x7f800000;
      auVar220._20_4_ = 0x7f800000;
      auVar220._24_4_ = 0x7f800000;
      auVar220._28_4_ = 0x7f800000;
      auVar359 = ZEXT3264(CONCAT428(0xff800000,
                                    CONCAT424(0xff800000,
                                              CONCAT420(0xff800000,
                                                        CONCAT416(0xff800000,
                                                                  CONCAT412(0xff800000,
                                                                            CONCAT48(0xff800000,
                                                                                                                                                                          
                                                  0xff800000ff800000)))))));
      auVar199._4_4_ = fStack_71c;
      auVar199._0_4_ = local_720;
      auVar199._8_4_ = fStack_718;
      auVar199._12_4_ = fStack_714;
      auVar199._16_4_ = fStack_710;
      auVar199._20_4_ = fStack_70c;
      auVar199._24_4_ = fStack_708;
      auVar345 = ZEXT3264(CONCAT428(fStack_724,
                                    CONCAT424(fStack_728,
                                              CONCAT420(fStack_72c,
                                                        CONCAT416(fStack_730,
                                                                  CONCAT412(fStack_734,
                                                                            CONCAT48(fStack_738,
                                                                                     CONCAT44(
                                                  fStack_73c,local_740))))))));
    }
    else {
      auVar289 = vsqrtps_avx(auVar23);
      auVar259._0_4_ = fVar353 + fVar353;
      auVar259._4_4_ = fVar121 + fVar121;
      auVar259._8_4_ = fVar122 + fVar122;
      auVar259._12_4_ = fVar123 + fVar123;
      auVar259._16_4_ = fVar336 + fVar336;
      auVar259._20_4_ = fVar337 + fVar337;
      auVar259._24_4_ = fVar338 + fVar338;
      auVar259._28_4_ = fVar124 + fVar124;
      auVar26 = vrcpps_avx(auVar259);
      auVar25 = vcmpps_avx(auVar23,auVar305,5);
      fVar208 = auVar26._0_4_;
      fVar226 = auVar26._4_4_;
      auVar45._4_4_ = auVar259._4_4_ * fVar226;
      auVar45._0_4_ = auVar259._0_4_ * fVar208;
      fVar228 = auVar26._8_4_;
      auVar45._8_4_ = auVar259._8_4_ * fVar228;
      fVar230 = auVar26._12_4_;
      auVar45._12_4_ = auVar259._12_4_ * fVar230;
      fVar231 = auVar26._16_4_;
      auVar45._16_4_ = auVar259._16_4_ * fVar231;
      fVar232 = auVar26._20_4_;
      auVar45._20_4_ = auVar259._20_4_ * fVar232;
      fVar233 = auVar26._24_4_;
      auVar45._24_4_ = auVar259._24_4_ * fVar233;
      auVar45._28_4_ = auVar23._28_4_;
      auVar176._8_4_ = 0x3f800000;
      auVar176._0_8_ = &DAT_3f8000003f800000;
      auVar176._12_4_ = 0x3f800000;
      auVar176._16_4_ = 0x3f800000;
      auVar176._20_4_ = 0x3f800000;
      auVar176._24_4_ = 0x3f800000;
      auVar176._28_4_ = 0x3f800000;
      auVar23 = vsubps_avx(auVar176,auVar45);
      fVar208 = fVar208 + fVar208 * auVar23._0_4_;
      fVar226 = fVar226 + fVar226 * auVar23._4_4_;
      fVar228 = fVar228 + fVar228 * auVar23._8_4_;
      fVar230 = fVar230 + fVar230 * auVar23._12_4_;
      fVar231 = fVar231 + fVar231 * auVar23._16_4_;
      fVar232 = fVar232 + fVar232 * auVar23._20_4_;
      fVar233 = fVar233 + fVar233 * auVar23._24_4_;
      auVar260._0_8_ = CONCAT44(fVar339,fVar331) ^ 0x8000000080000000;
      auVar260._8_4_ = -local_940._8_4_;
      auVar260._12_4_ = -local_940._12_4_;
      auVar260._16_4_ = -local_940._16_4_;
      auVar260._20_4_ = -local_940._20_4_;
      auVar260._24_4_ = -local_940._24_4_;
      auVar260._28_4_ = -local_940._28_4_;
      auVar305 = vsubps_avx(auVar260,auVar289);
      fVar331 = auVar305._0_4_ * fVar208;
      fVar339 = auVar305._4_4_ * fVar226;
      auVar46._4_4_ = fVar339;
      auVar46._0_4_ = fVar331;
      fVar269 = auVar305._8_4_ * fVar228;
      auVar46._8_4_ = fVar269;
      fVar272 = auVar305._12_4_ * fVar230;
      auVar46._12_4_ = fVar272;
      fVar275 = auVar305._16_4_ * fVar231;
      auVar46._16_4_ = fVar275;
      fVar278 = auVar305._20_4_ * fVar232;
      auVar46._20_4_ = fVar278;
      fVar281 = auVar305._24_4_ * fVar233;
      auVar46._24_4_ = fVar281;
      auVar46._28_4_ = auVar305._28_4_;
      auVar305 = vsubps_avx(auVar289,local_940);
      fVar208 = auVar305._0_4_ * fVar208;
      fVar226 = auVar305._4_4_ * fVar226;
      auVar47._4_4_ = fVar226;
      auVar47._0_4_ = fVar208;
      fVar228 = auVar305._8_4_ * fVar228;
      auVar47._8_4_ = fVar228;
      fVar230 = auVar305._12_4_ * fVar230;
      auVar47._12_4_ = fVar230;
      fVar231 = auVar305._16_4_ * fVar231;
      auVar47._16_4_ = fVar231;
      fVar232 = auVar305._20_4_ * fVar232;
      auVar47._20_4_ = fVar232;
      fVar233 = auVar305._24_4_ * fVar233;
      auVar47._24_4_ = fVar233;
      auVar47._28_4_ = auVar305._28_4_;
      fStack_4e4 = fStack_a04 + auVar26._28_4_ + auVar23._28_4_;
      local_500[0] = fVar205 * ((float)local_a20._0_4_ + fVar161 * fVar331);
      local_500[1] = fVar234 * ((float)local_a20._4_4_ + fVar183 * fVar339);
      local_500[2] = fVar268 * (fStack_a18 + fVar185 * fVar269);
      local_500[3] = fVar274 * (fStack_a14 + fVar187 * fVar272);
      fStack_4f0 = fVar291 * (fStack_a10 + fVar188 * fVar275);
      fStack_4ec = fVar297 * (fStack_a0c + fVar189 * fVar278);
      fStack_4e8 = fVar328 * (fStack_a08 + fVar190 * fVar281);
      local_520[0] = fVar205 * ((float)local_a20._0_4_ + fVar161 * fVar208);
      local_520[1] = fVar234 * ((float)local_a20._4_4_ + fVar183 * fVar226);
      local_520[2] = fVar268 * (fStack_a18 + fVar185 * fVar228);
      local_520[3] = fVar274 * (fStack_a14 + fVar187 * fVar230);
      fStack_510 = fVar291 * (fStack_a10 + fVar188 * fVar231);
      fStack_50c = fVar297 * (fStack_a0c + fVar189 * fVar232);
      fStack_508 = fVar328 * (fStack_a08 + fVar190 * fVar233);
      fStack_504 = fStack_a04 + fStack_4e4;
      auVar221._8_4_ = 0x7f800000;
      auVar221._0_8_ = 0x7f8000007f800000;
      auVar221._12_4_ = 0x7f800000;
      auVar221._16_4_ = 0x7f800000;
      auVar221._20_4_ = 0x7f800000;
      auVar221._24_4_ = 0x7f800000;
      auVar221._28_4_ = 0x7f800000;
      auVar220 = vblendvps_avx(auVar221,auVar46,auVar25);
      auVar288._8_4_ = 0x7fffffff;
      auVar288._0_8_ = 0x7fffffff7fffffff;
      auVar288._12_4_ = 0x7fffffff;
      auVar288._16_4_ = 0x7fffffff;
      auVar288._20_4_ = 0x7fffffff;
      auVar288._24_4_ = 0x7fffffff;
      auVar288._28_4_ = 0x7fffffff;
      auVar23 = vandps_avx(auVar42,auVar288);
      auVar23 = vmaxps_avx(local_440,auVar23);
      auVar48._4_4_ = auVar23._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar23._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar23._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar23._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar23._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar23._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar23._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar23._28_4_;
      auVar23 = vandps_avx(auVar22,auVar288);
      auVar26 = vcmpps_avx(auVar23,auVar48,1);
      auVar261._8_4_ = 0xff800000;
      auVar261._0_8_ = 0xff800000ff800000;
      auVar261._12_4_ = 0xff800000;
      auVar261._16_4_ = 0xff800000;
      auVar261._20_4_ = 0xff800000;
      auVar261._24_4_ = 0xff800000;
      auVar261._28_4_ = 0xff800000;
      auVar23 = vblendvps_avx(auVar261,auVar47,auVar25);
      auVar359 = ZEXT3264(auVar23);
      auVar305 = auVar25 & auVar26;
      if ((((((((auVar305 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar305 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar305 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar305 >> 0x7f,0) == '\0') &&
            (auVar305 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar305 >> 0xbf,0) == '\0') &&
          (auVar305 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar305[0x1f]) {
        auVar199._4_4_ = fStack_71c;
        auVar199._0_4_ = local_720;
        auVar199._8_4_ = fStack_718;
        auVar199._12_4_ = fStack_714;
        auVar199._16_4_ = fStack_710;
        auVar199._20_4_ = fStack_70c;
        auVar199._24_4_ = fStack_708;
        auVar345 = ZEXT3264(CONCAT428(fStack_724,
                                      CONCAT424(fStack_728,
                                                CONCAT420(fStack_72c,
                                                          CONCAT416(fStack_730,
                                                                    CONCAT412(fStack_734,
                                                                              CONCAT48(fStack_738,
                                                                                       CONCAT44(
                                                  fStack_73c,local_740))))))));
      }
      else {
        auVar110 = vandps_avx(auVar26,auVar25);
        auVar103 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar26 = vcmpps_avx(auVar111,ZEXT832(0) << 0x20,2);
        auVar389._8_4_ = 0xff800000;
        auVar389._0_8_ = 0xff800000ff800000;
        auVar389._12_4_ = 0xff800000;
        auVar389._16_4_ = 0xff800000;
        auVar389._20_4_ = 0xff800000;
        auVar389._24_4_ = 0xff800000;
        auVar389._28_4_ = 0xff800000;
        auVar307._8_4_ = 0x7f800000;
        auVar307._0_8_ = 0x7f8000007f800000;
        auVar307._12_4_ = 0x7f800000;
        auVar307._16_4_ = 0x7f800000;
        auVar307._20_4_ = 0x7f800000;
        auVar307._24_4_ = 0x7f800000;
        auVar307._28_4_ = 0x7f800000;
        auVar111 = vblendvps_avx(auVar307,auVar389,auVar26);
        auVar171 = vpmovsxwd_avx(auVar103);
        auVar103 = vpunpckhwd_avx(auVar103,auVar103);
        auVar247._16_16_ = auVar103;
        auVar247._0_16_ = auVar171;
        auVar220 = vblendvps_avx(auVar220,auVar111,auVar247);
        auVar111 = vblendvps_avx(auVar389,auVar307,auVar26);
        auVar111 = vblendvps_avx(auVar23,auVar111,auVar247);
        auVar359 = ZEXT3264(auVar111);
        auVar111 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar119._0_4_ = auVar110._0_4_ ^ auVar111._0_4_;
        auVar119._4_4_ = auVar110._4_4_ ^ auVar111._4_4_;
        auVar119._8_4_ = auVar110._8_4_ ^ auVar111._8_4_;
        auVar119._12_4_ = auVar110._12_4_ ^ auVar111._12_4_;
        auVar119._16_4_ = auVar110._16_4_ ^ auVar111._16_4_;
        auVar119._20_4_ = auVar110._20_4_ ^ auVar111._20_4_;
        auVar119._24_4_ = auVar110._24_4_ ^ auVar111._24_4_;
        auVar119._28_4_ = auVar110._28_4_ ^ auVar111._28_4_;
        auVar110 = vorps_avx(auVar26,auVar119);
        auVar110 = vandps_avx(auVar25,auVar110);
        auVar199._4_4_ = fStack_71c;
        auVar199._0_4_ = local_720;
        auVar199._8_4_ = fStack_718;
        auVar199._12_4_ = fStack_714;
        auVar199._16_4_ = fStack_710;
        auVar199._20_4_ = fStack_70c;
        auVar199._24_4_ = fStack_708;
        auVar345 = ZEXT3264(CONCAT428(fStack_724,
                                      CONCAT424(fStack_728,
                                                CONCAT420(fStack_72c,
                                                          CONCAT416(fStack_730,
                                                                    CONCAT412(fStack_734,
                                                                              CONCAT48(fStack_738,
                                                                                       CONCAT44(
                                                  fStack_73c,local_740))))))));
      }
    }
    auVar266 = ZEXT3264(local_940);
    auVar248 = ZEXT3264(local_420);
    auVar111 = local_420 & auVar110;
    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar111 >> 0x7f,0) == '\0') &&
          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar111 >> 0xbf,0) == '\0') &&
        (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar111[0x1f])
    {
LAB_0100a113:
      auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
    }
    else {
      auVar103 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_790._0_4_));
      auVar103 = vshufps_avx(auVar103,auVar103,0);
      auVar239._16_16_ = auVar103;
      auVar239._0_16_ = auVar103;
      auVar25 = vmaxps_avx(auVar239,auVar220);
      auVar103 = ZEXT416((uint)(ray->tfar - (float)local_790._0_4_));
      auVar103 = vshufps_avx(auVar103,auVar103,0);
      auVar240._16_16_ = auVar103;
      auVar240._0_16_ = auVar103;
      auVar26 = vminps_avx(auVar240,auVar359._0_32_);
      fVar231 = auVar24._28_4_;
      fVar232 = auVar345._0_4_;
      fVar233 = auVar345._4_4_;
      fVar269 = auVar345._8_4_;
      fVar272 = auVar345._12_4_;
      fVar275 = auVar345._16_4_;
      fVar278 = auVar345._20_4_;
      fVar281 = auVar345._24_4_;
      auVar177._0_4_ = local_400 * fVar299 + auVar199._0_4_ * fVar354 + fVar232 * fVar366;
      auVar177._4_4_ = fStack_3fc * fVar311 + auVar199._4_4_ * fVar360 + fVar233 * fVar373;
      auVar177._8_4_ = fStack_3f8 * fVar316 + auVar199._8_4_ * fVar361 + fVar269 * fVar375;
      auVar177._12_4_ = fStack_3f4 * fVar320 + auVar199._12_4_ * fVar362 + fVar272 * fVar377;
      auVar177._16_4_ = fStack_3f0 * fVar323 + auVar199._16_4_ * fVar363 + fVar275 * fVar379;
      auVar177._20_4_ = fStack_3ec * fVar326 + auVar199._20_4_ * fVar364 + fVar278 * fVar381;
      auVar177._24_4_ = fStack_3e8 * fVar329 + auVar199._24_4_ * fVar365 + fVar281 * fVar383;
      auVar177._28_4_ = fVar340 + fStack_1a4 + fVar231;
      auVar111 = vrcpps_avx(auVar177);
      fVar331 = auVar111._0_4_;
      fVar339 = auVar111._4_4_;
      auVar49._4_4_ = auVar177._4_4_ * fVar339;
      auVar49._0_4_ = auVar177._0_4_ * fVar331;
      fVar340 = auVar111._8_4_;
      auVar49._8_4_ = auVar177._8_4_ * fVar340;
      fVar208 = auVar111._12_4_;
      auVar49._12_4_ = auVar177._12_4_ * fVar208;
      fVar226 = auVar111._16_4_;
      auVar49._16_4_ = auVar177._16_4_ * fVar226;
      fVar228 = auVar111._20_4_;
      auVar49._20_4_ = auVar177._20_4_ * fVar228;
      fVar230 = auVar111._24_4_;
      auVar49._24_4_ = auVar177._24_4_ * fVar230;
      auVar49._28_4_ = fStack_1a4;
      auVar358._8_4_ = 0x3f800000;
      auVar358._0_8_ = &DAT_3f8000003f800000;
      auVar358._12_4_ = 0x3f800000;
      auVar358._16_4_ = 0x3f800000;
      auVar358._20_4_ = 0x3f800000;
      auVar358._24_4_ = 0x3f800000;
      auVar358._28_4_ = 0x3f800000;
      auVar23 = vsubps_avx(auVar358,auVar49);
      auVar334._8_4_ = 0x7fffffff;
      auVar334._0_8_ = 0x7fffffff7fffffff;
      auVar334._12_4_ = 0x7fffffff;
      auVar334._16_4_ = 0x7fffffff;
      auVar334._20_4_ = 0x7fffffff;
      auVar334._24_4_ = 0x7fffffff;
      auVar334._28_4_ = 0x7fffffff;
      auVar111 = vandps_avx(auVar334,auVar177);
      auVar388._8_4_ = 0x219392ef;
      auVar388._0_8_ = 0x219392ef219392ef;
      auVar388._12_4_ = 0x219392ef;
      auVar388._16_4_ = 0x219392ef;
      auVar388._20_4_ = 0x219392ef;
      auVar388._24_4_ = 0x219392ef;
      auVar388._28_4_ = 0x219392ef;
      auVar111 = vcmpps_avx(auVar111,auVar388,1);
      auVar345 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar50._4_4_ =
           (fVar339 + fVar339 * auVar23._4_4_) *
           -(fVar399 * fVar311 + fVar360 * fVar229 + fVar373 * fVar227);
      auVar50._0_4_ =
           (fVar331 + fVar331 * auVar23._0_4_) *
           -(fVar397 * fVar299 + fVar354 * fVar204 + fVar366 * fVar191);
      auVar50._8_4_ =
           (fVar340 + fVar340 * auVar23._8_4_) *
           -(fVar400 * fVar316 + fVar361 * fVar252 + fVar375 * fVar267);
      auVar50._12_4_ =
           (fVar208 + fVar208 * auVar23._12_4_) *
           -(fVar401 * fVar320 + fVar362 * fVar273 + fVar377 * fVar271);
      auVar50._16_4_ =
           (fVar226 + fVar226 * auVar23._16_4_) *
           -(fVar402 * fVar323 + fVar363 * fVar282 + fVar379 * fVar280);
      auVar50._20_4_ =
           (fVar228 + fVar228 * auVar23._20_4_) *
           -(fVar403 * fVar326 + fVar364 * fVar296 + fVar381 * fVar295);
      auVar50._24_4_ =
           (fVar230 + fVar230 * auVar23._24_4_) *
           -(fVar404 * fVar329 + fVar365 * fVar325 + fVar383 * fVar322);
      auVar50._28_4_ = -(fVar231 + auVar139._28_4_ + fVar231);
      auVar23 = vcmpps_avx(auVar177,ZEXT832(0) << 0x20,1);
      auVar139 = vorps_avx(auVar111,auVar23);
      auVar23 = vcmpps_avx(auVar177,ZEXT832(0) << 0x20,6);
      auVar23 = vorps_avx(auVar111,auVar23);
      auVar350._8_4_ = 0xff800000;
      auVar350._0_8_ = 0xff800000ff800000;
      auVar350._12_4_ = 0xff800000;
      auVar350._16_4_ = 0xff800000;
      auVar350._20_4_ = 0xff800000;
      auVar350._24_4_ = 0xff800000;
      auVar350._28_4_ = 0xff800000;
      auVar352 = ZEXT3264(auVar350);
      auVar111 = vblendvps_avx(auVar50,auVar350,auVar139);
      auVar370._8_4_ = 0x7f800000;
      auVar370._0_8_ = 0x7f8000007f800000;
      auVar370._12_4_ = 0x7f800000;
      auVar370._16_4_ = 0x7f800000;
      auVar370._20_4_ = 0x7f800000;
      auVar370._24_4_ = 0x7f800000;
      auVar370._28_4_ = 0x7f800000;
      auVar23 = vblendvps_avx(auVar50,auVar370,auVar23);
      auVar139 = vmaxps_avx(auVar25,auVar111);
      auVar24 = vminps_avx(auVar26,auVar23);
      auVar335 = ZEXT3264(auVar24);
      auVar289 = ZEXT832(0) << 0x20;
      auVar111 = vsubps_avx(auVar289,local_920);
      auVar23 = vsubps_avx(auVar289,_local_880);
      auVar51._4_4_ = auVar23._4_4_ * -fVar374;
      auVar51._0_4_ = auVar23._0_4_ * -fVar367;
      auVar51._8_4_ = auVar23._8_4_ * -fVar376;
      auVar51._12_4_ = auVar23._12_4_ * -fVar378;
      auVar51._16_4_ = auVar23._16_4_ * -fVar380;
      auVar51._20_4_ = auVar23._20_4_ * -fVar382;
      auVar51._24_4_ = auVar23._24_4_ * -fVar384;
      auVar51._28_4_ = auVar23._28_4_;
      auVar52._4_4_ = fVar391 * auVar111._4_4_;
      auVar52._0_4_ = fVar386 * auVar111._0_4_;
      auVar52._8_4_ = fVar392 * auVar111._8_4_;
      auVar52._12_4_ = fVar393 * auVar111._12_4_;
      auVar52._16_4_ = fVar394 * auVar111._16_4_;
      auVar52._20_4_ = fVar395 * auVar111._20_4_;
      auVar52._24_4_ = fVar396 * auVar111._24_4_;
      auVar52._28_4_ = auVar111._28_4_;
      auVar111 = vsubps_avx(auVar51,auVar52);
      auVar23 = vsubps_avx(auVar289,auVar371);
      auVar53._4_4_ = fVar312 * auVar23._4_4_;
      auVar53._0_4_ = fVar300 * auVar23._0_4_;
      auVar53._8_4_ = fVar317 * auVar23._8_4_;
      auVar53._12_4_ = fVar321 * auVar23._12_4_;
      auVar53._16_4_ = fVar324 * auVar23._16_4_;
      auVar53._20_4_ = fVar327 * auVar23._20_4_;
      uVar313 = auVar23._28_4_;
      auVar53._24_4_ = fVar330 * auVar23._24_4_;
      auVar53._28_4_ = uVar313;
      auVar25 = vsubps_avx(auVar111,auVar53);
      auVar54._4_4_ = fVar233 * -fVar374;
      auVar54._0_4_ = fVar232 * -fVar367;
      auVar54._8_4_ = fVar269 * -fVar376;
      auVar54._12_4_ = fVar272 * -fVar378;
      auVar54._16_4_ = fVar275 * -fVar380;
      auVar54._20_4_ = fVar278 * -fVar382;
      auVar54._24_4_ = fVar281 * -fVar384;
      auVar54._28_4_ = uVar85 ^ 0x80000000;
      auVar55._4_4_ = auVar199._4_4_ * fVar391;
      auVar55._0_4_ = auVar199._0_4_ * fVar386;
      auVar55._8_4_ = auVar199._8_4_ * fVar392;
      auVar55._12_4_ = auVar199._12_4_ * fVar393;
      auVar55._16_4_ = auVar199._16_4_ * fVar394;
      auVar55._20_4_ = auVar199._20_4_ * fVar395;
      auVar55._24_4_ = auVar199._24_4_ * fVar396;
      auVar55._28_4_ = uVar313;
      auVar111 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fStack_3fc * fVar312;
      auVar56._0_4_ = local_400 * fVar300;
      auVar56._8_4_ = fStack_3f8 * fVar317;
      auVar56._12_4_ = fStack_3f4 * fVar321;
      auVar56._16_4_ = fStack_3f0 * fVar324;
      auVar56._20_4_ = fStack_3ec * fVar327;
      auVar56._24_4_ = fStack_3e8 * fVar330;
      auVar56._28_4_ = uVar313;
      auVar26 = vsubps_avx(auVar111,auVar56);
      auVar111 = vrcpps_avx(auVar26);
      fVar191 = auVar111._0_4_;
      fVar204 = auVar111._4_4_;
      auVar57._4_4_ = auVar26._4_4_ * fVar204;
      auVar57._0_4_ = auVar26._0_4_ * fVar191;
      fVar227 = auVar111._8_4_;
      auVar57._8_4_ = auVar26._8_4_ * fVar227;
      fVar229 = auVar111._12_4_;
      auVar57._12_4_ = auVar26._12_4_ * fVar229;
      fVar267 = auVar111._16_4_;
      auVar57._16_4_ = auVar26._16_4_ * fVar267;
      fVar252 = auVar111._20_4_;
      auVar57._20_4_ = auVar26._20_4_ * fVar252;
      fVar271 = auVar111._24_4_;
      auVar57._24_4_ = auVar26._24_4_ * fVar271;
      auVar57._28_4_ = local_860._28_4_;
      auVar112._8_4_ = 0x3f800000;
      auVar112._0_8_ = &DAT_3f8000003f800000;
      auVar112._12_4_ = 0x3f800000;
      auVar112._16_4_ = 0x3f800000;
      auVar112._20_4_ = 0x3f800000;
      auVar112._24_4_ = 0x3f800000;
      auVar112._28_4_ = 0x3f800000;
      auVar359 = ZEXT3264(auVar112);
      auVar305 = vsubps_avx(auVar112,auVar57);
      auVar113._8_4_ = 0x7fffffff;
      auVar113._0_8_ = 0x7fffffff7fffffff;
      auVar113._12_4_ = 0x7fffffff;
      auVar113._16_4_ = 0x7fffffff;
      auVar113._20_4_ = 0x7fffffff;
      auVar113._24_4_ = 0x7fffffff;
      auVar113._28_4_ = 0x7fffffff;
      auVar111 = vandps_avx(auVar26,auVar113);
      auVar23 = vcmpps_avx(auVar111,auVar388,1);
      auVar266 = ZEXT3264(auVar23);
      auVar58._4_4_ = (fVar204 + fVar204 * auVar305._4_4_) * -auVar25._4_4_;
      auVar58._0_4_ = (fVar191 + fVar191 * auVar305._0_4_) * -auVar25._0_4_;
      auVar58._8_4_ = (fVar227 + fVar227 * auVar305._8_4_) * -auVar25._8_4_;
      auVar58._12_4_ = (fVar229 + fVar229 * auVar305._12_4_) * -auVar25._12_4_;
      auVar58._16_4_ = (fVar267 + fVar267 * auVar305._16_4_) * -auVar25._16_4_;
      auVar58._20_4_ = (fVar252 + fVar252 * auVar305._20_4_) * -auVar25._20_4_;
      auVar58._24_4_ = (fVar271 + fVar271 * auVar305._24_4_) * -auVar25._24_4_;
      auVar58._28_4_ = auVar25._28_4_ ^ 0x80000000;
      auVar111 = vcmpps_avx(auVar26,auVar289,1);
      auVar111 = vorps_avx(auVar23,auVar111);
      auVar111 = vblendvps_avx(auVar58,auVar350,auVar111);
      _local_840 = vmaxps_avx(auVar139,auVar111);
      auVar248 = ZEXT864(0) << 0x20;
      auVar111 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,6);
      auVar111 = vorps_avx(auVar23,auVar111);
      auVar111 = vblendvps_avx(auVar58,auVar370,auVar111);
      auVar110 = vandps_avx(auVar110,local_420);
      local_4a0 = vminps_avx(auVar24,auVar111);
      auVar111 = vcmpps_avx(_local_840,local_4a0,2);
      auVar23 = auVar110 & auVar111;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0x7f,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0xbf,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f])
      goto LAB_0100a113;
      auVar23 = vminps_avx(_local_ac0,_local_6e0);
      auVar139 = vminps_avx(local_6a0,local_6c0);
      auVar23 = vminps_avx(auVar23,auVar139);
      auVar23 = vsubps_avx(auVar23,_local_540);
      auVar110 = vandps_avx(auVar111,auVar110);
      auVar84._4_4_ = local_500[1];
      auVar84._0_4_ = local_500[0];
      auVar84._8_4_ = local_500[2];
      auVar84._12_4_ = local_500[3];
      auVar84._16_4_ = fStack_4f0;
      auVar84._20_4_ = fStack_4ec;
      auVar84._24_4_ = fStack_4e8;
      auVar84._28_4_ = fStack_4e4;
      auVar111 = vminps_avx(auVar84,auVar112);
      auVar111 = vmaxps_avx(auVar111,ZEXT832(0) << 0x20);
      local_500[0] = fVar160 + fVar385 * (auVar111._0_4_ + 0.0) * 0.125;
      local_500[1] = fVar182 + fVar153 * (auVar111._4_4_ + 1.0) * 0.125;
      local_500[2] = fVar184 + fVar155 * (auVar111._8_4_ + 2.0) * 0.125;
      local_500[3] = fVar186 + fVar158 * (auVar111._12_4_ + 3.0) * 0.125;
      fStack_4f0 = fVar160 + fVar385 * (auVar111._16_4_ + 4.0) * 0.125;
      fStack_4ec = fVar182 + fVar153 * (auVar111._20_4_ + 5.0) * 0.125;
      fStack_4e8 = fVar184 + fVar155 * (auVar111._24_4_ + 6.0) * 0.125;
      fStack_4e4 = fVar186 + auVar111._28_4_ + 7.0;
      auVar83._4_4_ = local_520[1];
      auVar83._0_4_ = local_520[0];
      auVar83._8_4_ = local_520[2];
      auVar83._12_4_ = local_520[3];
      auVar83._16_4_ = fStack_510;
      auVar83._20_4_ = fStack_50c;
      auVar83._24_4_ = fStack_508;
      auVar83._28_4_ = fStack_504;
      auVar111 = vminps_avx(auVar83,auVar112);
      auVar111 = vmaxps_avx(auVar111,ZEXT832(0) << 0x20);
      local_520[0] = fVar160 + fVar385 * (auVar111._0_4_ + 0.0) * 0.125;
      local_520[1] = fVar182 + fVar153 * (auVar111._4_4_ + 1.0) * 0.125;
      local_520[2] = fVar184 + fVar155 * (auVar111._8_4_ + 2.0) * 0.125;
      local_520[3] = fVar186 + fVar158 * (auVar111._12_4_ + 3.0) * 0.125;
      fStack_510 = fVar160 + fVar385 * (auVar111._16_4_ + 4.0) * 0.125;
      fStack_50c = fVar182 + fVar153 * (auVar111._20_4_ + 5.0) * 0.125;
      fStack_508 = fVar184 + fVar155 * (auVar111._24_4_ + 6.0) * 0.125;
      fStack_504 = fVar186 + auVar111._28_4_ + 7.0;
      auVar59._4_4_ = auVar23._4_4_ * 0.99999976;
      auVar59._0_4_ = auVar23._0_4_ * 0.99999976;
      auVar59._8_4_ = auVar23._8_4_ * 0.99999976;
      auVar59._12_4_ = auVar23._12_4_ * 0.99999976;
      auVar59._16_4_ = auVar23._16_4_ * 0.99999976;
      auVar59._20_4_ = auVar23._20_4_ * 0.99999976;
      auVar59._24_4_ = auVar23._24_4_ * 0.99999976;
      auVar59._28_4_ = 0x3f7ffffc;
      auVar111 = vmaxps_avx(ZEXT832(0) << 0x20,auVar59);
      auVar60._4_4_ = auVar111._4_4_ * auVar111._4_4_;
      auVar60._0_4_ = auVar111._0_4_ * auVar111._0_4_;
      auVar60._8_4_ = auVar111._8_4_ * auVar111._8_4_;
      auVar60._12_4_ = auVar111._12_4_ * auVar111._12_4_;
      auVar60._16_4_ = auVar111._16_4_ * auVar111._16_4_;
      auVar60._20_4_ = auVar111._20_4_ * auVar111._20_4_;
      auVar60._24_4_ = auVar111._24_4_ * auVar111._24_4_;
      auVar60._28_4_ = auVar111._28_4_;
      local_a40 = vsubps_avx(local_700,auVar60);
      auVar61._4_4_ = local_a40._4_4_ * fVar121 * 4.0;
      auVar61._0_4_ = local_a40._0_4_ * fVar353 * 4.0;
      auVar61._8_4_ = local_a40._8_4_ * fVar122 * 4.0;
      auVar61._12_4_ = local_a40._12_4_ * fVar123 * 4.0;
      auVar61._16_4_ = local_a40._16_4_ * fVar336 * 4.0;
      auVar61._20_4_ = local_a40._20_4_ * fVar337 * 4.0;
      auVar61._24_4_ = local_a40._24_4_ * fVar338 * 4.0;
      auVar61._28_4_ = auVar111._28_4_;
      auVar23 = vsubps_avx(auVar43,auVar61);
      local_7c0 = vcmpps_avx(auVar23,ZEXT832(0) << 0x20,5);
      auVar111 = local_7c0;
      if ((((((((local_7c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_7c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_7c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_7c0 >> 0x7f,0) == '\0') &&
            (local_7c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_7c0 >> 0xbf,0) == '\0') &&
          (local_7c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_7c0[0x1f]) {
        auVar139 = SUB6432(ZEXT864(0),0) << 0x20;
        _local_640 = ZEXT832(0) << 0x20;
        _local_600 = ZEXT832(0) << 0x20;
        auVar199 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar335 = ZEXT864(0) << 0x20;
        auVar222._8_4_ = 0x7f800000;
        auVar222._0_8_ = 0x7f8000007f800000;
        auVar222._12_4_ = 0x7f800000;
        auVar222._16_4_ = 0x7f800000;
        auVar222._20_4_ = 0x7f800000;
        auVar222._24_4_ = 0x7f800000;
        auVar222._28_4_ = 0x7f800000;
        auVar241._8_4_ = 0xff800000;
        auVar241._0_8_ = 0xff800000ff800000;
        auVar241._12_4_ = 0xff800000;
        auVar241._16_4_ = 0xff800000;
        auVar241._20_4_ = 0xff800000;
        auVar241._24_4_ = 0xff800000;
        auVar241._28_4_ = 0xff800000;
        auVar344 = local_800;
        local_a40 = auVar371;
        local_7c0 = auVar27;
        _local_620 = _local_640;
      }
      else {
        auVar139 = vsqrtps_avx(auVar23);
        auVar201._0_4_ = fVar353 + fVar353;
        auVar201._4_4_ = fVar121 + fVar121;
        auVar201._8_4_ = fVar122 + fVar122;
        auVar201._12_4_ = fVar123 + fVar123;
        auVar201._16_4_ = fVar336 + fVar336;
        auVar201._20_4_ = fVar337 + fVar337;
        auVar201._24_4_ = fVar338 + fVar338;
        auVar201._28_4_ = fVar124 + fVar124;
        auVar371 = vrcpps_avx(auVar201);
        fVar124 = auVar371._0_4_;
        fVar191 = auVar371._4_4_;
        auVar62._4_4_ = auVar201._4_4_ * fVar191;
        auVar62._0_4_ = auVar201._0_4_ * fVar124;
        fVar204 = auVar371._8_4_;
        auVar62._8_4_ = auVar201._8_4_ * fVar204;
        fVar227 = auVar371._12_4_;
        auVar62._12_4_ = auVar201._12_4_ * fVar227;
        fVar229 = auVar371._16_4_;
        auVar62._16_4_ = auVar201._16_4_ * fVar229;
        fVar267 = auVar371._20_4_;
        auVar62._20_4_ = auVar201._20_4_ * fVar267;
        fVar252 = auVar371._24_4_;
        auVar62._24_4_ = auVar201._24_4_ * fVar252;
        auVar62._28_4_ = auVar201._28_4_;
        auVar24 = vsubps_avx(auVar112,auVar62);
        fVar124 = fVar124 + fVar124 * auVar24._0_4_;
        fVar191 = fVar191 + fVar191 * auVar24._4_4_;
        fVar204 = fVar204 + fVar204 * auVar24._8_4_;
        fVar227 = fVar227 + fVar227 * auVar24._12_4_;
        fVar229 = fVar229 + fVar229 * auVar24._16_4_;
        fVar267 = fVar267 + fVar267 * auVar24._20_4_;
        fVar252 = fVar252 + fVar252 * auVar24._24_4_;
        fVar271 = auVar371._28_4_ + auVar24._28_4_;
        auVar242._0_8_ = local_940._0_8_ ^ 0x8000000080000000;
        auVar242._8_4_ = -local_940._8_4_;
        auVar242._12_4_ = -local_940._12_4_;
        auVar242._16_4_ = -local_940._16_4_;
        auVar242._20_4_ = -local_940._20_4_;
        auVar242._24_4_ = -local_940._24_4_;
        auVar242._28_4_ = -local_940._28_4_;
        auVar371 = vsubps_avx(auVar242,auVar139);
        fVar331 = auVar371._0_4_ * fVar124;
        fVar339 = auVar371._4_4_ * fVar191;
        auVar63._4_4_ = fVar339;
        auVar63._0_4_ = fVar331;
        fVar353 = auVar371._8_4_ * fVar204;
        auVar63._8_4_ = fVar353;
        fVar121 = auVar371._12_4_ * fVar227;
        auVar63._12_4_ = fVar121;
        fVar122 = auVar371._16_4_ * fVar229;
        auVar63._16_4_ = fVar122;
        fVar123 = auVar371._20_4_ * fVar267;
        auVar63._20_4_ = fVar123;
        fVar385 = auVar371._24_4_ * fVar252;
        auVar63._24_4_ = fVar385;
        auVar63._28_4_ = 0x7f800000;
        auVar139 = vsubps_avx(auVar139,local_940);
        fVar124 = auVar139._0_4_ * fVar124;
        fVar191 = auVar139._4_4_ * fVar191;
        auVar64._4_4_ = fVar191;
        auVar64._0_4_ = fVar124;
        fVar204 = auVar139._8_4_ * fVar204;
        auVar64._8_4_ = fVar204;
        fVar227 = auVar139._12_4_ * fVar227;
        auVar64._12_4_ = fVar227;
        fVar229 = auVar139._16_4_ * fVar229;
        auVar64._16_4_ = fVar229;
        fVar267 = auVar139._20_4_ * fVar267;
        auVar64._20_4_ = fVar267;
        fVar252 = auVar139._24_4_ * fVar252;
        auVar64._24_4_ = fVar252;
        auVar64._28_4_ = 0x3f800000;
        auVar359 = ZEXT3264(auVar64);
        fVar273 = fVar205 * (fVar331 * fVar161 + (float)local_a20._0_4_);
        fVar280 = fVar234 * (fVar339 * fVar183 + (float)local_a20._4_4_);
        fVar282 = fVar268 * (fVar353 * fVar185 + fStack_a18);
        fVar295 = fVar274 * (fVar121 * fVar187 + fStack_a14);
        fVar296 = fVar291 * (fVar122 * fVar188 + fStack_a10);
        fVar322 = fVar297 * (fVar123 * fVar189 + fStack_a0c);
        fVar325 = fVar328 * (fVar385 * fVar190 + fStack_a08);
        auVar140._0_4_ = local_900 + fVar159 * fVar273;
        auVar140._4_4_ = fStack_8fc + fVar225 * fVar280;
        auVar140._8_4_ = fStack_8f8 + fVar251 * fVar282;
        auVar140._12_4_ = fStack_8f4 + fVar254 * fVar295;
        auVar140._16_4_ = fStack_8f0 + fVar279 * fVar296;
        auVar140._20_4_ = fStack_8ec + fVar294 * fVar322;
        auVar140._24_4_ = fStack_8e8 + fVar318 * fVar325;
        auVar140._28_4_ = fStack_8e4 + auVar139._28_4_ + fStack_a04;
        auVar65._4_4_ = fStack_3fc * fVar339;
        auVar65._0_4_ = local_400 * fVar331;
        auVar65._8_4_ = fStack_3f8 * fVar353;
        auVar65._12_4_ = fStack_3f4 * fVar121;
        auVar65._16_4_ = fStack_3f0 * fVar122;
        auVar65._20_4_ = fStack_3ec * fVar123;
        auVar65._24_4_ = fStack_3e8 * fVar385;
        auVar65._28_4_ = fVar271;
        auVar139 = vsubps_avx(auVar65,auVar140);
        auVar202._0_4_ = fVar298 + fVar154 * fVar273;
        auVar202._4_4_ = fVar310 + fVar206 * fVar280;
        auVar202._8_4_ = fVar315 + fVar249 * fVar282;
        auVar202._12_4_ = fVar319 + fVar270 * fVar295;
        auVar202._16_4_ = fStack_a90 + fVar276 * fVar296;
        auVar202._20_4_ = fStack_a8c + fVar292 * fVar322;
        auVar202._24_4_ = fStack_a88 + fVar309 * fVar325;
        auVar202._28_4_ = fStack_a84 + fVar271;
        auVar262._0_4_ = local_720 * fVar331;
        auVar262._4_4_ = fStack_71c * fVar339;
        auVar262._8_4_ = fStack_718 * fVar353;
        auVar262._12_4_ = fStack_714 * fVar121;
        auVar262._16_4_ = fStack_710 * fVar122;
        auVar262._20_4_ = fStack_70c * fVar123;
        auVar262._24_4_ = fStack_708 * fVar385;
        auVar262._28_4_ = 0;
        _local_880 = vsubps_avx(auVar262,auVar202);
        auVar243._0_4_ = local_a60 + fVar156 * fVar273;
        auVar243._4_4_ = fStack_a5c + fVar207 * fVar280;
        auVar243._8_4_ = fStack_a58 + fVar250 * fVar282;
        auVar243._12_4_ = fStack_a54 + fVar253 * fVar295;
        auVar243._16_4_ = fStack_a50 + fVar277 * fVar296;
        auVar243._20_4_ = fStack_a4c + fVar293 * fVar322;
        auVar243._24_4_ = fStack_a48 + fVar314 * fVar325;
        auVar243._28_4_ = fStack_a44 + auVar371._28_4_;
        auVar66._4_4_ = fStack_73c * fVar339;
        auVar66._0_4_ = local_740 * fVar331;
        auVar66._8_4_ = fStack_738 * fVar353;
        auVar66._12_4_ = fStack_734 * fVar121;
        auVar66._16_4_ = fStack_730 * fVar122;
        auVar66._20_4_ = fStack_72c * fVar123;
        auVar66._24_4_ = fStack_728 * fVar385;
        auVar66._28_4_ = 0;
        local_a00 = vsubps_avx(auVar66,auVar243);
        fVar205 = fVar205 * (fVar124 * fVar161 + (float)local_a20._0_4_);
        fVar234 = fVar234 * (fVar191 * fVar183 + (float)local_a20._4_4_);
        fVar268 = fVar268 * (fVar204 * fVar185 + fStack_a18);
        fVar274 = fVar274 * (fVar227 * fVar187 + fStack_a14);
        fVar291 = fVar291 * (fVar229 * fVar188 + fStack_a10);
        fVar297 = fVar297 * (fVar267 * fVar189 + fStack_a0c);
        fVar328 = fVar328 * (fVar252 * fVar190 + fStack_a08);
        auVar263._0_4_ = local_900 + fVar159 * fVar205;
        auVar263._4_4_ = fStack_8fc + fVar225 * fVar234;
        auVar263._8_4_ = fStack_8f8 + fVar251 * fVar268;
        auVar263._12_4_ = fStack_8f4 + fVar254 * fVar274;
        auVar263._16_4_ = fStack_8f0 + fVar279 * fVar291;
        auVar263._20_4_ = fStack_8ec + fVar294 * fVar297;
        auVar263._24_4_ = fStack_8e8 + fVar318 * fVar328;
        auVar263._28_4_ = fStack_8e4 + 0.0;
        auVar67._4_4_ = fStack_3fc * fVar191;
        auVar67._0_4_ = local_400 * fVar124;
        auVar67._8_4_ = fStack_3f8 * fVar204;
        auVar67._12_4_ = fStack_3f4 * fVar227;
        auVar67._16_4_ = fStack_3f0 * fVar229;
        auVar67._20_4_ = fStack_3ec * fVar267;
        auVar67._24_4_ = fStack_3e8 * fVar252;
        auVar67._28_4_ = fStack_8e4;
        _local_640 = vsubps_avx(auVar67,auVar263);
        auVar264._0_4_ = fVar298 + fVar154 * fVar205;
        auVar264._4_4_ = fVar310 + fVar206 * fVar234;
        auVar264._8_4_ = fVar315 + fVar249 * fVar268;
        auVar264._12_4_ = fVar319 + fVar270 * fVar274;
        auVar264._16_4_ = fStack_a90 + fVar276 * fVar291;
        auVar264._20_4_ = fStack_a8c + fVar292 * fVar297;
        auVar264._24_4_ = fStack_a88 + fVar309 * fVar328;
        auVar264._28_4_ = fStack_a84 + local_640._28_4_;
        auVar68._4_4_ = fStack_71c * fVar191;
        auVar68._0_4_ = local_720 * fVar124;
        auVar68._8_4_ = fStack_718 * fVar204;
        auVar68._12_4_ = fStack_714 * fVar227;
        auVar68._16_4_ = fStack_710 * fVar229;
        auVar68._20_4_ = fStack_70c * fVar267;
        auVar68._24_4_ = fStack_708 * fVar252;
        auVar68._28_4_ = fStack_8e4;
        _local_620 = vsubps_avx(auVar68,auVar264);
        auVar244._0_4_ = local_a60 + fVar156 * fVar205;
        auVar244._4_4_ = fStack_a5c + fVar207 * fVar234;
        auVar244._8_4_ = fStack_a58 + fVar250 * fVar268;
        auVar244._12_4_ = fStack_a54 + fVar253 * fVar274;
        auVar244._16_4_ = fStack_a50 + fVar277 * fVar291;
        auVar244._20_4_ = fStack_a4c + fVar293 * fVar297;
        auVar244._24_4_ = fStack_a48 + fVar314 * fVar328;
        auVar244._28_4_ = fStack_a44 + local_a00._28_4_ + fStack_a04;
        auVar69._4_4_ = fStack_73c * fVar191;
        auVar69._0_4_ = local_740 * fVar124;
        auVar69._8_4_ = fStack_738 * fVar204;
        auVar69._12_4_ = fStack_734 * fVar227;
        auVar69._16_4_ = fStack_730 * fVar229;
        auVar69._20_4_ = fStack_72c * fVar267;
        auVar69._24_4_ = fStack_728 * fVar252;
        auVar69._28_4_ = local_620._28_4_;
        _local_600 = vsubps_avx(auVar69,auVar244);
        auVar23 = vcmpps_avx(auVar23,_DAT_02020f00,5);
        auVar223._8_4_ = 0x7f800000;
        auVar223._0_8_ = 0x7f8000007f800000;
        auVar223._12_4_ = 0x7f800000;
        auVar223._16_4_ = 0x7f800000;
        auVar223._20_4_ = 0x7f800000;
        auVar223._24_4_ = 0x7f800000;
        auVar223._28_4_ = 0x7f800000;
        auVar222 = vblendvps_avx(auVar223,auVar63,auVar23);
        auVar306._8_4_ = 0x7fffffff;
        auVar306._0_8_ = 0x7fffffff7fffffff;
        auVar306._12_4_ = 0x7fffffff;
        auVar306._16_4_ = 0x7fffffff;
        auVar306._20_4_ = 0x7fffffff;
        auVar306._24_4_ = 0x7fffffff;
        auVar306._28_4_ = 0x7fffffff;
        auVar371 = vandps_avx(auVar306,auVar42);
        auVar371 = vmaxps_avx(local_440,auVar371);
        auVar344._8_4_ = 0x36000000;
        auVar344._0_8_ = 0x3600000036000000;
        auVar344._12_4_ = 0x36000000;
        auVar344._16_4_ = 0x36000000;
        auVar344._20_4_ = 0x36000000;
        auVar344._24_4_ = 0x36000000;
        auVar344._28_4_ = 0x36000000;
        auVar70._4_4_ = auVar371._4_4_ * 1.9073486e-06;
        auVar70._0_4_ = auVar371._0_4_ * 1.9073486e-06;
        auVar70._8_4_ = auVar371._8_4_ * 1.9073486e-06;
        auVar70._12_4_ = auVar371._12_4_ * 1.9073486e-06;
        auVar70._16_4_ = auVar371._16_4_ * 1.9073486e-06;
        auVar70._20_4_ = auVar371._20_4_ * 1.9073486e-06;
        auVar70._24_4_ = auVar371._24_4_ * 1.9073486e-06;
        auVar70._28_4_ = auVar371._28_4_;
        auVar22 = vandps_avx(auVar306,auVar22);
        auVar22 = vcmpps_avx(auVar22,auVar70,1);
        auVar245._8_4_ = 0xff800000;
        auVar245._0_8_ = 0xff800000ff800000;
        auVar245._12_4_ = 0xff800000;
        auVar245._16_4_ = 0xff800000;
        auVar245._20_4_ = 0xff800000;
        auVar245._24_4_ = 0xff800000;
        auVar245._28_4_ = 0xff800000;
        auVar241 = vblendvps_avx(auVar245,auVar64,auVar23);
        auVar371 = auVar23 & auVar22;
        if ((((((((auVar371 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar371 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar371 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar371 >> 0x7f,0) != '\0') ||
              (auVar371 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar371 >> 0xbf,0) != '\0') ||
            (auVar371 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar371[0x1f] < '\0') {
          auVar111 = vandps_avx(auVar22,auVar23);
          auVar103 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
          auVar371 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar344 = vcmpps_avx(local_a40,auVar371,2);
          auVar390._8_4_ = 0xff800000;
          auVar390._0_8_ = 0xff800000ff800000;
          auVar390._12_4_ = 0xff800000;
          auVar390._16_4_ = 0xff800000;
          auVar390._20_4_ = 0xff800000;
          auVar390._24_4_ = 0xff800000;
          auVar390._28_4_ = 0xff800000;
          auVar398._8_4_ = 0x7f800000;
          auVar398._0_8_ = 0x7f8000007f800000;
          auVar398._12_4_ = 0x7f800000;
          auVar398._16_4_ = 0x7f800000;
          auVar398._20_4_ = 0x7f800000;
          auVar398._24_4_ = 0x7f800000;
          auVar398._28_4_ = 0x7f800000;
          auVar22 = vblendvps_avx(auVar398,auVar390,auVar344);
          auVar171 = vpmovsxwd_avx(auVar103);
          auVar359 = ZEXT1664(auVar171);
          auVar103 = vpunpckhwd_avx(auVar103,auVar103);
          auVar308._16_16_ = auVar103;
          auVar308._0_16_ = auVar171;
          auVar222 = vblendvps_avx(auVar222,auVar22,auVar308);
          auVar22 = vblendvps_avx(auVar390,auVar398,auVar344);
          auVar241 = vblendvps_avx(auVar241,auVar22,auVar308);
          auVar22 = vcmpps_avx(auVar371,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
          auVar120._0_4_ = auVar22._0_4_ ^ auVar111._0_4_;
          auVar120._4_4_ = auVar22._4_4_ ^ auVar111._4_4_;
          auVar120._8_4_ = auVar22._8_4_ ^ auVar111._8_4_;
          auVar120._12_4_ = auVar22._12_4_ ^ auVar111._12_4_;
          auVar120._16_4_ = auVar22._16_4_ ^ auVar111._16_4_;
          auVar120._20_4_ = auVar22._20_4_ ^ auVar111._20_4_;
          auVar120._24_4_ = auVar22._24_4_ ^ auVar111._24_4_;
          auVar120._28_4_ = auVar22._28_4_ ^ auVar111._28_4_;
          auVar111 = vorps_avx(auVar344,auVar120);
          auVar111 = vandps_avx(auVar23,auVar111);
        }
        auVar199 = local_880._0_28_;
        auVar335 = ZEXT3264(local_a00);
        _local_ac0 = auVar110;
        local_920 = auVar139;
      }
      auVar345 = ZEXT3264(auVar344);
      fVar124 = (ray->dir).field_0.m128[0];
      auVar265._4_4_ = fVar124;
      auVar265._0_4_ = fVar124;
      auVar265._8_4_ = fVar124;
      auVar265._12_4_ = fVar124;
      auVar265._16_4_ = fVar124;
      auVar265._20_4_ = fVar124;
      auVar265._24_4_ = fVar124;
      auVar265._28_4_ = fVar124;
      auVar266 = ZEXT3264(auVar265);
      fVar154 = (ray->dir).field_0.m128[1];
      auVar349._4_4_ = fVar154;
      auVar349._0_4_ = fVar154;
      auVar349._8_4_ = fVar154;
      auVar349._12_4_ = fVar154;
      auVar349._16_4_ = fVar154;
      auVar349._20_4_ = fVar154;
      auVar349._24_4_ = fVar154;
      auVar351._28_4_ = fVar154;
      auVar351._0_28_ = auVar349;
      auVar352 = ZEXT3264(auVar351);
      fStack_57c = (ray->dir).field_0.m128[2];
      local_480 = _local_840;
      local_460 = vminps_avx(local_4a0,auVar222);
      _local_4c0 = vmaxps_avx(_local_840,auVar241);
      auVar248 = ZEXT3264(_local_4c0);
      auVar22 = vcmpps_avx(_local_840,local_460,2);
      local_560 = vandps_avx(auVar22,auVar110);
      auVar22 = vcmpps_avx(_local_4c0,local_4a0,2);
      local_660 = vandps_avx(auVar22,auVar110);
      auVar110 = vorps_avx(local_660,local_560);
      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0x7f,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0xbf,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar110[0x1f]) goto LAB_0100a113;
      auVar110 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_2c0._0_4_ = auVar111._0_4_ ^ auVar110._0_4_;
      local_2c0._4_4_ = auVar111._4_4_ ^ auVar110._4_4_;
      local_2c0._8_4_ = auVar111._8_4_ ^ auVar110._8_4_;
      local_2c0._12_4_ = auVar111._12_4_ ^ auVar110._12_4_;
      local_2c0._16_4_ = auVar111._16_4_ ^ auVar110._16_4_;
      local_2c0._20_4_ = auVar111._20_4_ ^ auVar110._20_4_;
      local_2c0._24_4_ = auVar111._24_4_ ^ auVar110._24_4_;
      local_2c0._28_4_ = (uint)auVar111._28_4_ ^ (uint)auVar110._28_4_;
      auVar115._0_4_ =
           auVar139._0_4_ * fVar124 + fVar154 * auVar199._0_4_ + auVar335._0_4_ * fStack_57c;
      auVar115._4_4_ =
           auVar139._4_4_ * fVar124 + fVar154 * auVar199._4_4_ + auVar335._4_4_ * fStack_57c;
      auVar115._8_4_ =
           auVar139._8_4_ * fVar124 + fVar154 * auVar199._8_4_ + auVar335._8_4_ * fStack_57c;
      auVar115._12_4_ =
           auVar139._12_4_ * fVar124 + fVar154 * auVar199._12_4_ + auVar335._12_4_ * fStack_57c;
      auVar115._16_4_ =
           auVar139._16_4_ * fVar124 + fVar154 * auVar199._16_4_ + auVar335._16_4_ * fStack_57c;
      auVar115._20_4_ =
           auVar139._20_4_ * fVar124 + fVar154 * auVar199._20_4_ + auVar335._20_4_ * fStack_57c;
      auVar115._24_4_ =
           auVar139._24_4_ * fVar124 + fVar154 * auVar199._24_4_ + auVar335._24_4_ * fStack_57c;
      auVar115._28_4_ = auVar111._28_4_ + auVar139._28_4_ + auVar110._28_4_;
      auVar142._8_4_ = 0x7fffffff;
      auVar142._0_8_ = 0x7fffffff7fffffff;
      auVar142._12_4_ = 0x7fffffff;
      auVar142._16_4_ = 0x7fffffff;
      auVar142._20_4_ = 0x7fffffff;
      auVar142._24_4_ = 0x7fffffff;
      auVar142._28_4_ = 0x7fffffff;
      auVar110 = vandps_avx(auVar115,auVar142);
      auVar143._8_4_ = 0x3e99999a;
      auVar143._0_8_ = 0x3e99999a3e99999a;
      auVar143._12_4_ = 0x3e99999a;
      auVar143._16_4_ = 0x3e99999a;
      auVar143._20_4_ = 0x3e99999a;
      auVar143._24_4_ = 0x3e99999a;
      auVar143._28_4_ = 0x3e99999a;
      auVar110 = vcmpps_avx(auVar110,auVar143,1);
      auVar110 = vorps_avx(auVar110,local_2c0);
      auVar144._8_4_ = 3;
      auVar144._0_8_ = 0x300000003;
      auVar144._12_4_ = 3;
      auVar144._16_4_ = 3;
      auVar144._20_4_ = 3;
      auVar144._24_4_ = 3;
      auVar144._28_4_ = 3;
      auVar178._8_4_ = 2;
      auVar178._0_8_ = 0x200000002;
      auVar178._12_4_ = 2;
      auVar178._16_4_ = 2;
      auVar178._20_4_ = 2;
      auVar178._24_4_ = 2;
      auVar178._28_4_ = 2;
      auVar110 = vblendvps_avx(auVar178,auVar144,auVar110);
      local_2a0 = ZEXT432((uint)uVar91);
      local_4e0 = vpshufd_avx(ZEXT416((uint)uVar91),0);
      auVar103 = vpcmpgtd_avx(auVar110._16_16_,local_4e0);
      auVar171 = vpcmpgtd_avx(auVar110._0_16_,local_4e0);
      auVar145._16_16_ = auVar103;
      auVar145._0_16_ = auVar171;
      auVar111 = vblendps_avx(ZEXT1632(auVar171),auVar145,0xf0);
      auVar110 = vandnps_avx(auVar111,local_560);
      auVar22 = local_560 & ~auVar111;
      auVar248 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      auStack_5d8 = auVar43._8_24_;
      local_5e0 = uVar91;
      local_580 = fStack_57c;
      fStack_578 = fStack_57c;
      fStack_574 = fStack_57c;
      fStack_570 = fStack_57c;
      fStack_56c = fStack_57c;
      fStack_568 = fStack_57c;
      fStack_564 = fStack_57c;
      local_760 = auVar111;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar22 >> 0x7f,0) == '\0') &&
            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0xbf,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f])
      {
        auVar290 = ZEXT464(0) << 0x20;
        auVar371 = _local_4c0;
        local_5a0 = auVar110;
      }
      else {
        local_540._4_4_ = (float)local_840._4_4_ + (float)local_7e0._4_4_;
        local_540._0_4_ = (float)local_840._0_4_ + (float)local_7e0._0_4_;
        fStack_538 = fStack_838 + fStack_7d8;
        fStack_534 = fStack_834 + fStack_7d4;
        fStack_530 = fStack_830 + fStack_7d0;
        fStack_52c = fStack_82c + fStack_7cc;
        fStack_528 = fStack_828 + fStack_7c8;
        fStack_524 = fStack_824 + fStack_7c4;
        auVar290 = ZEXT464(0) << 0x20;
        local_940 = _local_4c0;
        local_8e0 = auVar265;
        local_820 = auVar351;
        local_5c0 = local_660;
        do {
          auVar212 = auVar248._0_16_;
          auVar146._8_4_ = 0x7f800000;
          auVar146._0_8_ = 0x7f8000007f800000;
          auVar146._12_4_ = 0x7f800000;
          auVar146._16_4_ = 0x7f800000;
          auVar146._20_4_ = 0x7f800000;
          auVar146._24_4_ = 0x7f800000;
          auVar146._28_4_ = 0x7f800000;
          auVar111 = vblendvps_avx(auVar146,_local_840,auVar110);
          auVar22 = vshufps_avx(auVar111,auVar111,0xb1);
          auVar22 = vminps_avx(auVar111,auVar22);
          auVar371 = vshufpd_avx(auVar22,auVar22,5);
          auVar22 = vminps_avx(auVar22,auVar371);
          auVar371 = vperm2f128_avx(auVar22,auVar22,1);
          auVar22 = vminps_avx(auVar22,auVar371);
          auVar22 = vcmpps_avx(auVar111,auVar22,0);
          auVar371 = auVar110 & auVar22;
          auVar111 = auVar110;
          if ((((((((auVar371 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar371 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar371 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar371 >> 0x7f,0) != '\0') ||
                (auVar371 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar371 >> 0xbf,0) != '\0') ||
              (auVar371 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar371[0x1f] < '\0') {
            auVar111 = vandps_avx(auVar22,auVar110);
          }
          uVar90 = vmovmskps_avx(auVar111);
          uVar85 = 0;
          if (uVar90 != 0) {
            for (; (uVar90 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
            }
          }
          uVar91 = (ulong)uVar85;
          local_5a0 = auVar110;
          *(undefined4 *)(local_5a0 + uVar91 * 4) = 0;
          aVar10 = (ray->dir).field_0;
          _local_a20 = (undefined1  [16])aVar10;
          auVar103 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
          local_aa0 = *(float *)(local_480 + uVar91 * 4);
          uStack_a9c = 0;
          uStack_a98 = 0;
          uStack_a94 = 0;
          if (auVar103._0_4_ < 0.0) {
            _local_ac0 = ZEXT416((uint)local_500[uVar91]);
            fVar159 = sqrtf(auVar103._0_4_);
            auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar212._8_4_ = 0x7fffffff;
            auVar212._0_8_ = 0x7fffffff7fffffff;
            auVar212._12_4_ = 0x7fffffff;
            fVar124 = (float)local_ac0._0_4_;
            uVar313 = local_ac0._4_4_;
            fVar154 = fStack_ab8;
            fVar156 = fStack_ab4;
          }
          else {
            auVar103 = vsqrtss_avx(auVar103,auVar103);
            fVar159 = auVar103._0_4_;
            fVar124 = local_500[uVar91];
            uVar313 = 0;
            fVar154 = (float)0;
            fVar156 = (float)0;
          }
          auVar171 = vminps_avx(_local_980,_local_9a0);
          auVar103 = vmaxps_avx(_local_980,_local_9a0);
          auVar105 = vminps_avx(_local_990,_local_9b0);
          auVar132 = vminps_avx(auVar171,auVar105);
          auVar171 = vmaxps_avx(_local_990,_local_9b0);
          auVar105 = vmaxps_avx(auVar103,auVar171);
          auVar103 = vandps_avx(auVar132,auVar212);
          auVar171 = vandps_avx(auVar105,auVar212);
          auVar103 = vmaxps_avx(auVar103,auVar171);
          auVar171 = vmovshdup_avx(auVar103);
          auVar171 = vmaxss_avx(auVar171,auVar103);
          auVar103 = vshufpd_avx(auVar103,auVar103,1);
          auVar103 = vmaxss_avx(auVar103,auVar171);
          local_920._0_4_ = auVar103._0_4_ * 1.9073486e-06;
          local_680._0_4_ = fVar159 * 1.9073486e-06;
          local_700._0_16_ = vshufps_avx(auVar105,auVar105,0xff);
          lVar89 = 5;
          do {
            auVar110 = _local_ac0;
            local_900 = 1.0 - fVar124;
            auVar369 = ZEXT416((uint)local_900);
            fVar159 = local_900 * local_900;
            fVar191 = local_900 * fVar159;
            fVar204 = fVar124 * fVar124;
            fVar205 = fVar124 * fVar204;
            fVar206 = fVar124 * local_900;
            local_ac0._4_4_ = uVar313;
            local_ac0._0_4_ = fVar124;
            fStack_ab8 = fVar154;
            _fStack_ab0 = auVar110._16_16_;
            fStack_ab4 = fVar156;
            auVar103 = vshufps_avx(ZEXT416((uint)(fVar205 * 0.16666667)),
                                   ZEXT416((uint)(fVar205 * 0.16666667)),0);
            auVar171 = ZEXT416((uint)((fVar205 * 4.0 + fVar191 +
                                      fVar124 * fVar206 * 12.0 + local_900 * fVar206 * 6.0) *
                                     0.16666667));
            auVar171 = vshufps_avx(auVar171,auVar171,0);
            auVar105 = ZEXT416((uint)((fVar191 * 4.0 + fVar205 +
                                      local_900 * fVar206 * 12.0 + fVar124 * fVar206 * 6.0) *
                                     0.16666667));
            auVar105 = vshufps_avx(auVar105,auVar105,0);
            auVar342._4_4_ = uStack_a9c;
            auVar342._0_4_ = local_aa0;
            auVar342._8_4_ = uStack_a98;
            auVar342._12_4_ = uStack_a94;
            auVar132 = vshufps_avx(auVar342,auVar342,0);
            auVar167._0_4_ = auVar132._0_4_ * (float)local_a20._0_4_ + 0.0;
            auVar167._4_4_ = auVar132._4_4_ * (float)local_a20._4_4_ + 0.0;
            auVar167._8_4_ = auVar132._8_4_ * fStack_a18 + 0.0;
            auVar167._12_4_ = auVar132._12_4_ * fStack_a14 + 0.0;
            auVar132 = vshufps_avx(ZEXT416((uint)(fVar191 * 0.16666667)),
                                   ZEXT416((uint)(fVar191 * 0.16666667)),0);
            auVar97._0_4_ =
                 auVar132._0_4_ * (float)local_980._0_4_ +
                 auVar105._0_4_ * (float)local_9a0._0_4_ +
                 auVar103._0_4_ * (float)local_9b0._0_4_ + auVar171._0_4_ * (float)local_990._0_4_;
            auVar97._4_4_ =
                 auVar132._4_4_ * (float)local_980._4_4_ +
                 auVar105._4_4_ * (float)local_9a0._4_4_ +
                 auVar103._4_4_ * (float)local_9b0._4_4_ + auVar171._4_4_ * (float)local_990._4_4_;
            auVar97._8_4_ =
                 auVar132._8_4_ * fStack_978 +
                 auVar105._8_4_ * fStack_998 +
                 auVar103._8_4_ * fStack_9a8 + auVar171._8_4_ * fStack_988;
            auVar97._12_4_ =
                 auVar132._12_4_ * fStack_974 +
                 auVar105._12_4_ * fStack_994 +
                 auVar103._12_4_ * fStack_9a4 + auVar171._12_4_ * fStack_984;
            local_7c0._0_16_ = auVar97;
            auVar103 = vsubps_avx(auVar167,auVar97);
            _local_880 = auVar103;
            auVar103 = vdpps_avx(auVar103,auVar103,0x7f);
            local_a60 = auVar103._0_4_;
            fStack_a5c = auVar103._4_4_;
            fStack_a58 = auVar103._8_4_;
            fStack_a54 = auVar103._12_4_;
            if (local_a60 < 0.0) {
              fStack_8fc = 0.0;
              fStack_8f8 = 0.0;
              fStack_8f4 = 0.0;
              local_a00._0_4_ = fVar204;
              local_a40._0_4_ = fVar159;
              local_9e0._0_4_ = fVar206;
              auVar345._0_4_ = sqrtf(local_a60);
              auVar345._4_60_ = extraout_var;
              auVar369._4_4_ = fStack_8fc;
              auVar369._0_4_ = local_900;
              auVar369._8_4_ = fStack_8f8;
              auVar369._12_4_ = fStack_8f4;
              auVar342._4_4_ = uStack_a9c;
              auVar342._0_4_ = local_aa0;
              auVar342._8_4_ = uStack_a98;
              auVar342._12_4_ = uStack_a94;
              auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar103 = auVar345._0_16_;
              fVar159 = (float)local_a40._0_4_;
              fVar206 = (float)local_9e0._0_4_;
            }
            else {
              auVar103 = vsqrtss_avx(auVar103,auVar103);
              local_a00._0_4_ = fVar204;
            }
            auVar359 = ZEXT1664(auVar103);
            auVar345 = ZEXT1664(auVar342);
            fVar154 = auVar369._0_4_;
            fVar124 = local_ac0._0_4_;
            auVar171 = vshufps_avx(ZEXT416((uint)((float)local_a00._0_4_ * 0.5)),
                                   ZEXT416((uint)((float)local_a00._0_4_ * 0.5)),0);
            auVar105 = ZEXT416((uint)((fVar159 + fVar206 * 4.0) * 0.5));
            auVar105 = vshufps_avx(auVar105,auVar105,0);
            auVar132 = ZEXT416((uint)((fVar124 * -fVar124 - fVar206 * 4.0) * 0.5));
            auVar132 = vshufps_avx(auVar132,auVar132,0);
            auVar98 = ZEXT416((uint)(fVar154 * -fVar154 * 0.5));
            auVar98 = vshufps_avx(auVar98,auVar98,0);
            local_a00._0_4_ =
                 (float)local_980._0_4_ * auVar98._0_4_ +
                 (float)local_9a0._0_4_ * auVar132._0_4_ +
                 (float)local_9b0._0_4_ * auVar171._0_4_ + (float)local_990._0_4_ * auVar105._0_4_;
            local_a00._4_4_ =
                 (float)local_980._4_4_ * auVar98._4_4_ +
                 (float)local_9a0._4_4_ * auVar132._4_4_ +
                 (float)local_9b0._4_4_ * auVar171._4_4_ + (float)local_990._4_4_ * auVar105._4_4_;
            local_a00._8_4_ =
                 fStack_978 * auVar98._8_4_ +
                 fStack_998 * auVar132._8_4_ +
                 fStack_9a8 * auVar171._8_4_ + fStack_988 * auVar105._8_4_;
            local_a00._12_4_ =
                 fStack_974 * auVar98._12_4_ +
                 fStack_994 * auVar132._12_4_ +
                 fStack_9a4 * auVar171._12_4_ + fStack_984 * auVar105._12_4_;
            auVar352 = ZEXT1664(local_a00._0_16_);
            auVar171 = vshufps_avx(_local_ac0,_local_ac0,0);
            auVar105 = ZEXT416((uint)(fVar154 - (fVar124 + fVar124)));
            auVar132 = vshufps_avx(auVar105,auVar105,0);
            auVar105 = ZEXT416((uint)(fVar124 - (fVar154 + fVar154)));
            auVar98 = vshufps_avx(auVar105,auVar105,0);
            auVar104 = vshufps_avx(auVar369,auVar369,0);
            auVar105 = vdpps_avx(local_a00._0_16_,local_a00._0_16_,0x7f);
            auVar128._0_4_ =
                 (float)local_980._0_4_ * auVar104._0_4_ +
                 (float)local_9a0._0_4_ * auVar98._0_4_ +
                 (float)local_9b0._0_4_ * auVar171._0_4_ + (float)local_990._0_4_ * auVar132._0_4_;
            auVar128._4_4_ =
                 (float)local_980._4_4_ * auVar104._4_4_ +
                 (float)local_9a0._4_4_ * auVar98._4_4_ +
                 (float)local_9b0._4_4_ * auVar171._4_4_ + (float)local_990._4_4_ * auVar132._4_4_;
            auVar128._8_4_ =
                 fStack_978 * auVar104._8_4_ +
                 fStack_998 * auVar98._8_4_ +
                 fStack_9a8 * auVar171._8_4_ + fStack_988 * auVar132._8_4_;
            auVar128._12_4_ =
                 fStack_974 * auVar104._12_4_ +
                 fStack_994 * auVar98._12_4_ +
                 fStack_9a4 * auVar171._12_4_ + fStack_984 * auVar132._12_4_;
            auVar171 = vblendps_avx(auVar105,_DAT_01feba10,0xe);
            auVar132 = vrsqrtss_avx(auVar171,auVar171);
            fVar154 = auVar132._0_4_;
            fVar124 = auVar105._0_4_;
            auVar132 = vdpps_avx(local_a00._0_16_,auVar128,0x7f);
            auVar98 = vshufps_avx(auVar105,auVar105,0);
            auVar129._0_4_ = auVar128._0_4_ * auVar98._0_4_;
            auVar129._4_4_ = auVar128._4_4_ * auVar98._4_4_;
            auVar129._8_4_ = auVar128._8_4_ * auVar98._8_4_;
            auVar129._12_4_ = auVar128._12_4_ * auVar98._12_4_;
            auVar132 = vshufps_avx(auVar132,auVar132,0);
            auVar213._0_4_ = (float)local_a00._0_4_ * auVar132._0_4_;
            auVar213._4_4_ = local_a00._4_4_ * auVar132._4_4_;
            auVar213._8_4_ = local_a00._8_4_ * auVar132._8_4_;
            auVar213._12_4_ = local_a00._12_4_ * auVar132._12_4_;
            auVar98 = vsubps_avx(auVar129,auVar213);
            auVar132 = vrcpss_avx(auVar171,auVar171);
            auVar171 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                                  ZEXT416((uint)(auVar342._0_4_ * (float)local_680._0_4_)));
            local_900 = auVar171._0_4_;
            auVar171 = ZEXT416((uint)(auVar132._0_4_ * (2.0 - fVar124 * auVar132._0_4_)));
            auVar171 = vshufps_avx(auVar171,auVar171,0);
            uVar91 = CONCAT44(local_a00._4_4_,local_a00._0_4_);
            auVar303._0_8_ = uVar91 ^ 0x8000000080000000;
            auVar303._8_4_ = -local_a00._8_4_;
            auVar303._12_4_ = -local_a00._12_4_;
            auVar132 = ZEXT416((uint)(fVar154 * 1.5 + fVar124 * -0.5 * fVar154 * fVar154 * fVar154))
            ;
            auVar132 = vshufps_avx(auVar132,auVar132,0);
            auVar195._0_4_ = auVar132._0_4_ * auVar98._0_4_ * auVar171._0_4_;
            auVar195._4_4_ = auVar132._4_4_ * auVar98._4_4_ * auVar171._4_4_;
            auVar195._8_4_ = auVar132._8_4_ * auVar98._8_4_ * auVar171._8_4_;
            auVar195._12_4_ = auVar132._12_4_ * auVar98._12_4_ * auVar171._12_4_;
            local_860._0_4_ = (float)local_a00._0_4_ * auVar132._0_4_;
            local_860._4_4_ = local_a00._4_4_ * auVar132._4_4_;
            local_860._8_4_ = local_a00._8_4_ * auVar132._8_4_;
            local_860._12_4_ = local_a00._12_4_ * auVar132._12_4_;
            if (fVar124 < 0.0) {
              local_a40._0_4_ = auVar103._0_4_;
              local_9e0._0_16_ = auVar303;
              local_800._0_16_ = auVar195;
              auVar345 = ZEXT1664(auVar342);
              auVar352 = ZEXT1664(local_a00._0_16_);
              fVar124 = sqrtf(fVar124);
              auVar359 = ZEXT464((uint)local_a40._0_4_);
              auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar195 = local_800._0_16_;
              auVar303 = local_9e0._0_16_;
            }
            else {
              auVar103 = vsqrtss_avx(auVar105,auVar105);
              fVar124 = auVar103._0_4_;
            }
            auVar333._4_4_ = fStack_a5c;
            auVar333._0_4_ = local_a60;
            auVar333._8_4_ = fStack_a58;
            auVar333._12_4_ = fStack_a54;
            local_a40._0_16_ = vdpps_avx(_local_880,local_860._0_16_,0x7f);
            local_9e0._0_4_ =
                 ((float)local_920._0_4_ / fVar124) * (auVar359._0_4_ + 1.0) +
                 auVar359._0_4_ * (float)local_920._0_4_ + local_900;
            auVar103 = vdpps_avx(auVar303,local_860._0_16_,0x7f);
            auVar171 = vdpps_avx(_local_880,auVar195,0x7f);
            auVar105 = vdpps_avx(_local_a20,local_860._0_16_,0x7f);
            auVar132 = vdpps_avx(_local_880,auVar303,0x7f);
            fVar124 = auVar103._0_4_ + auVar171._0_4_;
            fVar154 = local_a40._0_4_;
            auVar99._0_4_ = fVar154 * fVar154;
            auVar99._4_4_ = local_a40._4_4_ * local_a40._4_4_;
            auVar99._8_4_ = local_a40._8_4_ * local_a40._8_4_;
            auVar99._12_4_ = local_a40._12_4_ * local_a40._12_4_;
            auVar171 = vsubps_avx(auVar333,auVar99);
            local_860._0_16_ = ZEXT416((uint)fVar124);
            auVar103 = vdpps_avx(_local_880,_local_a20,0x7f);
            fVar156 = auVar132._0_4_ - fVar154 * fVar124;
            fVar154 = auVar103._0_4_ - fVar154 * auVar105._0_4_;
            auVar103 = vrsqrtss_avx(auVar171,auVar171);
            fVar159 = auVar171._0_4_;
            fVar124 = auVar103._0_4_;
            fVar124 = fVar124 * 1.5 + fVar159 * -0.5 * fVar124 * fVar124 * fVar124;
            if (fVar159 < 0.0) {
              local_800._0_16_ = auVar105;
              local_6a0._0_4_ = fVar156;
              local_6c0._0_4_ = fVar154;
              local_6e0._0_4_ = fVar124;
              auVar345 = ZEXT1664(auVar345._0_16_);
              auVar352 = ZEXT1664(auVar352._0_16_);
              auVar359 = ZEXT1664(auVar359._0_16_);
              fVar159 = sqrtf(fVar159);
              auVar333._4_4_ = fStack_a5c;
              auVar333._0_4_ = local_a60;
              auVar333._8_4_ = fStack_a58;
              auVar333._12_4_ = fStack_a54;
              auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar124 = (float)local_6e0._0_4_;
              fVar156 = (float)local_6a0._0_4_;
              fVar154 = (float)local_6c0._0_4_;
              auVar105 = local_800._0_16_;
            }
            else {
              auVar103 = vsqrtss_avx(auVar171,auVar171);
              fVar159 = auVar103._0_4_;
            }
            auVar335 = ZEXT1664(auVar333);
            auVar349 = local_820._0_28_;
            auVar132 = vpermilps_avx(local_7c0._0_16_,0xff);
            auVar98 = vpermilps_avx(local_a00._0_16_,0xff);
            fVar156 = fVar156 * fVar124 - auVar98._0_4_;
            auVar214._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
            auVar214._8_4_ = auVar105._8_4_ ^ 0x80000000;
            auVar214._12_4_ = auVar105._12_4_ ^ 0x80000000;
            auVar237._0_4_ = -fVar156;
            auVar237._4_4_ = 0x80000000;
            auVar237._8_4_ = 0x80000000;
            auVar237._12_4_ = 0x80000000;
            auVar103 = vinsertps_avx(ZEXT416((uint)(fVar154 * fVar124)),auVar214,0x10);
            auVar171 = vmovsldup_avx(ZEXT416((uint)(local_860._0_4_ * fVar154 * fVar124 -
                                                   auVar105._0_4_ * fVar156)));
            auVar103 = vdivps_avx(auVar103,auVar171);
            auVar132 = ZEXT416((uint)(fVar159 - auVar132._0_4_));
            auVar105 = vinsertps_avx(local_a40._0_16_,auVar132,0x10);
            auVar196._0_4_ = auVar105._0_4_ * auVar103._0_4_;
            auVar196._4_4_ = auVar105._4_4_ * auVar103._4_4_;
            auVar196._8_4_ = auVar105._8_4_ * auVar103._8_4_;
            auVar196._12_4_ = auVar105._12_4_ * auVar103._12_4_;
            auVar103 = vinsertps_avx(auVar237,local_860._0_16_,0x1c);
            auVar103 = vdivps_avx(auVar103,auVar171);
            auVar171 = vhaddps_avx(auVar196,auVar196);
            auVar168._0_4_ = auVar105._0_4_ * auVar103._0_4_;
            auVar168._4_4_ = auVar105._4_4_ * auVar103._4_4_;
            auVar168._8_4_ = auVar105._8_4_ * auVar103._8_4_;
            auVar168._12_4_ = auVar105._12_4_ * auVar103._12_4_;
            auVar103 = vhaddps_avx(auVar168,auVar168);
            fVar124 = (float)local_ac0._0_4_ - auVar171._0_4_;
            uVar313 = 0;
            fVar154 = 0.0;
            fVar156 = 0.0;
            local_aa0 = local_aa0 - auVar103._0_4_;
            uStack_a9c = 0;
            uStack_a98 = 0;
            uStack_a94 = 0;
            auVar215._8_4_ = 0x7fffffff;
            auVar215._0_8_ = 0x7fffffff7fffffff;
            auVar215._12_4_ = 0x7fffffff;
            auVar248 = ZEXT1664(auVar215);
            auVar103 = vandps_avx(local_a40._0_16_,auVar215);
            bVar71 = true;
            if ((float)local_9e0._0_4_ <= auVar103._0_4_) {
              auVar266 = ZEXT3264(local_8e0);
            }
            else {
              auVar103 = vandps_avx(auVar132,auVar215);
              auVar266 = ZEXT3264(local_8e0);
              if (auVar103._0_4_ <
                  (float)local_700._0_4_ * 1.9073486e-06 + (float)local_9e0._0_4_ + local_900) {
                local_aa0 = local_aa0 + (float)local_790._0_4_;
                uStack_a9c = 0;
                uStack_a98 = 0;
                uStack_a94 = 0;
                if (((((ray->org).field_0.m128[3] <= local_aa0) &&
                     (fVar159 = ray->tfar, local_aa0 <= fVar159)) && (0.0 <= fVar124)) &&
                   (fVar124 <= 1.0)) {
                  auVar103 = vrsqrtss_avx(auVar333,auVar333);
                  fVar191 = auVar103._0_4_;
                  pGVar12 = (context->scene->geometries).items[local_a68].ptr;
                  local_a60 = fVar159;
                  if ((pGVar12->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      unaff_R14B = 1;
                    }
                    else {
                      auVar103 = ZEXT416((uint)(fVar191 * 1.5 +
                                               auVar333._0_4_ * -0.5 * fVar191 * fVar191 * fVar191))
                      ;
                      auVar103 = vshufps_avx(auVar103,auVar103,0);
                      auVar130._0_4_ = auVar103._0_4_ * (float)local_880._0_4_;
                      auVar130._4_4_ = auVar103._4_4_ * (float)local_880._4_4_;
                      auVar130._8_4_ = auVar103._8_4_ * fStack_878;
                      auVar130._12_4_ = auVar103._12_4_ * fStack_874;
                      auVar335 = ZEXT1664(local_a00._0_16_);
                      auVar100._0_4_ = local_a00._0_4_ + auVar98._0_4_ * auVar130._0_4_;
                      auVar100._4_4_ = local_a00._4_4_ + auVar98._4_4_ * auVar130._4_4_;
                      auVar100._8_4_ = local_a00._8_4_ + auVar98._8_4_ * auVar130._8_4_;
                      auVar100._12_4_ = local_a00._12_4_ + auVar98._12_4_ * auVar130._12_4_;
                      auVar103 = vshufps_avx(auVar130,auVar130,0xc9);
                      auVar171 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                      auVar131._0_4_ = auVar171._0_4_ * auVar130._0_4_;
                      auVar131._4_4_ = auVar171._4_4_ * auVar130._4_4_;
                      auVar131._8_4_ = auVar171._8_4_ * auVar130._8_4_;
                      auVar131._12_4_ = auVar171._12_4_ * auVar130._12_4_;
                      auVar169._0_4_ = local_a00._0_4_ * auVar103._0_4_;
                      auVar169._4_4_ = local_a00._4_4_ * auVar103._4_4_;
                      auVar169._8_4_ = local_a00._8_4_ * auVar103._8_4_;
                      auVar169._12_4_ = local_a00._12_4_ * auVar103._12_4_;
                      auVar105 = vsubps_avx(auVar169,auVar131);
                      auVar103 = vshufps_avx(auVar105,auVar105,0xc9);
                      auVar171 = vshufps_avx(auVar100,auVar100,0xc9);
                      auVar170._0_4_ = auVar171._0_4_ * auVar103._0_4_;
                      auVar170._4_4_ = auVar171._4_4_ * auVar103._4_4_;
                      auVar170._8_4_ = auVar171._8_4_ * auVar103._8_4_;
                      auVar170._12_4_ = auVar171._12_4_ * auVar103._12_4_;
                      auVar103 = vshufps_avx(auVar105,auVar105,0xd2);
                      auVar101._0_4_ = auVar100._0_4_ * auVar103._0_4_;
                      auVar101._4_4_ = auVar100._4_4_ * auVar103._4_4_;
                      auVar101._8_4_ = auVar100._8_4_ * auVar103._8_4_;
                      auVar101._12_4_ = auVar100._12_4_ * auVar103._12_4_;
                      auVar171 = vsubps_avx(auVar170,auVar101);
                      auVar103 = vshufps_avx(auVar171,auVar171,0xe9);
                      local_8c0 = vmovlps_avx(auVar103);
                      local_8b8 = auVar171._0_4_;
                      local_8b0 = 0;
                      local_8ac = (undefined4)local_888;
                      local_8a8 = (undefined4)local_a68;
                      local_8a4 = context->user->instID[0];
                      local_8a0 = context->user->instPrimID[0];
                      ray->tfar = local_aa0;
                      local_ac4 = -1;
                      local_970.valid = &local_ac4;
                      local_970.geometryUserPtr = pGVar12->userPtr;
                      local_970.context = context->user;
                      local_970.hit = (RTCHitN *)&local_8c0;
                      local_970.N = 1;
                      _local_ac0 = ZEXT416((uint)fVar124);
                      local_970.ray = (RTCRayN *)ray;
                      local_8b4 = fVar124;
                      if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0100aca9:
                        p_Var16 = context->args->filter;
                        if (p_Var16 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                            auVar335 = ZEXT1664(auVar335._0_16_);
                            auVar345 = ZEXT1664(auVar345._0_16_);
                            auVar352 = ZEXT1664(auVar352._0_16_);
                            auVar359 = ZEXT1664(auVar359._0_16_);
                            (*p_Var16)(&local_970);
                            auVar349 = local_820._0_28_;
                            auVar266 = ZEXT3264(local_8e0);
                            auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar248 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            fVar124 = (float)local_ac0._0_4_;
                            uVar313 = local_ac0._4_4_;
                            fVar154 = fStack_ab8;
                            fVar156 = fStack_ab4;
                          }
                          if (*local_970.valid == 0) {
                            unaff_R14B = 0;
                            goto LAB_0100ad37;
                          }
                        }
                        unaff_R14B = 1;
                      }
                      else {
                        auVar335 = ZEXT1664(local_a00._0_16_);
                        auVar345 = ZEXT1664(auVar345._0_16_);
                        auVar352 = ZEXT1664(auVar352._0_16_);
                        auVar359 = ZEXT1664(auVar359._0_16_);
                        (*pGVar12->occlusionFilterN)(&local_970);
                        auVar349 = local_820._0_28_;
                        auVar266 = ZEXT3264(local_8e0);
                        auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar248 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        fVar124 = (float)local_ac0._0_4_;
                        uVar313 = local_ac0._4_4_;
                        fVar154 = fStack_ab8;
                        fVar156 = fStack_ab4;
                        if (*local_970.valid != 0) goto LAB_0100aca9;
                        unaff_R14B = 0;
                      }
LAB_0100ad37:
                      if (unaff_R14B == 0) {
                        ray->tfar = local_a60;
                      }
                    }
                    bVar71 = false;
                    goto LAB_0100ab1d;
                  }
                }
                bVar71 = false;
                unaff_R14B = 0;
              }
            }
LAB_0100ab1d:
            if (!bVar71) goto LAB_0100ad60;
            lVar89 = lVar89 + -1;
          } while (lVar89 != 0);
          unaff_R14B = 0;
          auVar266 = ZEXT3264(local_8e0);
LAB_0100ad60:
          unaff_R14B = unaff_R14B & 1;
          bVar87 = bVar87 | unaff_R14B;
          fVar124 = ray->tfar;
          auVar116._4_4_ = fVar124;
          auVar116._0_4_ = fVar124;
          auVar116._8_4_ = fVar124;
          auVar116._12_4_ = fVar124;
          auVar116._16_4_ = fVar124;
          auVar116._20_4_ = fVar124;
          auVar116._24_4_ = fVar124;
          auVar116._28_4_ = fVar124;
          auVar111 = vcmpps_avx(_local_540,auVar116,2);
          auVar110 = vandps_avx(auVar111,local_5a0);
          auVar22 = local_5a0 & auVar111;
          uVar91 = local_5e0;
          auVar371 = local_940;
          local_5a0 = auVar110;
        } while ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar22 >> 0x7f,0) != '\0') ||
                   (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar22 >> 0xbf,0) != '\0') ||
                 (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar22[0x1f] < '\0');
      }
      auVar117._0_4_ =
           auVar266._0_4_ * (float)local_640._0_4_ +
           auVar349._0_4_ * (float)local_620._0_4_ + local_580 * (float)local_600._0_4_;
      auVar117._4_4_ =
           auVar266._4_4_ * (float)local_640._4_4_ +
           auVar349._4_4_ * (float)local_620._4_4_ + fStack_57c * (float)local_600._4_4_;
      auVar117._8_4_ =
           auVar266._8_4_ * fStack_638 + auVar349._8_4_ * fStack_618 + fStack_578 * fStack_5f8;
      auVar117._12_4_ =
           auVar266._12_4_ * fStack_634 + auVar349._12_4_ * fStack_614 + fStack_574 * fStack_5f4;
      auVar117._16_4_ =
           auVar266._16_4_ * fStack_630 + auVar349._16_4_ * fStack_610 + fStack_570 * fStack_5f0;
      auVar117._20_4_ =
           auVar266._20_4_ * fStack_62c + auVar349._20_4_ * fStack_60c + fStack_56c * fStack_5ec;
      auVar117._24_4_ =
           auVar266._24_4_ * fStack_628 + auVar349._24_4_ * fStack_608 + fStack_568 * fStack_5e8;
      auVar117._28_4_ = auVar111._28_4_ + auVar111._28_4_ + fStack_564;
      auVar147._8_4_ = 0x7fffffff;
      auVar147._0_8_ = 0x7fffffff7fffffff;
      auVar147._12_4_ = 0x7fffffff;
      auVar147._16_4_ = 0x7fffffff;
      auVar147._20_4_ = 0x7fffffff;
      auVar147._24_4_ = 0x7fffffff;
      auVar147._28_4_ = 0x7fffffff;
      auVar110 = vandps_avx(auVar117,auVar147);
      auVar148._8_4_ = 0x3e99999a;
      auVar148._0_8_ = 0x3e99999a3e99999a;
      auVar148._12_4_ = 0x3e99999a;
      auVar148._16_4_ = 0x3e99999a;
      auVar148._20_4_ = 0x3e99999a;
      auVar148._24_4_ = 0x3e99999a;
      auVar148._28_4_ = 0x3e99999a;
      auVar110 = vcmpps_avx(auVar110,auVar148,1);
      auVar111 = vorps_avx(auVar110,local_2c0);
      auVar149._0_4_ = (float)local_7e0._0_4_ + auVar371._0_4_;
      auVar149._4_4_ = (float)local_7e0._4_4_ + auVar371._4_4_;
      auVar149._8_4_ = fStack_7d8 + auVar371._8_4_;
      auVar149._12_4_ = fStack_7d4 + auVar371._12_4_;
      auVar149._16_4_ = fStack_7d0 + auVar371._16_4_;
      auVar149._20_4_ = fStack_7cc + auVar371._20_4_;
      auVar149._24_4_ = fStack_7c8 + auVar371._24_4_;
      auVar149._28_4_ = fStack_7c4 + auVar371._28_4_;
      fVar124 = ray->tfar;
      auVar179._4_4_ = fVar124;
      auVar179._0_4_ = fVar124;
      auVar179._8_4_ = fVar124;
      auVar179._12_4_ = fVar124;
      auVar179._16_4_ = fVar124;
      auVar179._20_4_ = fVar124;
      auVar179._24_4_ = fVar124;
      auVar179._28_4_ = fVar124;
      auVar110 = vcmpps_avx(auVar149,auVar179,2);
      local_700 = vandps_avx(auVar110,local_660);
      auVar150._8_4_ = 3;
      auVar150._0_8_ = 0x300000003;
      auVar150._12_4_ = 3;
      auVar150._16_4_ = 3;
      auVar150._20_4_ = 3;
      auVar150._24_4_ = 3;
      auVar150._28_4_ = 3;
      auVar180._8_4_ = 2;
      auVar180._0_8_ = 0x200000002;
      auVar180._12_4_ = 2;
      auVar180._16_4_ = 2;
      auVar180._20_4_ = 2;
      auVar180._24_4_ = 2;
      auVar180._28_4_ = 2;
      auVar110 = vblendvps_avx(auVar180,auVar150,auVar111);
      auVar103 = vpcmpgtd_avx(auVar110._16_16_,local_4e0);
      auVar171 = vpshufd_avx(local_2a0._0_16_,0);
      auVar171 = vpcmpgtd_avx(auVar110._0_16_,auVar171);
      auVar151._16_16_ = auVar103;
      auVar151._0_16_ = auVar171;
      _local_840 = vblendps_avx(ZEXT1632(auVar171),auVar151,0xf0);
      auVar110 = vandnps_avx(_local_840,local_700);
      auVar111 = local_700 & ~_local_840;
      if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar111 >> 0x7f,0) != '\0') ||
            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar111 >> 0xbf,0) != '\0') ||
          (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar111[0x1f] < '\0') {
        local_6c0 = _local_4c0;
        local_6e0._4_4_ = (float)local_7e0._4_4_ + (float)local_4c0._4_4_;
        local_6e0._0_4_ = (float)local_7e0._0_4_ + (float)local_4c0._0_4_;
        fStack_6d8 = fStack_7d8 + fStack_4b8;
        fStack_6d4 = fStack_7d4 + fStack_4b4;
        fStack_6d0 = fStack_7d0 + fStack_4b0;
        fStack_6cc = fStack_7cc + fStack_4ac;
        fStack_6c8 = fStack_7c8 + fStack_4a8;
        fStack_6c4 = fStack_7c4 + fStack_4a4;
        do {
          auVar216 = auVar248._0_16_;
          auVar152._8_4_ = 0x7f800000;
          auVar152._0_8_ = 0x7f8000007f800000;
          auVar152._12_4_ = 0x7f800000;
          auVar152._16_4_ = 0x7f800000;
          auVar152._20_4_ = 0x7f800000;
          auVar152._24_4_ = 0x7f800000;
          auVar152._28_4_ = 0x7f800000;
          auVar111 = vblendvps_avx(auVar152,local_6c0,auVar110);
          auVar22 = vshufps_avx(auVar111,auVar111,0xb1);
          auVar22 = vminps_avx(auVar111,auVar22);
          auVar371 = vshufpd_avx(auVar22,auVar22,5);
          auVar22 = vminps_avx(auVar22,auVar371);
          auVar371 = vperm2f128_avx(auVar22,auVar22,1);
          auVar22 = vminps_avx(auVar22,auVar371);
          auVar22 = vcmpps_avx(auVar111,auVar22,0);
          auVar371 = auVar110 & auVar22;
          auVar111 = auVar110;
          if ((((((((auVar371 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar371 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar371 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar371 >> 0x7f,0) != '\0') ||
                (auVar371 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar371 >> 0xbf,0) != '\0') ||
              (auVar371 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar371[0x1f] < '\0') {
            auVar111 = vandps_avx(auVar22,auVar110);
          }
          uVar90 = vmovmskps_avx(auVar111);
          uVar85 = 0;
          if (uVar90 != 0) {
            for (; (uVar90 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
            }
          }
          uVar91 = (ulong)uVar85;
          local_5c0 = auVar110;
          *(undefined4 *)(local_5c0 + uVar91 * 4) = 0;
          aVar10 = (ray->dir).field_0;
          _local_a20 = (undefined1  [16])aVar10;
          auVar103 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
          local_aa0 = local_520[uVar91];
          auVar352 = ZEXT464((uint)local_aa0);
          auVar372 = ZEXT464(*(uint *)(local_4a0 + uVar91 * 4));
          if (auVar103._0_4_ < 0.0) {
            uStack_a9c = 0;
            uStack_a98 = 0;
            uStack_a94 = 0;
            _local_ac0 = ZEXT416(*(uint *)(local_4a0 + uVar91 * 4));
            fVar124 = sqrtf(auVar103._0_4_);
            auVar372 = ZEXT1664(_local_ac0);
            auVar352 = ZEXT1664(CONCAT412(uStack_a94,
                                          CONCAT48(uStack_a98,CONCAT44(uStack_a9c,local_aa0))));
            auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar216._8_4_ = 0x7fffffff;
            auVar216._0_8_ = 0x7fffffff7fffffff;
            auVar216._12_4_ = 0x7fffffff;
          }
          else {
            auVar103 = vsqrtss_avx(auVar103,auVar103);
            fVar124 = auVar103._0_4_;
          }
          auVar171 = vminps_avx(_local_980,_local_9a0);
          auVar103 = vmaxps_avx(_local_980,_local_9a0);
          auVar105 = vminps_avx(_local_990,_local_9b0);
          auVar132 = vminps_avx(auVar171,auVar105);
          auVar171 = vmaxps_avx(_local_990,_local_9b0);
          auVar105 = vmaxps_avx(auVar103,auVar171);
          auVar103 = vandps_avx(auVar132,auVar216);
          auVar171 = vandps_avx(auVar105,auVar216);
          auVar103 = vmaxps_avx(auVar103,auVar171);
          auVar171 = vmovshdup_avx(auVar103);
          auVar171 = vmaxss_avx(auVar171,auVar103);
          auVar103 = vshufpd_avx(auVar103,auVar103,1);
          auVar103 = vmaxss_avx(auVar103,auVar171);
          local_920._0_4_ = auVar103._0_4_ * 1.9073486e-06;
          local_680._0_4_ = fVar124 * 1.9073486e-06;
          local_6a0._0_16_ = vshufps_avx(auVar105,auVar105,0xff);
          lVar89 = 5;
          do {
            local_aa0 = auVar352._0_4_;
            fVar191 = 1.0 - local_aa0;
            auVar359 = ZEXT464((uint)fVar191);
            fVar124 = fVar191 * fVar191;
            fVar154 = fVar191 * fVar124;
            fVar156 = local_aa0 * local_aa0;
            fVar159 = local_aa0 * fVar156;
            local_900 = local_aa0 * fVar191;
            auVar103 = vshufps_avx(ZEXT416((uint)(fVar159 * 0.16666667)),
                                   ZEXT416((uint)(fVar159 * 0.16666667)),0);
            auVar171 = ZEXT416((uint)((fVar159 * 4.0 + fVar154 +
                                      local_aa0 * local_900 * 12.0 + fVar191 * local_900 * 6.0) *
                                     0.16666667));
            auVar171 = vshufps_avx(auVar171,auVar171,0);
            auVar105 = ZEXT416((uint)((fVar154 * 4.0 + fVar159 +
                                      fVar191 * local_900 * 12.0 + local_aa0 * local_900 * 6.0) *
                                     0.16666667));
            auVar105 = vshufps_avx(auVar105,auVar105,0);
            auVar98 = auVar372._0_16_;
            auVar132 = vshufps_avx(auVar98,auVar98,0);
            auVar172._0_4_ = auVar132._0_4_ * (float)local_a20._0_4_ + 0.0;
            auVar172._4_4_ = auVar132._4_4_ * (float)local_a20._4_4_ + 0.0;
            auVar172._8_4_ = auVar132._8_4_ * fStack_a18 + 0.0;
            auVar172._12_4_ = auVar132._12_4_ * fStack_a14 + 0.0;
            auVar132 = vshufps_avx(ZEXT416((uint)(fVar154 * 0.16666667)),
                                   ZEXT416((uint)(fVar154 * 0.16666667)),0);
            auVar102._0_4_ =
                 auVar132._0_4_ * (float)local_980._0_4_ +
                 auVar105._0_4_ * (float)local_9a0._0_4_ +
                 auVar103._0_4_ * (float)local_9b0._0_4_ + auVar171._0_4_ * (float)local_990._0_4_;
            auVar102._4_4_ =
                 auVar132._4_4_ * (float)local_980._4_4_ +
                 auVar105._4_4_ * (float)local_9a0._4_4_ +
                 auVar103._4_4_ * (float)local_9b0._4_4_ + auVar171._4_4_ * (float)local_990._4_4_;
            auVar102._8_4_ =
                 auVar132._8_4_ * fStack_978 +
                 auVar105._8_4_ * fStack_998 +
                 auVar103._8_4_ * fStack_9a8 + auVar171._8_4_ * fStack_988;
            auVar102._12_4_ =
                 auVar132._12_4_ * fStack_974 +
                 auVar105._12_4_ * fStack_994 +
                 auVar103._12_4_ * fStack_9a4 + auVar171._12_4_ * fStack_984;
            local_7c0._0_16_ = auVar102;
            auVar103 = vsubps_avx(auVar172,auVar102);
            _local_880 = auVar103;
            auVar103 = vdpps_avx(auVar103,auVar103,0x7f);
            local_a60 = auVar103._0_4_;
            auVar347 = auVar352._0_16_;
            uStack_a9c = auVar352._4_4_;
            uStack_a98 = auVar352._8_4_;
            uStack_a94 = auVar352._12_4_;
            _local_ac0 = auVar98;
            fStack_a5c = auVar103._4_4_;
            fStack_a58 = auVar103._8_4_;
            fStack_a54 = auVar103._12_4_;
            if (local_a60 < 0.0) {
              local_a00._0_16_ = ZEXT416((uint)fVar191);
              local_a40._0_4_ = fVar156;
              local_9e0._0_4_ = fVar124;
              auVar352._0_4_ = sqrtf(local_a60);
              auVar352._4_60_ = extraout_var_00;
              auVar359 = ZEXT1664(local_a00._0_16_);
              auVar347._4_4_ = uStack_a9c;
              auVar347._0_4_ = local_aa0;
              auVar347._8_4_ = uStack_a98;
              auVar347._12_4_ = uStack_a94;
              auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar103 = auVar352._0_16_;
              fVar156 = (float)local_a40._0_4_;
              fVar124 = (float)local_9e0._0_4_;
              auVar98 = _local_ac0;
            }
            else {
              auVar103 = vsqrtss_avx(auVar103,auVar103);
            }
            auVar345 = ZEXT1664(auVar103);
            fVar159 = auVar359._0_4_;
            fVar154 = auVar347._0_4_;
            auVar171 = vshufps_avx(ZEXT416((uint)(fVar156 * 0.5)),ZEXT416((uint)(fVar156 * 0.5)),0);
            auVar105 = ZEXT416((uint)((fVar124 + local_900 * 4.0) * 0.5));
            auVar105 = vshufps_avx(auVar105,auVar105,0);
            auVar132 = ZEXT416((uint)((fVar154 * -fVar154 - local_900 * 4.0) * 0.5));
            auVar132 = vshufps_avx(auVar132,auVar132,0);
            auVar104 = ZEXT416((uint)(fVar159 * -fVar159 * 0.5));
            auVar104 = vshufps_avx(auVar104,auVar104,0);
            local_a00._0_4_ =
                 (float)local_980._0_4_ * auVar104._0_4_ +
                 (float)local_9a0._0_4_ * auVar132._0_4_ +
                 (float)local_9b0._0_4_ * auVar171._0_4_ + (float)local_990._0_4_ * auVar105._0_4_;
            local_a00._4_4_ =
                 (float)local_980._4_4_ * auVar104._4_4_ +
                 (float)local_9a0._4_4_ * auVar132._4_4_ +
                 (float)local_9b0._4_4_ * auVar171._4_4_ + (float)local_990._4_4_ * auVar105._4_4_;
            local_a00._8_4_ =
                 fStack_978 * auVar104._8_4_ +
                 fStack_998 * auVar132._8_4_ +
                 fStack_9a8 * auVar171._8_4_ + fStack_988 * auVar105._8_4_;
            local_a00._12_4_ =
                 fStack_974 * auVar104._12_4_ +
                 fStack_994 * auVar132._12_4_ +
                 fStack_9a4 * auVar171._12_4_ + fStack_984 * auVar105._12_4_;
            auVar171 = vshufps_avx(auVar347,auVar347,0);
            auVar105 = ZEXT416((uint)(fVar159 - (fVar154 + fVar154)));
            auVar132 = vshufps_avx(auVar105,auVar105,0);
            auVar105 = ZEXT416((uint)(fVar154 - (fVar159 + fVar159)));
            auVar104 = vshufps_avx(auVar105,auVar105,0);
            auVar356 = auVar359._0_16_;
            auVar17 = vshufps_avx(auVar356,auVar356,0);
            auVar105 = vdpps_avx(local_a00._0_16_,local_a00._0_16_,0x7f);
            auVar133._0_4_ =
                 (float)local_980._0_4_ * auVar17._0_4_ +
                 (float)local_9a0._0_4_ * auVar104._0_4_ +
                 (float)local_9b0._0_4_ * auVar171._0_4_ + (float)local_990._0_4_ * auVar132._0_4_;
            auVar133._4_4_ =
                 (float)local_980._4_4_ * auVar17._4_4_ +
                 (float)local_9a0._4_4_ * auVar104._4_4_ +
                 (float)local_9b0._4_4_ * auVar171._4_4_ + (float)local_990._4_4_ * auVar132._4_4_;
            auVar133._8_4_ =
                 fStack_978 * auVar17._8_4_ +
                 fStack_998 * auVar104._8_4_ +
                 fStack_9a8 * auVar171._8_4_ + fStack_988 * auVar132._8_4_;
            auVar133._12_4_ =
                 fStack_974 * auVar17._12_4_ +
                 fStack_994 * auVar104._12_4_ +
                 fStack_9a4 * auVar171._12_4_ + fStack_984 * auVar132._12_4_;
            auVar171 = vblendps_avx(auVar105,_DAT_01feba10,0xe);
            auVar132 = vrsqrtss_avx(auVar171,auVar171);
            fVar154 = auVar132._0_4_;
            fVar124 = auVar105._0_4_;
            auVar132 = vdpps_avx(local_a00._0_16_,auVar133,0x7f);
            auVar104 = vshufps_avx(auVar105,auVar105,0);
            auVar134._0_4_ = auVar133._0_4_ * auVar104._0_4_;
            auVar134._4_4_ = auVar133._4_4_ * auVar104._4_4_;
            auVar134._8_4_ = auVar133._8_4_ * auVar104._8_4_;
            auVar134._12_4_ = auVar133._12_4_ * auVar104._12_4_;
            auVar132 = vshufps_avx(auVar132,auVar132,0);
            auVar217._0_4_ = (float)local_a00._0_4_ * auVar132._0_4_;
            auVar217._4_4_ = local_a00._4_4_ * auVar132._4_4_;
            auVar217._8_4_ = local_a00._8_4_ * auVar132._8_4_;
            auVar217._12_4_ = local_a00._12_4_ * auVar132._12_4_;
            auVar104 = vsubps_avx(auVar134,auVar217);
            auVar132 = vrcpss_avx(auVar171,auVar171);
            auVar171 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                                  ZEXT416((uint)(auVar98._0_4_ * (float)local_680._0_4_)));
            local_900 = auVar171._0_4_;
            auVar171 = ZEXT416((uint)(auVar132._0_4_ * (2.0 - fVar124 * auVar132._0_4_)));
            auVar171 = vshufps_avx(auVar171,auVar171,0);
            uVar91 = CONCAT44(local_a00._4_4_,local_a00._0_4_);
            auVar348._0_8_ = uVar91 ^ 0x8000000080000000;
            auVar348._8_4_ = -local_a00._8_4_;
            auVar348._12_4_ = -local_a00._12_4_;
            auVar132 = ZEXT416((uint)(fVar154 * 1.5 + fVar124 * -0.5 * fVar154 * fVar154 * fVar154))
            ;
            auVar132 = vshufps_avx(auVar132,auVar132,0);
            auVar197._0_4_ = auVar132._0_4_ * auVar104._0_4_ * auVar171._0_4_;
            auVar197._4_4_ = auVar132._4_4_ * auVar104._4_4_ * auVar171._4_4_;
            auVar197._8_4_ = auVar132._8_4_ * auVar104._8_4_ * auVar171._8_4_;
            auVar197._12_4_ = auVar132._12_4_ * auVar104._12_4_ * auVar171._12_4_;
            local_860._0_4_ = (float)local_a00._0_4_ * auVar132._0_4_;
            local_860._4_4_ = local_a00._4_4_ * auVar132._4_4_;
            local_860._8_4_ = local_a00._8_4_ * auVar132._8_4_;
            local_860._12_4_ = local_a00._12_4_ * auVar132._12_4_;
            if (fVar124 < 0.0) {
              local_a40._0_4_ = auVar103._0_4_;
              local_9e0._0_16_ = auVar348;
              local_8e0._0_16_ = auVar197;
              auVar359 = ZEXT1664(auVar356);
              fVar124 = sqrtf(fVar124);
              auVar345 = ZEXT464((uint)local_a40._0_4_);
              auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar197 = local_8e0._0_16_;
              auVar348 = local_9e0._0_16_;
            }
            else {
              auVar103 = vsqrtss_avx(auVar105,auVar105);
              fVar124 = auVar103._0_4_;
            }
            auVar304._4_4_ = fStack_a5c;
            auVar304._0_4_ = local_a60;
            auVar304._8_4_ = fStack_a58;
            auVar304._12_4_ = fStack_a54;
            local_a40._0_16_ = vdpps_avx(_local_880,local_860._0_16_,0x7f);
            local_9e0._0_4_ =
                 ((float)local_920._0_4_ / fVar124) * (auVar345._0_4_ + 1.0) +
                 auVar345._0_4_ * (float)local_920._0_4_ + local_900;
            auVar103 = vdpps_avx(auVar348,local_860._0_16_,0x7f);
            auVar171 = vdpps_avx(_local_880,auVar197,0x7f);
            auVar105 = vdpps_avx(_local_a20,local_860._0_16_,0x7f);
            auVar132 = vdpps_avx(_local_880,auVar348,0x7f);
            fVar124 = auVar103._0_4_ + auVar171._0_4_;
            fVar154 = local_a40._0_4_;
            auVar106._0_4_ = fVar154 * fVar154;
            auVar106._4_4_ = local_a40._4_4_ * local_a40._4_4_;
            auVar106._8_4_ = local_a40._8_4_ * local_a40._8_4_;
            auVar106._12_4_ = local_a40._12_4_ * local_a40._12_4_;
            auVar171 = vsubps_avx(auVar304,auVar106);
            local_860._0_16_ = ZEXT416((uint)fVar124);
            auVar103 = vdpps_avx(_local_880,_local_a20,0x7f);
            fVar156 = auVar132._0_4_ - fVar154 * fVar124;
            fVar154 = auVar103._0_4_ - fVar154 * auVar105._0_4_;
            auVar103 = vrsqrtss_avx(auVar171,auVar171);
            fVar159 = auVar171._0_4_;
            fVar124 = auVar103._0_4_;
            fVar124 = fVar124 * 1.5 + fVar159 * -0.5 * fVar124 * fVar124 * fVar124;
            if (fVar159 < 0.0) {
              local_8e0._0_16_ = auVar105;
              local_940._0_4_ = fVar156;
              local_820._0_4_ = fVar154;
              local_800._0_4_ = fVar124;
              auVar345 = ZEXT1664(auVar345._0_16_);
              auVar359 = ZEXT1664(auVar359._0_16_);
              fVar159 = sqrtf(fVar159);
              auVar304._4_4_ = fStack_a5c;
              auVar304._0_4_ = local_a60;
              auVar304._8_4_ = fStack_a58;
              auVar304._12_4_ = fStack_a54;
              auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar124 = (float)local_800._0_4_;
              fVar156 = (float)local_940._0_4_;
              fVar154 = (float)local_820._0_4_;
              auVar105 = local_8e0._0_16_;
            }
            else {
              auVar103 = vsqrtss_avx(auVar171,auVar171);
              fVar159 = auVar103._0_4_;
            }
            auVar335 = ZEXT1664(local_a00._0_16_);
            auVar98 = vpermilps_avx(local_7c0._0_16_,0xff);
            auVar132 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
            fVar156 = fVar156 * fVar124 - auVar132._0_4_;
            auVar218._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
            auVar218._8_4_ = auVar105._8_4_ ^ 0x80000000;
            auVar218._12_4_ = auVar105._12_4_ ^ 0x80000000;
            auVar238._0_4_ = -fVar156;
            auVar238._4_4_ = 0x80000000;
            auVar238._8_4_ = 0x80000000;
            auVar238._12_4_ = 0x80000000;
            auVar103 = vinsertps_avx(ZEXT416((uint)(fVar154 * fVar124)),auVar218,0x10);
            auVar171 = vmovsldup_avx(ZEXT416((uint)(local_860._0_4_ * fVar154 * fVar124 -
                                                   auVar105._0_4_ * fVar156)));
            auVar103 = vdivps_avx(auVar103,auVar171);
            auVar266 = ZEXT1664(local_a40._0_16_);
            auVar98 = ZEXT416((uint)(fVar159 - auVar98._0_4_));
            auVar105 = vinsertps_avx(local_a40._0_16_,auVar98,0x10);
            auVar198._0_4_ = auVar105._0_4_ * auVar103._0_4_;
            auVar198._4_4_ = auVar105._4_4_ * auVar103._4_4_;
            auVar198._8_4_ = auVar105._8_4_ * auVar103._8_4_;
            auVar198._12_4_ = auVar105._12_4_ * auVar103._12_4_;
            auVar103 = vinsertps_avx(auVar238,local_860._0_16_,0x1c);
            auVar103 = vdivps_avx(auVar103,auVar171);
            auVar171 = vhaddps_avx(auVar198,auVar198);
            auVar173._0_4_ = auVar105._0_4_ * auVar103._0_4_;
            auVar173._4_4_ = auVar105._4_4_ * auVar103._4_4_;
            auVar173._8_4_ = auVar105._8_4_ * auVar103._8_4_;
            auVar173._12_4_ = auVar105._12_4_ * auVar103._12_4_;
            auVar103 = vhaddps_avx(auVar173,auVar173);
            local_aa0 = local_aa0 - auVar171._0_4_;
            auVar352 = ZEXT464((uint)local_aa0);
            fVar124 = (float)local_ac0._0_4_ - auVar103._0_4_;
            auVar372 = ZEXT464((uint)fVar124);
            auVar219._8_4_ = 0x7fffffff;
            auVar219._0_8_ = 0x7fffffff7fffffff;
            auVar219._12_4_ = 0x7fffffff;
            auVar248 = ZEXT1664(auVar219);
            auVar103 = vandps_avx(local_a40._0_16_,auVar219);
            bVar71 = true;
            if (auVar103._0_4_ < (float)local_9e0._0_4_) {
              auVar103 = vandps_avx(auVar98,auVar219);
              if (auVar103._0_4_ <
                  (float)local_6a0._0_4_ * 1.9073486e-06 + (float)local_9e0._0_4_ + local_900) {
                fVar124 = fVar124 + (float)local_790._0_4_;
                auVar372 = ZEXT464((uint)fVar124);
                if (((((ray->org).field_0.m128[3] <= fVar124) &&
                     (fVar154 = ray->tfar, fVar124 <= fVar154)) && (0.0 <= local_aa0)) &&
                   (local_aa0 <= 1.0)) {
                  auVar103 = vrsqrtss_avx(auVar304,auVar304);
                  fVar156 = auVar103._0_4_;
                  pGVar12 = (context->scene->geometries).items[local_a68].ptr;
                  if ((pGVar12->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      unaff_R14B = 1;
                    }
                    else {
                      auVar103 = ZEXT416((uint)(fVar156 * 1.5 +
                                               auVar304._0_4_ * -0.5 * fVar156 * fVar156 * fVar156))
                      ;
                      auVar103 = vshufps_avx(auVar103,auVar103,0);
                      auVar135._0_4_ = auVar103._0_4_ * (float)local_880._0_4_;
                      auVar135._4_4_ = auVar103._4_4_ * (float)local_880._4_4_;
                      auVar135._8_4_ = auVar103._8_4_ * fStack_878;
                      auVar135._12_4_ = auVar103._12_4_ * fStack_874;
                      auVar107._0_4_ = local_a00._0_4_ + auVar132._0_4_ * auVar135._0_4_;
                      auVar107._4_4_ = local_a00._4_4_ + auVar132._4_4_ * auVar135._4_4_;
                      auVar107._8_4_ = local_a00._8_4_ + auVar132._8_4_ * auVar135._8_4_;
                      auVar107._12_4_ = local_a00._12_4_ + auVar132._12_4_ * auVar135._12_4_;
                      auVar103 = vshufps_avx(auVar135,auVar135,0xc9);
                      auVar171 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                      auVar136._0_4_ = auVar171._0_4_ * auVar135._0_4_;
                      auVar136._4_4_ = auVar171._4_4_ * auVar135._4_4_;
                      auVar136._8_4_ = auVar171._8_4_ * auVar135._8_4_;
                      auVar136._12_4_ = auVar171._12_4_ * auVar135._12_4_;
                      auVar174._0_4_ = local_a00._0_4_ * auVar103._0_4_;
                      auVar174._4_4_ = local_a00._4_4_ * auVar103._4_4_;
                      auVar174._8_4_ = local_a00._8_4_ * auVar103._8_4_;
                      auVar174._12_4_ = local_a00._12_4_ * auVar103._12_4_;
                      auVar105 = vsubps_avx(auVar174,auVar136);
                      auVar103 = vshufps_avx(auVar105,auVar105,0xc9);
                      auVar171 = vshufps_avx(auVar107,auVar107,0xc9);
                      auVar175._0_4_ = auVar171._0_4_ * auVar103._0_4_;
                      auVar175._4_4_ = auVar171._4_4_ * auVar103._4_4_;
                      auVar175._8_4_ = auVar171._8_4_ * auVar103._8_4_;
                      auVar175._12_4_ = auVar171._12_4_ * auVar103._12_4_;
                      auVar103 = vshufps_avx(auVar105,auVar105,0xd2);
                      auVar108._0_4_ = auVar107._0_4_ * auVar103._0_4_;
                      auVar108._4_4_ = auVar107._4_4_ * auVar103._4_4_;
                      auVar108._8_4_ = auVar107._8_4_ * auVar103._8_4_;
                      auVar108._12_4_ = auVar107._12_4_ * auVar103._12_4_;
                      auVar171 = vsubps_avx(auVar175,auVar108);
                      auVar103 = vshufps_avx(auVar171,auVar171,0xe9);
                      local_8c0 = vmovlps_avx(auVar103);
                      local_8b8 = auVar171._0_4_;
                      local_8b0 = 0;
                      local_8ac = (undefined4)local_888;
                      local_8a8 = (undefined4)local_a68;
                      local_8a4 = context->user->instID[0];
                      local_8a0 = context->user->instPrimID[0];
                      ray->tfar = fVar124;
                      local_ac4 = -1;
                      local_970.valid = &local_ac4;
                      local_970.geometryUserPtr = pGVar12->userPtr;
                      local_970.context = context->user;
                      local_970.hit = (RTCHitN *)&local_8c0;
                      local_970.N = 1;
                      uStack_a9c = 0;
                      uStack_a98 = 0;
                      uStack_a94 = 0;
                      _local_ac0 = ZEXT416((uint)fVar124);
                      local_a60 = fVar154;
                      local_970.ray = (RTCRayN *)ray;
                      local_8b4 = local_aa0;
                      if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0100b771:
                        p_Var16 = context->args->filter;
                        if (p_Var16 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            auVar335 = ZEXT1664(auVar335._0_16_);
                            auVar345 = ZEXT1664(auVar345._0_16_);
                            auVar359 = ZEXT1664(auVar359._0_16_);
                            (*p_Var16)(&local_970);
                            auVar372 = ZEXT1664(_local_ac0);
                            auVar352 = ZEXT1664(CONCAT412(uStack_a94,
                                                          CONCAT48(uStack_a98,
                                                                   CONCAT44(uStack_a9c,local_aa0))))
                            ;
                            auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar248 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          if (*local_970.valid == 0) goto LAB_0100b7d0;
                        }
                        unaff_R14B = 1;
                      }
                      else {
                        auVar266 = ZEXT1664(local_a40._0_16_);
                        auVar335 = ZEXT1664(local_a00._0_16_);
                        auVar345 = ZEXT1664(auVar345._0_16_);
                        auVar359 = ZEXT1664(auVar359._0_16_);
                        (*pGVar12->occlusionFilterN)(&local_970);
                        auVar372 = ZEXT1664(_local_ac0);
                        auVar352 = ZEXT1664(CONCAT412(uStack_a94,
                                                      CONCAT48(uStack_a98,
                                                               CONCAT44(uStack_a9c,local_aa0))));
                        auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar248 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        if (*local_970.valid != 0) goto LAB_0100b771;
LAB_0100b7d0:
                        unaff_R14B = 0;
                      }
                      if (unaff_R14B == 0) {
                        ray->tfar = local_a60;
                      }
                    }
                    bVar71 = false;
                    goto LAB_0100b5f1;
                  }
                }
                bVar71 = false;
                unaff_R14B = 0;
              }
            }
LAB_0100b5f1:
            if (!bVar71) goto LAB_0100b7ea;
            lVar89 = lVar89 + -1;
          } while (lVar89 != 0);
          unaff_R14B = 0;
LAB_0100b7ea:
          unaff_R14B = unaff_R14B & 1;
          bVar87 = bVar87 | unaff_R14B;
          fVar124 = ray->tfar;
          auVar118._4_4_ = fVar124;
          auVar118._0_4_ = fVar124;
          auVar118._8_4_ = fVar124;
          auVar118._12_4_ = fVar124;
          auVar118._16_4_ = fVar124;
          auVar118._20_4_ = fVar124;
          auVar118._24_4_ = fVar124;
          auVar118._28_4_ = fVar124;
          auVar111 = vcmpps_avx(_local_6e0,auVar118,2);
          auVar110 = vandps_avx(auVar111,local_5c0);
          local_5c0 = local_5c0 & auVar111;
          uVar91 = local_5e0;
        } while ((((((((local_5c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_5c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_5c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_5c0 >> 0x7f,0) != '\0') ||
                   (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_5c0 >> 0xbf,0) != '\0') ||
                 (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_5c0[0x1f] < '\0');
      }
      auVar110 = vandps_avx(local_760,local_560);
      auVar111 = vandps_avx(_local_840,local_700);
      auVar181._0_4_ = (float)local_7e0._0_4_ + local_480._0_4_;
      auVar181._4_4_ = (float)local_7e0._4_4_ + local_480._4_4_;
      auVar181._8_4_ = fStack_7d8 + local_480._8_4_;
      auVar181._12_4_ = fStack_7d4 + local_480._12_4_;
      auVar181._16_4_ = fStack_7d0 + local_480._16_4_;
      auVar181._20_4_ = fStack_7cc + local_480._20_4_;
      auVar181._24_4_ = fStack_7c8 + local_480._24_4_;
      auVar181._28_4_ = fStack_7c4 + local_480._28_4_;
      fVar124 = ray->tfar;
      auVar224._4_4_ = fVar124;
      auVar224._0_4_ = fVar124;
      auVar224._8_4_ = fVar124;
      auVar224._12_4_ = fVar124;
      auVar224._16_4_ = fVar124;
      auVar224._20_4_ = fVar124;
      auVar224._24_4_ = fVar124;
      auVar224._28_4_ = fVar124;
      auVar22 = vcmpps_avx(auVar181,auVar224,2);
      auVar110 = vandps_avx(auVar22,auVar110);
      auVar246._0_4_ = (float)local_7e0._0_4_ + local_4c0._0_4_;
      auVar246._4_4_ = (float)local_7e0._4_4_ + local_4c0._4_4_;
      auVar246._8_4_ = fStack_7d8 + local_4c0._8_4_;
      auVar246._12_4_ = fStack_7d4 + local_4c0._12_4_;
      auVar246._16_4_ = fStack_7d0 + local_4c0._16_4_;
      auVar246._20_4_ = fStack_7cc + local_4c0._20_4_;
      auVar246._24_4_ = fStack_7c8 + local_4c0._24_4_;
      auVar246._28_4_ = fStack_7c4 + local_4c0._28_4_;
      auVar248 = ZEXT3264(auVar246);
      auVar22 = vcmpps_avx(auVar246,auVar224,2);
      auVar111 = vandps_avx(auVar22,auVar111);
      auVar111 = vorps_avx(auVar110,auVar111);
      if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar111 >> 0x7f,0) != '\0') ||
            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar111 >> 0xbf,0) != '\0') ||
          (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar111[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar86 * 0x60) = auVar111;
        auVar110 = vblendvps_avx(_local_4c0,local_480,auVar110);
        *(undefined1 (*) [32])(auStack_160 + uVar86 * 0x60) = auVar110;
        uVar7 = vmovlps_avx(local_780);
        *(undefined8 *)(afStack_140 + uVar86 * 0x18) = uVar7;
        auStack_138[uVar86 * 0x18] = (int)uVar91 + 1;
        uVar86 = (ulong)((int)uVar86 + 1);
      }
    }
    fVar124 = ray->tfar;
    auVar114._4_4_ = fVar124;
    auVar114._0_4_ = fVar124;
    auVar114._8_4_ = fVar124;
    auVar114._12_4_ = fVar124;
    auVar114._16_4_ = fVar124;
    auVar114._20_4_ = fVar124;
    auVar114._24_4_ = fVar124;
    auVar114._28_4_ = fVar124;
    uVar92 = uVar86;
    do {
      if ((int)uVar92 == 0) {
        if (bVar87 != 0) {
          return local_ad1;
        }
        fVar124 = ray->tfar;
        auVar109._4_4_ = fVar124;
        auVar109._0_4_ = fVar124;
        auVar109._8_4_ = fVar124;
        auVar109._12_4_ = fVar124;
        auVar103 = vcmpps_avx(local_4d0,auVar109,2);
        uVar85 = vmovmskps_avx(auVar103);
        uVar85 = (uint)local_768 - 1 & (uint)local_768 & uVar85;
        local_ad1 = uVar85 != 0;
        if (!local_ad1) {
          return local_ad1;
        }
        goto LAB_01008f9e;
      }
      uVar86 = (ulong)((int)uVar92 - 1);
      lVar89 = uVar86 * 0x60;
      auVar110 = *(undefined1 (*) [32])(auStack_160 + lVar89);
      auVar141._0_4_ = (float)local_7e0._0_4_ + auVar110._0_4_;
      auVar141._4_4_ = (float)local_7e0._4_4_ + auVar110._4_4_;
      auVar141._8_4_ = fStack_7d8 + auVar110._8_4_;
      auVar141._12_4_ = fStack_7d4 + auVar110._12_4_;
      auVar141._16_4_ = fStack_7d0 + auVar110._16_4_;
      auVar141._20_4_ = fStack_7cc + auVar110._20_4_;
      auVar141._24_4_ = fStack_7c8 + auVar110._24_4_;
      auVar141._28_4_ = fStack_7c4 + auVar110._28_4_;
      auVar22 = vcmpps_avx(auVar141,auVar114,2);
      auVar111 = vandps_avx(auVar22,*(undefined1 (*) [32])(auStack_180 + lVar89));
      local_480 = auVar111;
      auVar22 = *(undefined1 (*) [32])(auStack_180 + lVar89) & auVar22;
      bVar77 = (auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar78 = (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar76 = (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar75 = SUB321(auVar22 >> 0x7f,0) == '\0';
      bVar74 = (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar73 = SUB321(auVar22 >> 0xbf,0) == '\0';
      bVar72 = (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar71 = -1 < auVar22[0x1f];
      if (((((((!bVar77 || !bVar78) || !bVar76) || !bVar75) || !bVar74) || !bVar73) || !bVar72) ||
          !bVar71) {
        auVar203._8_4_ = 0x7f800000;
        auVar203._0_8_ = 0x7f8000007f800000;
        auVar203._12_4_ = 0x7f800000;
        auVar203._16_4_ = 0x7f800000;
        auVar203._20_4_ = 0x7f800000;
        auVar203._24_4_ = 0x7f800000;
        auVar203._28_4_ = 0x7f800000;
        auVar110 = vblendvps_avx(auVar203,auVar110,auVar111);
        auVar22 = vshufps_avx(auVar110,auVar110,0xb1);
        auVar22 = vminps_avx(auVar110,auVar22);
        auVar371 = vshufpd_avx(auVar22,auVar22,5);
        auVar22 = vminps_avx(auVar22,auVar371);
        auVar371 = vperm2f128_avx(auVar22,auVar22,1);
        auVar22 = vminps_avx(auVar22,auVar371);
        auVar110 = vcmpps_avx(auVar110,auVar22,0);
        auVar22 = auVar111 & auVar110;
        if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0x7f,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar22 >> 0xbf,0) != '\0') ||
            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar22[0x1f] < '\0') {
          auVar111 = vandps_avx(auVar110,auVar111);
        }
        fVar124 = afStack_140[uVar86 * 0x18 + 1];
        uVar91 = (ulong)auStack_138[uVar86 * 0x18];
        uVar90 = vmovmskps_avx(auVar111);
        uVar85 = 0;
        if (uVar90 != 0) {
          for (; (uVar90 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
          }
        }
        fVar154 = afStack_140[uVar86 * 0x18];
        *(undefined4 *)(local_480 + (ulong)uVar85 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar89) = local_480;
        if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_480 >> 0x7f,0) != '\0') ||
              (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_480 >> 0xbf,0) != '\0') ||
            (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_480[0x1f] < '\0') {
          uVar86 = uVar92;
        }
        auVar103 = vshufps_avx(ZEXT416((uint)(fVar124 - fVar154)),ZEXT416((uint)(fVar124 - fVar154))
                               ,0);
        local_4c0._4_4_ = fVar154 + auVar103._4_4_ * 0.14285715;
        local_4c0._0_4_ = fVar154 + auVar103._0_4_ * 0.0;
        fStack_4b8 = fVar154 + auVar103._8_4_ * 0.2857143;
        fStack_4b4 = fVar154 + auVar103._12_4_ * 0.42857146;
        fStack_4b0 = fVar154 + auVar103._0_4_ * 0.5714286;
        fStack_4ac = fVar154 + auVar103._4_4_ * 0.71428573;
        fStack_4a8 = fVar154 + auVar103._8_4_ * 0.8571429;
        fStack_4a4 = fVar154 + auVar103._12_4_;
        local_780._8_8_ = 0;
        local_780._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar85 * 4);
      }
      uVar92 = uVar86;
    } while (((((((bVar77 && bVar78) && bVar76) && bVar75) && bVar74) && bVar73) && bVar72) &&
             bVar71);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }